

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  Primitive PVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  bool bVar81;
  undefined1 auVar82 [12];
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  bool bVar87;
  bool bVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  uint uVar99;
  ulong uVar100;
  ulong uVar101;
  long lVar102;
  long lVar103;
  uint uVar104;
  ulong uVar105;
  bool bVar106;
  float fVar107;
  float fVar133;
  float fVar134;
  vint4 bi_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  float fVar135;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar136;
  float fVar167;
  float fVar170;
  vint4 bi;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar173;
  undefined1 auVar141 [16];
  float fVar137;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar168;
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar180;
  float fVar203;
  float fVar204;
  vint4 bi_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar205;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar209;
  float fVar224;
  float fVar225;
  vint4 ai_1;
  undefined1 auVar210 [16];
  float fVar226;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar218 [28];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar227;
  float fVar243;
  float fVar244;
  vint4 ai_2;
  undefined1 auVar228 [16];
  float fVar245;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar246;
  undefined1 auVar238 [28];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  float fVar247;
  float fVar264;
  float fVar265;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar266;
  float fVar267;
  undefined1 auVar263 [64];
  float fVar268;
  float fVar277;
  float fVar278;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar279;
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar276 [32];
  float fVar288;
  float fVar300;
  float fVar301;
  vint4 ai;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar302;
  float fVar306;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar299 [64];
  float fVar307;
  float fVar321;
  float fVar324;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar308;
  float fVar309;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar322;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar331;
  float fVar332;
  float fVar334;
  float fVar335;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  float fVar330;
  float fVar333;
  float fVar336;
  undefined1 auVar320 [64];
  float fVar340;
  float fVar345;
  float fVar346;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [28];
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar344 [32];
  float s;
  undefined1 auVar353 [16];
  float fVar357;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [64];
  float t_2;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  float fVar361;
  float fVar362;
  float fVar371;
  float fVar374;
  undefined1 auVar365 [16];
  float fVar363;
  float fVar364;
  undefined1 auVar366 [16];
  float fVar372;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar379;
  float fVar381;
  float fVar383;
  float fVar384;
  undefined1 auVar367 [32];
  float fVar373;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar378;
  float fVar380;
  float fVar382;
  undefined1 auVar370 [64];
  float t;
  float fVar385;
  float fVar390;
  float fVar391;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  float fVar392;
  undefined1 auVar388 [32];
  float fVar393;
  float fVar394;
  float fVar395;
  undefined1 auVar389 [64];
  undefined1 auVar396 [16];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  ulong local_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  ulong local_a88;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 auStack_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [32];
  undefined8 local_8b0;
  float local_8a8;
  float local_8a4;
  undefined4 local_8a0;
  uint local_89c;
  uint local_898;
  uint local_894;
  uint local_890;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760 [16];
  Primitive *local_750;
  ulong local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [4];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0 [4];
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar360 [64];
  
  PVar13 = prim[1];
  uVar105 = (ulong)(byte)PVar13;
  lVar103 = uVar105 * 0x25;
  fVar137 = *(float *)(prim + lVar103 + 0x12);
  auVar145 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar103 + 6));
  auVar138._0_4_ = fVar137 * auVar145._0_4_;
  auVar138._4_4_ = fVar137 * auVar145._4_4_;
  auVar138._8_4_ = fVar137 * auVar145._8_4_;
  auVar138._12_4_ = fVar137 * auVar145._12_4_;
  auVar289._0_4_ = fVar137 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar289._4_4_ = fVar137 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar289._8_4_ = fVar137 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar289._12_4_ = fVar137 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar145 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 6)));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 5 + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 6)));
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xf + 6)));
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar105 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1a + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1b + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1c + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vshufps_avx(auVar289,auVar289,0);
  auVar30 = vshufps_avx(auVar289,auVar289,0x55);
  auVar31 = vshufps_avx(auVar289,auVar289,0xaa);
  fVar137 = auVar31._0_4_;
  fVar168 = auVar31._4_4_;
  fVar171 = auVar31._8_4_;
  fVar175 = auVar31._12_4_;
  fVar227 = auVar30._0_4_;
  fVar243 = auVar30._4_4_;
  fVar244 = auVar30._8_4_;
  fVar245 = auVar30._12_4_;
  fVar209 = auVar29._0_4_;
  fVar224 = auVar29._4_4_;
  fVar225 = auVar29._8_4_;
  fVar226 = auVar29._12_4_;
  auVar365._0_4_ = fVar209 * auVar145._0_4_ + fVar227 * auVar113._0_4_ + fVar137 * auVar185._0_4_;
  auVar365._4_4_ = fVar224 * auVar145._4_4_ + fVar243 * auVar113._4_4_ + fVar168 * auVar185._4_4_;
  auVar365._8_4_ = fVar225 * auVar145._8_4_ + fVar244 * auVar113._8_4_ + fVar171 * auVar185._8_4_;
  auVar365._12_4_ =
       fVar226 * auVar145._12_4_ + fVar245 * auVar113._12_4_ + fVar175 * auVar185._12_4_;
  auVar386._0_4_ = fVar209 * auVar142._0_4_ + fVar227 * auVar25._0_4_ + auVar26._0_4_ * fVar137;
  auVar386._4_4_ = fVar224 * auVar142._4_4_ + fVar243 * auVar25._4_4_ + auVar26._4_4_ * fVar168;
  auVar386._8_4_ = fVar225 * auVar142._8_4_ + fVar244 * auVar25._8_4_ + auVar26._8_4_ * fVar171;
  auVar386._12_4_ = fVar226 * auVar142._12_4_ + fVar245 * auVar25._12_4_ + auVar26._12_4_ * fVar175;
  auVar290._0_4_ = fVar209 * auVar150._0_4_ + fVar227 * auVar27._0_4_ + auVar28._0_4_ * fVar137;
  auVar290._4_4_ = fVar224 * auVar150._4_4_ + fVar243 * auVar27._4_4_ + auVar28._4_4_ * fVar168;
  auVar290._8_4_ = fVar225 * auVar150._8_4_ + fVar244 * auVar27._8_4_ + auVar28._8_4_ * fVar171;
  auVar290._12_4_ = fVar226 * auVar150._12_4_ + fVar245 * auVar27._12_4_ + auVar28._12_4_ * fVar175;
  auVar29 = vshufps_avx(auVar138,auVar138,0);
  auVar30 = vshufps_avx(auVar138,auVar138,0x55);
  auVar31 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar137 = auVar31._0_4_;
  fVar168 = auVar31._4_4_;
  fVar171 = auVar31._8_4_;
  fVar175 = auVar31._12_4_;
  fVar227 = auVar30._0_4_;
  fVar243 = auVar30._4_4_;
  fVar244 = auVar30._8_4_;
  fVar245 = auVar30._12_4_;
  fVar209 = auVar29._0_4_;
  fVar224 = auVar29._4_4_;
  fVar225 = auVar29._8_4_;
  fVar226 = auVar29._12_4_;
  auVar139._0_4_ = fVar209 * auVar145._0_4_ + fVar227 * auVar113._0_4_ + fVar137 * auVar185._0_4_;
  auVar139._4_4_ = fVar224 * auVar145._4_4_ + fVar243 * auVar113._4_4_ + fVar168 * auVar185._4_4_;
  auVar139._8_4_ = fVar225 * auVar145._8_4_ + fVar244 * auVar113._8_4_ + fVar171 * auVar185._8_4_;
  auVar139._12_4_ =
       fVar226 * auVar145._12_4_ + fVar245 * auVar113._12_4_ + fVar175 * auVar185._12_4_;
  auVar108._0_4_ = fVar209 * auVar142._0_4_ + auVar26._0_4_ * fVar137 + fVar227 * auVar25._0_4_;
  auVar108._4_4_ = fVar224 * auVar142._4_4_ + auVar26._4_4_ * fVar168 + fVar243 * auVar25._4_4_;
  auVar108._8_4_ = fVar225 * auVar142._8_4_ + auVar26._8_4_ * fVar171 + fVar244 * auVar25._8_4_;
  auVar108._12_4_ = fVar226 * auVar142._12_4_ + auVar26._12_4_ * fVar175 + fVar245 * auVar25._12_4_;
  auVar310._8_4_ = 0x7fffffff;
  auVar310._0_8_ = 0x7fffffff7fffffff;
  auVar310._12_4_ = 0x7fffffff;
  auVar145 = vandps_avx(auVar365,auVar310);
  auVar228._8_4_ = 0x219392ef;
  auVar228._0_8_ = 0x219392ef219392ef;
  auVar228._12_4_ = 0x219392ef;
  auVar145 = vcmpps_avx(auVar145,auVar228,1);
  auVar113 = vblendvps_avx(auVar365,auVar228,auVar145);
  auVar145 = vandps_avx(auVar386,auVar310);
  auVar145 = vcmpps_avx(auVar145,auVar228,1);
  auVar185 = vblendvps_avx(auVar386,auVar228,auVar145);
  auVar145 = vandps_avx(auVar310,auVar290);
  auVar145 = vcmpps_avx(auVar145,auVar228,1);
  auVar145 = vblendvps_avx(auVar290,auVar228,auVar145);
  auVar181._0_4_ = fVar209 * auVar150._0_4_ + fVar227 * auVar27._0_4_ + auVar28._0_4_ * fVar137;
  auVar181._4_4_ = fVar224 * auVar150._4_4_ + fVar243 * auVar27._4_4_ + auVar28._4_4_ * fVar168;
  auVar181._8_4_ = fVar225 * auVar150._8_4_ + fVar244 * auVar27._8_4_ + auVar28._8_4_ * fVar171;
  auVar181._12_4_ = fVar226 * auVar150._12_4_ + fVar245 * auVar27._12_4_ + auVar28._12_4_ * fVar175;
  auVar142 = vrcpps_avx(auVar113);
  fVar209 = auVar142._0_4_;
  auVar210._0_4_ = fVar209 * auVar113._0_4_;
  fVar224 = auVar142._4_4_;
  auVar210._4_4_ = fVar224 * auVar113._4_4_;
  fVar225 = auVar142._8_4_;
  auVar210._8_4_ = fVar225 * auVar113._8_4_;
  fVar226 = auVar142._12_4_;
  auVar210._12_4_ = fVar226 * auVar113._12_4_;
  auVar269._8_4_ = 0x3f800000;
  auVar269._0_8_ = &DAT_3f8000003f800000;
  auVar269._12_4_ = 0x3f800000;
  auVar113 = vsubps_avx(auVar269,auVar210);
  fVar209 = fVar209 + fVar209 * auVar113._0_4_;
  fVar224 = fVar224 + fVar224 * auVar113._4_4_;
  fVar225 = fVar225 + fVar225 * auVar113._8_4_;
  fVar226 = fVar226 + fVar226 * auVar113._12_4_;
  auVar113 = vrcpps_avx(auVar185);
  fVar227 = auVar113._0_4_;
  auVar248._0_4_ = fVar227 * auVar185._0_4_;
  fVar243 = auVar113._4_4_;
  auVar248._4_4_ = fVar243 * auVar185._4_4_;
  fVar244 = auVar113._8_4_;
  auVar248._8_4_ = fVar244 * auVar185._8_4_;
  fVar245 = auVar113._12_4_;
  auVar248._12_4_ = fVar245 * auVar185._12_4_;
  auVar113 = vsubps_avx(auVar269,auVar248);
  fVar227 = fVar227 + fVar227 * auVar113._0_4_;
  fVar243 = fVar243 + fVar243 * auVar113._4_4_;
  fVar244 = fVar244 + fVar244 * auVar113._8_4_;
  fVar245 = fVar245 + fVar245 * auVar113._12_4_;
  auVar113 = vrcpps_avx(auVar145);
  fVar247 = auVar113._0_4_;
  auVar291._0_4_ = fVar247 * auVar145._0_4_;
  fVar264 = auVar113._4_4_;
  auVar291._4_4_ = fVar264 * auVar145._4_4_;
  fVar265 = auVar113._8_4_;
  auVar291._8_4_ = fVar265 * auVar145._8_4_;
  fVar266 = auVar113._12_4_;
  auVar291._12_4_ = fVar266 * auVar145._12_4_;
  auVar145 = vsubps_avx(auVar269,auVar291);
  fVar247 = fVar247 + fVar247 * auVar145._0_4_;
  fVar264 = fVar264 + fVar264 * auVar145._4_4_;
  fVar265 = fVar265 + fVar265 * auVar145._8_4_;
  fVar266 = fVar266 + fVar266 * auVar145._12_4_;
  auVar145 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar103 + 0x16)) * *(float *)(prim + lVar103 + 0x1a)))
  ;
  auVar185 = vshufps_avx(auVar145,auVar145,0);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar105 * 7 + 6);
  auVar145 = vpmovsxwd_avx(auVar145);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 6);
  auVar113 = vpmovsxwd_avx(auVar113);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar142 = vsubps_avx(auVar113,auVar145);
  fVar137 = auVar185._0_4_;
  fVar168 = auVar185._4_4_;
  fVar171 = auVar185._8_4_;
  fVar175 = auVar185._12_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar105 * 9 + 6);
  auVar113 = vpmovsxwd_avx(auVar185);
  auVar292._0_4_ = auVar142._0_4_ * fVar137 + auVar145._0_4_;
  auVar292._4_4_ = auVar142._4_4_ * fVar168 + auVar145._4_4_;
  auVar292._8_4_ = auVar142._8_4_ * fVar171 + auVar145._8_4_;
  auVar292._12_4_ = auVar142._12_4_ * fVar175 + auVar145._12_4_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar105 * 0xd + 6);
  auVar185 = vpmovsxwd_avx(auVar142);
  auVar145 = vcvtdq2ps_avx(auVar113);
  auVar113 = vcvtdq2ps_avx(auVar185);
  auVar113 = vsubps_avx(auVar113,auVar145);
  auVar311._0_4_ = auVar113._0_4_ * fVar137 + auVar145._0_4_;
  auVar311._4_4_ = auVar113._4_4_ * fVar168 + auVar145._4_4_;
  auVar311._8_4_ = auVar113._8_4_ * fVar171 + auVar145._8_4_;
  auVar311._12_4_ = auVar113._12_4_ * fVar175 + auVar145._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar105 * 0x12 + 6);
  auVar145 = vpmovsxwd_avx(auVar25);
  uVar100 = (ulong)(uint)((int)(uVar105 * 5) << 2);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar105 * 2 + uVar100 + 6);
  auVar113 = vpmovsxwd_avx(auVar26);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar145);
  auVar341._0_4_ = auVar113._0_4_ * fVar137 + auVar145._0_4_;
  auVar341._4_4_ = auVar113._4_4_ * fVar168 + auVar145._4_4_;
  auVar341._8_4_ = auVar113._8_4_ * fVar171 + auVar145._8_4_;
  auVar341._12_4_ = auVar113._12_4_ * fVar175 + auVar145._12_4_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar100 + 6);
  auVar145 = vpmovsxwd_avx(auVar150);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar105 * 0x18 + 6);
  auVar113 = vpmovsxwd_avx(auVar27);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar185 = vsubps_avx(auVar113,auVar145);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar105 * 0x1d + 6);
  auVar113 = vpmovsxwd_avx(auVar28);
  auVar353._0_4_ = auVar185._0_4_ * fVar137 + auVar145._0_4_;
  auVar353._4_4_ = auVar185._4_4_ * fVar168 + auVar145._4_4_;
  auVar353._8_4_ = auVar185._8_4_ * fVar171 + auVar145._8_4_;
  auVar353._12_4_ = auVar185._12_4_ * fVar175 + auVar145._12_4_;
  auVar145 = vcvtdq2ps_avx(auVar113);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar105 + (ulong)(byte)PVar13 * 0x20 + 6);
  auVar113 = vpmovsxwd_avx(auVar29);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar145);
  auVar358._0_4_ = auVar113._0_4_ * fVar137 + auVar145._0_4_;
  auVar358._4_4_ = auVar113._4_4_ * fVar168 + auVar145._4_4_;
  auVar358._8_4_ = auVar113._8_4_ * fVar171 + auVar145._8_4_;
  auVar358._12_4_ = auVar113._12_4_ * fVar175 + auVar145._12_4_;
  auVar360 = ZEXT1664(auVar358);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar105) + 6);
  auVar145 = vpmovsxwd_avx(auVar30);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar370 = ZEXT1664(auVar145);
  local_750 = prim;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar105 * 0x23 + 6);
  auVar113 = vpmovsxwd_avx(auVar31);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar145);
  auVar389 = ZEXT1664(auVar113);
  auVar270._0_4_ = auVar145._0_4_ + auVar113._0_4_ * fVar137;
  auVar270._4_4_ = auVar145._4_4_ + auVar113._4_4_ * fVar168;
  auVar270._8_4_ = auVar145._8_4_ + auVar113._8_4_ * fVar171;
  auVar270._12_4_ = auVar145._12_4_ + auVar113._12_4_ * fVar175;
  auVar145 = vsubps_avx(auVar292,auVar139);
  auVar293._0_4_ = fVar209 * auVar145._0_4_;
  auVar293._4_4_ = fVar224 * auVar145._4_4_;
  auVar293._8_4_ = fVar225 * auVar145._8_4_;
  auVar293._12_4_ = fVar226 * auVar145._12_4_;
  auVar145 = vsubps_avx(auVar311,auVar139);
  auVar140._0_4_ = fVar209 * auVar145._0_4_;
  auVar140._4_4_ = fVar224 * auVar145._4_4_;
  auVar140._8_4_ = fVar225 * auVar145._8_4_;
  auVar140._12_4_ = fVar226 * auVar145._12_4_;
  auVar145 = vsubps_avx(auVar341,auVar108);
  auVar211._0_4_ = fVar227 * auVar145._0_4_;
  auVar211._4_4_ = fVar243 * auVar145._4_4_;
  auVar211._8_4_ = fVar244 * auVar145._8_4_;
  auVar211._12_4_ = fVar245 * auVar145._12_4_;
  auVar145 = vsubps_avx(auVar353,auVar108);
  auVar109._0_4_ = fVar227 * auVar145._0_4_;
  auVar109._4_4_ = fVar243 * auVar145._4_4_;
  auVar109._8_4_ = fVar244 * auVar145._8_4_;
  auVar109._12_4_ = fVar245 * auVar145._12_4_;
  auVar145 = vsubps_avx(auVar358,auVar181);
  auVar229._0_4_ = fVar247 * auVar145._0_4_;
  auVar229._4_4_ = fVar264 * auVar145._4_4_;
  auVar229._8_4_ = fVar265 * auVar145._8_4_;
  auVar229._12_4_ = fVar266 * auVar145._12_4_;
  auVar145 = vsubps_avx(auVar270,auVar181);
  auVar182._0_4_ = fVar247 * auVar145._0_4_;
  auVar182._4_4_ = fVar264 * auVar145._4_4_;
  auVar182._8_4_ = fVar265 * auVar145._8_4_;
  auVar182._12_4_ = fVar266 * auVar145._12_4_;
  auVar145 = vpminsd_avx(auVar293,auVar140);
  auVar113 = vpminsd_avx(auVar211,auVar109);
  auVar145 = vmaxps_avx(auVar145,auVar113);
  auVar113 = vpminsd_avx(auVar229,auVar182);
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar312._4_4_ = uVar8;
  auVar312._0_4_ = uVar8;
  auVar312._8_4_ = uVar8;
  auVar312._12_4_ = uVar8;
  auVar113 = vmaxps_avx(auVar113,auVar312);
  auVar145 = vmaxps_avx(auVar145,auVar113);
  local_470._0_4_ = auVar145._0_4_ * 0.99999964;
  local_470._4_4_ = auVar145._4_4_ * 0.99999964;
  local_470._8_4_ = auVar145._8_4_ * 0.99999964;
  local_470._12_4_ = auVar145._12_4_ * 0.99999964;
  auVar145 = vpmaxsd_avx(auVar293,auVar140);
  auVar113 = vpmaxsd_avx(auVar211,auVar109);
  auVar145 = vminps_avx(auVar145,auVar113);
  auVar113 = vpmaxsd_avx(auVar229,auVar182);
  fVar137 = (ray->super_RayK<1>).tfar;
  auVar183._4_4_ = fVar137;
  auVar183._0_4_ = fVar137;
  auVar183._8_4_ = fVar137;
  auVar183._12_4_ = fVar137;
  auVar113 = vminps_avx(auVar113,auVar183);
  auVar145 = vminps_avx(auVar145,auVar113);
  auVar110._0_4_ = auVar145._0_4_ * 1.0000004;
  auVar110._4_4_ = auVar145._4_4_ * 1.0000004;
  auVar110._8_4_ = auVar145._8_4_ * 1.0000004;
  auVar110._12_4_ = auVar145._12_4_ * 1.0000004;
  auVar145 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar113 = vpcmpgtd_avx(auVar145,_DAT_01ff0cf0);
  auVar145 = vcmpps_avx(local_470,auVar110,2);
  auVar145 = vandps_avx(auVar145,auVar113);
  uVar99 = vmovmskps_avx(auVar145);
  if (uVar99 == 0) {
    return;
  }
  uVar99 = uVar99 & 0xff;
  auVar129._16_16_ = mm_lookupmask_ps._240_16_;
  auVar129._0_16_ = mm_lookupmask_ps._240_16_;
  local_260 = vblendps_avx(auVar129,ZEXT832(0) << 0x20,0x80);
  auVar299 = ZEXT464(0) << 0x20;
LAB_01066a1a:
  local_748 = (ulong)uVar99;
  lVar103 = 0;
  if ((ulong)uVar99 != 0) {
    for (; (uVar99 >> lVar103 & 1) == 0; lVar103 = lVar103 + 1) {
    }
  }
  local_ae8 = (ulong)*(uint *)(local_750 + 2);
  pGVar14 = (context->scene->geometries).items[*(uint *)(local_750 + 2)].ptr;
  local_a88 = (ulong)*(uint *)(local_750 + lVar103 * 4 + 6);
  uVar105 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                            (ulong)*(uint *)(local_750 + lVar103 * 4 + 6) *
                            pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar137 = (pGVar14->time_range).lower;
  fVar137 = pGVar14->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar137) /
            ((pGVar14->time_range).upper - fVar137));
  auVar145 = vroundss_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),9);
  auVar145 = vminss_avx(auVar145,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
  auVar145 = vmaxss_avx(auVar299._0_16_,auVar145);
  fVar137 = fVar137 - auVar145._0_4_;
  _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar102 = (long)(int)auVar145._0_4_ * 0x38;
  lVar103 = *(long *)(_Var15 + lVar102);
  lVar16 = *(long *)(_Var15 + 0x10 + lVar102);
  auVar145 = vshufps_avx(ZEXT416((uint)(1.0 - fVar137)),ZEXT416((uint)(1.0 - fVar137)),0);
  pfVar1 = (float *)(lVar103 + lVar16 * uVar105);
  fVar175 = auVar145._0_4_;
  fVar209 = auVar145._4_4_;
  fVar224 = auVar145._8_4_;
  fVar225 = auVar145._12_4_;
  pfVar2 = (float *)(lVar103 + lVar16 * (uVar105 + 1));
  pfVar3 = (float *)(lVar103 + lVar16 * (uVar105 + 2));
  pfVar4 = (float *)(lVar103 + lVar16 * (uVar105 + 3));
  lVar103 = *(long *)(_Var15 + 0x38 + lVar102);
  lVar16 = *(long *)(_Var15 + 0x48 + lVar102);
  auVar145 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
  pfVar5 = (float *)(lVar103 + uVar105 * lVar16);
  fVar226 = auVar145._0_4_;
  fVar227 = auVar145._4_4_;
  fVar243 = auVar145._8_4_;
  fVar244 = auVar145._12_4_;
  pfVar6 = (float *)(lVar103 + (uVar105 + 1) * lVar16);
  pfVar7 = (float *)(lVar103 + (uVar105 + 2) * lVar16);
  auVar313._0_4_ = fVar226 * *pfVar5 + fVar175 * *pfVar1;
  auVar313._4_4_ = fVar227 * pfVar5[1] + fVar209 * pfVar1[1];
  auVar313._8_4_ = fVar243 * pfVar5[2] + fVar224 * pfVar1[2];
  auVar313._12_4_ = fVar244 * pfVar5[3] + fVar225 * pfVar1[3];
  auVar184._0_4_ = fVar175 * *pfVar2 + fVar226 * *pfVar6;
  auVar184._4_4_ = fVar209 * pfVar2[1] + fVar227 * pfVar6[1];
  auVar184._8_4_ = fVar224 * pfVar2[2] + fVar243 * pfVar6[2];
  auVar184._12_4_ = fVar225 * pfVar2[3] + fVar244 * pfVar6[3];
  auVar212._0_4_ = fVar175 * *pfVar3 + fVar226 * *pfVar7;
  auVar212._4_4_ = fVar209 * pfVar3[1] + fVar227 * pfVar7[1];
  auVar212._8_4_ = fVar224 * pfVar3[2] + fVar243 * pfVar7[2];
  auVar212._12_4_ = fVar225 * pfVar3[3] + fVar244 * pfVar7[3];
  auVar111._0_4_ = (auVar313._0_4_ + auVar184._0_4_) * 0.5;
  auVar111._4_4_ = (auVar313._4_4_ + auVar184._4_4_) * 0.5;
  auVar111._8_4_ = (auVar313._8_4_ + auVar184._8_4_) * 0.5;
  auVar111._12_4_ = (auVar313._12_4_ + auVar184._12_4_) * 0.5;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar145 = vsubps_avx(auVar111,(undefined1  [16])aVar10);
  auVar145 = vdpps_avx(auVar145,(undefined1  [16])aVar11,0x7f);
  auVar113 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar185 = vrcpss_avx(auVar113,auVar113);
  auVar356 = ZEXT464(0x40000000);
  fVar137 = auVar145._0_4_ * auVar185._0_4_ * (2.0 - auVar185._0_4_ * auVar113._0_4_);
  local_760 = ZEXT416((uint)fVar137);
  auVar113 = vshufps_avx(ZEXT416((uint)fVar137),ZEXT416((uint)fVar137),0);
  fVar137 = aVar11.x;
  fVar168 = aVar11.y;
  fVar171 = aVar11.z;
  aVar173 = aVar11.field_3;
  auVar271._0_4_ = aVar10.x + fVar137 * auVar113._0_4_;
  auVar271._4_4_ = aVar10.y + fVar168 * auVar113._4_4_;
  auVar271._8_4_ = aVar10.z + fVar171 * auVar113._8_4_;
  auVar271._12_4_ = aVar10.field_3.w + aVar173.w * auVar113._12_4_;
  auVar145 = vblendps_avx(auVar271,_DAT_01feba10,8);
  _local_970 = vsubps_avx(auVar313,auVar145);
  pfVar1 = (float *)(lVar103 + lVar16 * (uVar105 + 3));
  _local_980 = vsubps_avx(auVar212,auVar145);
  auVar320 = ZEXT1664(_local_980);
  auVar213._0_4_ = fVar175 * *pfVar4 + fVar226 * *pfVar1;
  auVar213._4_4_ = fVar209 * pfVar4[1] + fVar227 * pfVar1[1];
  auVar213._8_4_ = fVar224 * pfVar4[2] + fVar243 * pfVar1[2];
  auVar213._12_4_ = fVar225 * pfVar4[3] + fVar244 * pfVar1[3];
  auVar263 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  _local_990 = vsubps_avx(auVar184,auVar145);
  _local_9a0 = vsubps_avx(auVar213,auVar145);
  auVar145 = vshufps_avx(_local_970,_local_970,0);
  register0x00001290 = auVar145;
  _local_280 = auVar145;
  auVar145 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar145;
  _local_1a0 = auVar145;
  auVar145 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001290 = auVar145;
  _local_1c0 = auVar145;
  auVar145 = vshufps_avx(_local_970,_local_970,0xff);
  register0x00001290 = auVar145;
  _local_1e0 = auVar145;
  auVar145 = vshufps_avx(_local_990,_local_990,0);
  register0x00001290 = auVar145;
  _local_2a0 = auVar145;
  auVar145 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar145;
  _local_2c0 = auVar145;
  auVar145 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar145;
  _local_2e0 = auVar145;
  auVar141._0_4_ = fVar137 * fVar137;
  auVar141._4_4_ = fVar168 * fVar168;
  auVar141._8_4_ = fVar171 * fVar171;
  auVar141._12_4_ = aVar173.w * aVar173.w;
  auVar145 = vshufps_avx(auVar141,auVar141,0xaa);
  auVar185 = vshufps_avx(auVar141,auVar141,0x55);
  auVar142 = vshufps_avx(_local_990,_local_990,0xff);
  register0x000012d0 = auVar142;
  _local_200 = auVar142;
  auVar142 = vshufps_avx(auVar141,auVar141,0);
  local_220._0_4_ = auVar142._0_4_ + auVar185._0_4_ + auVar145._0_4_;
  local_220._4_4_ = auVar142._4_4_ + auVar185._4_4_ + auVar145._4_4_;
  local_220._8_4_ = auVar142._8_4_ + auVar185._8_4_ + auVar145._8_4_;
  local_220._12_4_ = auVar142._12_4_ + auVar185._12_4_ + auVar145._12_4_;
  local_220._16_4_ = auVar142._0_4_ + auVar185._0_4_ + auVar145._0_4_;
  local_220._20_4_ = auVar142._4_4_ + auVar185._4_4_ + auVar145._4_4_;
  local_220._24_4_ = auVar142._8_4_ + auVar185._8_4_ + auVar145._8_4_;
  local_220._28_4_ = auVar142._12_4_ + auVar185._12_4_ + auVar145._12_4_;
  auVar145 = vshufps_avx(_local_980,_local_980,0);
  register0x00001250 = auVar145;
  _local_300 = auVar145;
  auVar145 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar145;
  _local_320 = auVar145;
  auVar145 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar145;
  _local_340 = auVar145;
  auVar145 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar145;
  _local_360 = auVar145;
  auVar145 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001250 = auVar145;
  _local_380 = auVar145;
  auVar145 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001250 = auVar145;
  _local_3a0 = auVar145;
  auVar145 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar145;
  _local_3c0 = auVar145;
  auVar145 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar145;
  _local_240 = auVar145;
  register0x00001390 = auVar113;
  _local_740 = auVar113;
  uVar105 = 1;
  uVar100 = 0;
  local_4e0 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_4dc = local_4e0;
  fStack_4d8 = local_4e0;
  fStack_4d4 = local_4e0;
  fStack_4d0 = local_4e0;
  fStack_4cc = local_4e0;
  fStack_4c8 = local_4e0;
  fStack_4c4 = local_4e0;
  local_500 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_4fc = local_500;
  fStack_4f8 = local_500;
  fStack_4f4 = local_500;
  fStack_4f0 = local_500;
  fStack_4ec = local_500;
  fStack_4e8 = local_500;
  fStack_4e4 = local_500;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  local_3e0 = vandps_avx(local_220,auVar122);
  local_770 = 0x3f80000000000000;
  uStack_768 = 0;
  do {
    auVar95._8_8_ = uStack_768;
    auVar95._0_8_ = local_770;
    auVar145 = vmovshdup_avx(auVar95);
    fVar227 = auVar145._0_4_ - (float)local_770;
    auVar145 = vshufps_avx(auVar95,auVar95,0);
    local_880._16_16_ = auVar145;
    local_880._0_16_ = auVar145;
    auVar113 = vshufps_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),0);
    local_8e0._16_16_ = auVar113;
    local_8e0._0_16_ = auVar113;
    fVar136 = auVar113._0_4_;
    fVar167 = auVar113._4_4_;
    fVar170 = auVar113._8_4_;
    fVar174 = auVar113._12_4_;
    fVar107 = auVar145._0_4_;
    auVar219._0_4_ = fVar107 + fVar136 * 0.0;
    fVar133 = auVar145._4_4_;
    auVar219._4_4_ = fVar133 + fVar167 * 0.14285715;
    fVar134 = auVar145._8_4_;
    auVar219._8_4_ = fVar134 + fVar170 * 0.2857143;
    fVar135 = auVar145._12_4_;
    auVar219._12_4_ = fVar135 + fVar174 * 0.42857146;
    auVar219._16_4_ = fVar107 + fVar136 * 0.5714286;
    auVar219._20_4_ = fVar133 + fVar167 * 0.71428573;
    auVar219._24_4_ = fVar134 + fVar170 * 0.8571429;
    auVar219._28_4_ = fVar135 + fVar174;
    auVar129 = vsubps_avx(auVar263._0_32_,auVar219);
    auVar194._0_4_ = auVar219._0_4_ * auVar219._0_4_;
    auVar194._4_4_ = auVar219._4_4_ * auVar219._4_4_;
    auVar194._8_4_ = auVar219._8_4_ * auVar219._8_4_;
    auVar194._12_4_ = auVar219._12_4_ * auVar219._12_4_;
    auVar194._16_4_ = auVar219._16_4_ * auVar219._16_4_;
    auVar194._20_4_ = auVar219._20_4_ * auVar219._20_4_;
    auVar194._24_4_ = auVar219._24_4_ * auVar219._24_4_;
    auVar194._28_4_ = 0;
    fVar243 = auVar219._0_4_ * 3.0;
    fVar245 = auVar219._4_4_ * 3.0;
    fVar247 = auVar219._8_4_ * 3.0;
    fVar264 = auVar219._12_4_ * 3.0;
    fVar265 = auVar219._16_4_ * 3.0;
    fVar266 = auVar219._20_4_ * 3.0;
    fVar246 = auVar219._24_4_ * 3.0;
    fVar168 = auVar129._0_4_;
    auVar299._0_4_ = fVar168 * fVar168;
    fVar171 = auVar129._4_4_;
    auVar299._4_4_ = fVar171 * fVar171;
    fVar175 = auVar129._8_4_;
    auVar299._8_4_ = fVar175 * fVar175;
    fVar209 = auVar129._12_4_;
    auVar299._12_4_ = fVar209 * fVar209;
    fVar224 = auVar129._16_4_;
    auVar299._16_4_ = fVar224 * fVar224;
    fVar225 = auVar129._20_4_;
    auVar299._20_4_ = fVar225 * fVar225;
    fVar226 = auVar129._24_4_;
    auVar299._28_36_ = auVar320._28_36_;
    auVar299._24_4_ = fVar226 * fVar226;
    fVar244 = auVar129._28_4_;
    fVar268 = (auVar299._0_4_ * (fVar168 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar277 = (auVar299._4_4_ * (fVar171 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar278 = (auVar299._8_4_ * (fVar175 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar280 = (auVar299._12_4_ * (fVar209 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar282 = (auVar299._16_4_ * (fVar224 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar284 = (auVar299._20_4_ * (fVar225 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar286 = (auVar299._24_4_ * (fVar226 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar340 = -fVar168 * auVar219._0_4_ * auVar219._0_4_ * 0.5;
    fVar345 = -fVar171 * auVar219._4_4_ * auVar219._4_4_ * 0.5;
    fVar346 = -fVar175 * auVar219._8_4_ * auVar219._8_4_ * 0.5;
    fVar347 = -fVar209 * auVar219._12_4_ * auVar219._12_4_ * 0.5;
    fVar348 = -fVar224 * auVar219._16_4_ * auVar219._16_4_ * 0.5;
    fVar349 = -fVar225 * auVar219._20_4_ * auVar219._20_4_ * 0.5;
    fVar350 = -fVar226 * auVar219._24_4_ * auVar219._24_4_ * 0.5;
    fVar137 = auVar389._28_4_;
    fVar357 = auVar356._28_4_ + fVar137;
    fVar361 = auVar360._28_4_ + fVar137;
    fVar385 = (auVar194._0_4_ * (fVar243 + -5.0) + 2.0) * 0.5;
    fVar390 = (auVar194._4_4_ * (fVar245 + -5.0) + 2.0) * 0.5;
    fVar391 = (auVar194._8_4_ * (fVar247 + -5.0) + 2.0) * 0.5;
    fVar392 = (auVar194._12_4_ * (fVar264 + -5.0) + 2.0) * 0.5;
    fVar393 = (auVar194._16_4_ * (fVar265 + -5.0) + 2.0) * 0.5;
    fVar394 = (auVar194._20_4_ * (fVar266 + -5.0) + 2.0) * 0.5;
    fVar395 = (auVar194._24_4_ * (fVar246 + -5.0) + 2.0) * 0.5;
    fVar352 = -fVar244 + fVar357;
    fVar362 = -auVar219._0_4_ * fVar168 * fVar168 * 0.5;
    fVar371 = -auVar219._4_4_ * fVar171 * fVar171 * 0.5;
    fVar374 = -auVar219._8_4_ * fVar175 * fVar175 * 0.5;
    fVar376 = -auVar219._12_4_ * fVar209 * fVar209 * 0.5;
    fVar378 = -auVar219._16_4_ * fVar224 * fVar224 * 0.5;
    fVar380 = -auVar219._20_4_ * fVar225 * fVar225 * 0.5;
    fVar382 = -auVar219._24_4_ * fVar226 * fVar226 * 0.5;
    local_a80 = fVar362 * (float)local_280._0_4_ +
                fVar385 * (float)local_2a0._0_4_ +
                fVar340 * (float)local_380._0_4_ + fVar268 * (float)local_300._0_4_;
    fStack_a7c = fVar371 * (float)local_280._4_4_ +
                 fVar390 * (float)local_2a0._4_4_ +
                 fVar345 * (float)local_380._4_4_ + fVar277 * (float)local_300._4_4_;
    fStack_a78 = fVar374 * fStack_278 +
                 fVar391 * fStack_298 + fVar346 * fStack_378 + fVar278 * fStack_2f8;
    fStack_a74 = fVar376 * fStack_274 +
                 fVar392 * fStack_294 + fVar347 * fStack_374 + fVar280 * fStack_2f4;
    fStack_a70 = fVar378 * fStack_270 +
                 fVar393 * fStack_290 + fVar348 * fStack_370 + fVar282 * fStack_2f0;
    fStack_a6c = fVar380 * fStack_26c +
                 fVar394 * fStack_28c + fVar349 * fStack_36c + fVar284 * fStack_2ec;
    fStack_a68 = fVar382 * fStack_268 +
                 fVar395 * fStack_288 + fVar350 * fStack_368 + fVar286 * fStack_2e8;
    fStack_a64 = fVar137 + 2.0 + fVar352;
    local_ae0 = (float)local_1a0._0_4_ * fVar362 +
                fVar385 * (float)local_2c0._0_4_ +
                fVar340 * (float)local_3a0._0_4_ + fVar268 * (float)local_320._0_4_;
    fStack_adc = (float)local_1a0._4_4_ * fVar371 +
                 fVar390 * (float)local_2c0._4_4_ +
                 fVar345 * (float)local_3a0._4_4_ + fVar277 * (float)local_320._4_4_;
    fStack_ad8 = fStack_198 * fVar374 +
                 fVar391 * fStack_2b8 + fVar346 * fStack_398 + fVar278 * fStack_318;
    fStack_ad4 = fStack_194 * fVar376 +
                 fVar392 * fStack_2b4 + fVar347 * fStack_394 + fVar280 * fStack_314;
    fStack_ad0 = fStack_190 * fVar378 +
                 fVar393 * fStack_2b0 + fVar348 * fStack_390 + fVar282 * fStack_310;
    fStack_acc = fStack_18c * fVar380 +
                 fVar394 * fStack_2ac + fVar349 * fStack_38c + fVar284 * fStack_30c;
    fStack_ac8 = fStack_188 * fVar382 +
                 fVar395 * fStack_2a8 + fVar350 * fStack_388 + fVar286 * fStack_308;
    fStack_ac4 = fVar352 + fVar357 + fVar361;
    local_ac0 = fVar362 * (float)local_1c0._0_4_ +
                fVar385 * (float)local_2e0._0_4_ +
                fVar340 * (float)local_3c0._0_4_ + fVar268 * (float)local_340._0_4_;
    fStack_abc = fVar371 * (float)local_1c0._4_4_ +
                 fVar390 * (float)local_2e0._4_4_ +
                 fVar345 * (float)local_3c0._4_4_ + fVar277 * (float)local_340._4_4_;
    fStack_ab8 = fVar374 * fStack_1b8 +
                 fVar391 * fStack_2d8 + fVar346 * fStack_3b8 + fVar278 * fStack_338;
    fStack_ab4 = fVar376 * fStack_1b4 +
                 fVar392 * fStack_2d4 + fVar347 * fStack_3b4 + fVar280 * fStack_334;
    fStack_ab0 = fVar378 * fStack_1b0 +
                 fVar393 * fStack_2d0 + fVar348 * fStack_3b0 + fVar282 * fStack_330;
    fStack_aac = fVar380 * fStack_1ac +
                 fVar394 * fStack_2cc + fVar349 * fStack_3ac + fVar284 * fStack_32c;
    fStack_aa8 = fVar382 * fStack_1a8 +
                 fVar395 * fStack_2c8 + fVar350 * fStack_3a8 + fVar286 * fStack_328;
    fStack_aa4 = fVar352 + fVar361 + auVar370._28_4_ + fVar137;
    local_7a0._0_4_ =
         (float)local_1e0._0_4_ * fVar362 +
         (float)local_200._0_4_ * fVar385 +
         (float)local_240._0_4_ * fVar340 + fVar268 * (float)local_360._0_4_;
    local_7a0._4_4_ =
         (float)local_1e0._4_4_ * fVar371 +
         (float)local_200._4_4_ * fVar390 +
         (float)local_240._4_4_ * fVar345 + fVar277 * (float)local_360._4_4_;
    local_7a0._8_4_ =
         fStack_1d8 * fVar374 + fStack_1f8 * fVar391 + fStack_238 * fVar346 + fVar278 * fStack_358;
    local_7a0._12_4_ =
         fStack_1d4 * fVar376 + fStack_1f4 * fVar392 + fStack_234 * fVar347 + fVar280 * fStack_354;
    local_7a0._16_4_ =
         fStack_1d0 * fVar378 + fStack_1f0 * fVar393 + fStack_230 * fVar348 + fVar282 * fStack_350;
    local_7a0._20_4_ =
         fStack_1cc * fVar380 + fStack_1ec * fVar394 + fStack_22c * fVar349 + fVar284 * fStack_34c;
    local_7a0._24_4_ =
         fStack_1c8 * fVar382 + fStack_1e8 * fVar395 + fStack_228 * fVar350 + fVar286 * fStack_348;
    local_7a0._28_4_ = fVar352 + fVar137 + 2.0 + -fVar244 + auVar263._28_4_ + -5.0 + 2.0;
    auVar32._4_4_ = (fVar171 + fVar171) * auVar219._4_4_;
    auVar32._0_4_ = (fVar168 + fVar168) * auVar219._0_4_;
    auVar32._8_4_ = (fVar175 + fVar175) * auVar219._8_4_;
    auVar32._12_4_ = (fVar209 + fVar209) * auVar219._12_4_;
    auVar32._16_4_ = (fVar224 + fVar224) * auVar219._16_4_;
    auVar32._20_4_ = (fVar225 + fVar225) * auVar219._20_4_;
    auVar32._24_4_ = (fVar226 + fVar226) * auVar219._24_4_;
    auVar32._28_4_ = auVar219._28_4_ + auVar219._28_4_;
    auVar129 = vsubps_avx(auVar32,auVar299._0_32_);
    auVar33._4_4_ = (fVar171 + fVar171) * (fVar245 + 2.0);
    auVar33._0_4_ = (fVar168 + fVar168) * (fVar243 + 2.0);
    auVar33._8_4_ = (fVar175 + fVar175) * (fVar247 + 2.0);
    auVar33._12_4_ = (fVar209 + fVar209) * (fVar264 + 2.0);
    auVar33._16_4_ = (fVar224 + fVar224) * (fVar265 + 2.0);
    auVar33._20_4_ = (fVar225 + fVar225) * (fVar266 + 2.0);
    auVar33._24_4_ = (fVar226 + fVar226) * (fVar246 + 2.0);
    auVar33._28_4_ = 0x40000000;
    auVar34._4_4_ = fVar171 * fVar171 * 3.0;
    auVar34._0_4_ = fVar168 * fVar168 * 3.0;
    auVar34._8_4_ = fVar175 * fVar175 * 3.0;
    auVar34._12_4_ = fVar209 * fVar209 * 3.0;
    auVar34._16_4_ = fVar224 * fVar224 * 3.0;
    auVar34._20_4_ = fVar225 * fVar225 * 3.0;
    auVar34._24_4_ = fVar226 * fVar226 * 3.0;
    auVar34._28_4_ = fVar244;
    auVar122 = vsubps_avx(auVar33,auVar34);
    auVar32 = vsubps_avx(auVar194,auVar32);
    fVar348 = auVar129._0_4_ * 0.5;
    fVar349 = auVar129._4_4_ * 0.5;
    fVar350 = auVar129._8_4_ * 0.5;
    fVar352 = auVar129._12_4_ * 0.5;
    fVar357 = auVar129._16_4_ * 0.5;
    fVar361 = auVar129._20_4_ * 0.5;
    fVar362 = auVar129._24_4_ * 0.5;
    fVar278 = (auVar219._0_4_ * fVar243 + (auVar219._0_4_ + auVar219._0_4_) * (fVar243 + -5.0)) *
              0.5;
    fVar280 = (auVar219._4_4_ * fVar245 + (auVar219._4_4_ + auVar219._4_4_) * (fVar245 + -5.0)) *
              0.5;
    fVar282 = (auVar219._8_4_ * fVar247 + (auVar219._8_4_ + auVar219._8_4_) * (fVar247 + -5.0)) *
              0.5;
    fVar340 = (auVar219._12_4_ * fVar264 + (auVar219._12_4_ + auVar219._12_4_) * (fVar264 + -5.0)) *
              0.5;
    fVar345 = (auVar219._16_4_ * fVar265 + (auVar219._16_4_ + auVar219._16_4_) * (fVar265 + -5.0)) *
              0.5;
    fVar346 = (auVar219._20_4_ * fVar266 + (auVar219._20_4_ + auVar219._20_4_) * (fVar266 + -5.0)) *
              0.5;
    fVar347 = (auVar219._24_4_ * fVar246 + (auVar219._24_4_ + auVar219._24_4_) * (fVar246 + -5.0)) *
              0.5;
    fVar137 = auVar122._0_4_ * 0.5;
    fVar168 = auVar122._4_4_ * 0.5;
    fVar171 = auVar122._8_4_ * 0.5;
    fVar175 = auVar122._12_4_ * 0.5;
    fVar209 = auVar122._16_4_ * 0.5;
    fVar224 = auVar122._20_4_ * 0.5;
    fVar243 = auVar122._24_4_ * 0.5;
    fVar225 = auVar32._0_4_ * 0.5;
    fVar226 = auVar32._4_4_ * 0.5;
    fVar245 = auVar32._8_4_ * 0.5;
    fVar247 = auVar32._12_4_ * 0.5;
    fVar264 = auVar32._16_4_ * 0.5;
    fVar268 = auVar32._20_4_ * 0.5;
    fVar277 = auVar32._24_4_ * 0.5;
    fVar339 = fVar244 + fVar244 + auVar129._28_4_;
    fVar306 = fVar339 + fVar244 + fVar244 + -5.0;
    fVar286 = auVar219._28_4_ + -5.0 + auVar122._28_4_ + auVar32._28_4_ + 2.0;
    auVar145 = vpermilps_avx(ZEXT416((uint)(fVar227 * 0.04761905)),0);
    fVar266 = auVar145._0_4_;
    fVar288 = fVar266 * (fVar348 * (float)local_280._0_4_ +
                        fVar278 * (float)local_2a0._0_4_ +
                        fVar137 * (float)local_300._0_4_ + fVar225 * (float)local_380._0_4_);
    fVar246 = auVar145._4_4_;
    fVar300 = fVar246 * (fVar349 * (float)local_280._4_4_ +
                        fVar280 * (float)local_2a0._4_4_ +
                        fVar168 * (float)local_300._4_4_ + fVar226 * (float)local_380._4_4_);
    local_920._4_4_ = fVar300;
    local_920._0_4_ = fVar288;
    fVar284 = auVar145._8_4_;
    fVar301 = fVar284 * (fVar350 * fStack_278 +
                        fVar282 * fStack_298 + fVar171 * fStack_2f8 + fVar245 * fStack_378);
    fStack_918 = fVar301;
    fVar265 = auVar145._12_4_;
    fVar302 = fVar265 * (fVar352 * fStack_274 +
                        fVar340 * fStack_294 + fVar175 * fStack_2f4 + fVar247 * fStack_374);
    fStack_914 = fVar302;
    fVar303 = fVar266 * (fVar357 * fStack_270 +
                        fVar345 * fStack_290 + fVar209 * fStack_2f0 + fVar264 * fStack_370);
    unique0x10008d88 = fVar303;
    fVar304 = fVar246 * (fVar361 * fStack_26c +
                        fVar346 * fStack_28c + fVar224 * fStack_2ec + fVar268 * fStack_36c);
    unique0x10008d8c = fVar304;
    fVar305 = fVar284 * (fVar362 * fStack_268 +
                        fVar347 * fStack_288 + fVar243 * fStack_2e8 + fVar277 * fStack_368);
    unique0x10008d90 = fVar305;
    unique0x10008d94 = fVar306;
    fVar307 = fVar266 * ((float)local_1a0._0_4_ * fVar348 +
                        fVar278 * (float)local_2c0._0_4_ +
                        fVar137 * (float)local_320._0_4_ + fVar225 * (float)local_3a0._0_4_);
    fVar321 = fVar246 * ((float)local_1a0._4_4_ * fVar349 +
                        fVar280 * (float)local_2c0._4_4_ +
                        fVar168 * (float)local_320._4_4_ + fVar226 * (float)local_3a0._4_4_);
    local_940._4_4_ = fVar321;
    local_940._0_4_ = fVar307;
    fVar324 = fVar284 * (fStack_198 * fVar350 +
                        fVar282 * fStack_2b8 + fVar171 * fStack_318 + fVar245 * fStack_398);
    local_940._8_4_ = fVar324;
    fVar327 = fVar265 * (fStack_194 * fVar352 +
                        fVar340 * fStack_2b4 + fVar175 * fStack_314 + fVar247 * fStack_394);
    local_940._12_4_ = fVar327;
    fVar330 = fVar266 * (fStack_190 * fVar357 +
                        fVar345 * fStack_2b0 + fVar209 * fStack_310 + fVar264 * fStack_390);
    local_940._16_4_ = fVar330;
    fVar333 = fVar246 * (fStack_18c * fVar361 +
                        fVar346 * fStack_2ac + fVar224 * fStack_30c + fVar268 * fStack_38c);
    local_940._20_4_ = fVar333;
    fVar336 = fVar284 * (fStack_188 * fVar362 +
                        fVar347 * fStack_2a8 + fVar243 * fStack_308 + fVar277 * fStack_388);
    local_940._24_4_ = fVar336;
    local_940._28_4_ = fVar339;
    fVar363 = fVar266 * ((float)local_1c0._0_4_ * fVar348 +
                        fVar137 * (float)local_340._0_4_ + fVar225 * (float)local_3c0._0_4_ +
                        fVar278 * (float)local_2e0._0_4_);
    fVar372 = fVar246 * ((float)local_1c0._4_4_ * fVar349 +
                        fVar168 * (float)local_340._4_4_ + fVar226 * (float)local_3c0._4_4_ +
                        fVar280 * (float)local_2e0._4_4_);
    local_840._4_4_ = fVar372;
    local_840._0_4_ = fVar363;
    fVar375 = fVar284 * (fStack_1b8 * fVar350 +
                        fVar171 * fStack_338 + fVar245 * fStack_3b8 + fVar282 * fStack_2d8);
    local_840._8_4_ = fVar375;
    fVar377 = fVar265 * (fStack_1b4 * fVar352 +
                        fVar175 * fStack_334 + fVar247 * fStack_3b4 + fVar340 * fStack_2d4);
    local_840._12_4_ = fVar377;
    fVar379 = fVar266 * (fStack_1b0 * fVar357 +
                        fVar209 * fStack_330 + fVar264 * fStack_3b0 + fVar345 * fStack_2d0);
    local_840._16_4_ = fVar379;
    fVar381 = fVar246 * (fStack_1ac * fVar361 +
                        fVar224 * fStack_32c + fVar268 * fStack_3ac + fVar346 * fStack_2cc);
    local_840._20_4_ = fVar381;
    fVar383 = fVar284 * (fStack_1a8 * fVar362 +
                        fVar243 * fStack_328 + fVar277 * fStack_3a8 + fVar347 * fStack_2c8);
    local_840._24_4_ = fVar383;
    local_840._28_4_ = -auVar219._28_4_;
    fVar225 = fVar266 * ((float)local_1e0._0_4_ * fVar348 +
                        (float)local_200._0_4_ * fVar278 +
                        fVar137 * (float)local_360._0_4_ + (float)local_240._0_4_ * fVar225);
    fVar226 = fVar246 * ((float)local_1e0._4_4_ * fVar349 +
                        (float)local_200._4_4_ * fVar280 +
                        fVar168 * (float)local_360._4_4_ + (float)local_240._4_4_ * fVar226);
    auVar223._4_4_ = fVar226;
    auVar223._0_4_ = fVar225;
    fVar227 = fVar284 * (fStack_1d8 * fVar350 +
                        fStack_1f8 * fVar282 + fVar171 * fStack_358 + fStack_238 * fVar245);
    auVar223._8_4_ = fVar227;
    fVar265 = fVar265 * (fStack_1d4 * fVar352 +
                        fStack_1f4 * fVar340 + fVar175 * fStack_354 + fStack_234 * fVar247);
    auVar223._12_4_ = fVar265;
    fVar266 = fVar266 * (fStack_1d0 * fVar357 +
                        fStack_1f0 * fVar345 + fVar209 * fStack_350 + fStack_230 * fVar264);
    auVar223._16_4_ = fVar266;
    fVar246 = fVar246 * (fStack_1cc * fVar361 +
                        fStack_1ec * fVar346 + fVar224 * fStack_34c + fStack_22c * fVar268);
    auVar223._20_4_ = fVar246;
    fVar284 = fVar284 * (fStack_1c8 * fVar362 +
                        fStack_1e8 * fVar347 + fVar243 * fStack_348 + fStack_228 * fVar277);
    auVar223._24_4_ = fVar284;
    auVar223._28_4_ = fVar286;
    auVar89._4_4_ = fStack_adc;
    auVar89._0_4_ = local_ae0;
    auVar89._8_4_ = fStack_ad8;
    auVar89._12_4_ = fStack_ad4;
    auVar89._16_4_ = fStack_ad0;
    auVar89._20_4_ = fStack_acc;
    auVar89._24_4_ = fStack_ac8;
    auVar89._28_4_ = fStack_ac4;
    auVar129 = vperm2f128_avx(auVar89,auVar89,1);
    auVar129 = vshufps_avx(auVar129,auVar89,0x30);
    _local_a00 = vshufps_avx(auVar89,auVar129,0x29);
    auVar91._4_4_ = fStack_abc;
    auVar91._0_4_ = local_ac0;
    auVar91._8_4_ = fStack_ab8;
    auVar91._12_4_ = fStack_ab4;
    auVar91._16_4_ = fStack_ab0;
    auVar91._20_4_ = fStack_aac;
    auVar91._24_4_ = fStack_aa8;
    auVar91._28_4_ = fStack_aa4;
    auVar129 = vperm2f128_avx(auVar91,auVar91,1);
    auVar129 = vshufps_avx(auVar129,auVar91,0x30);
    _local_900 = vshufps_avx(auVar91,auVar129,0x29);
    auVar122 = vsubps_avx(local_7a0,auVar223);
    auVar129 = vperm2f128_avx(auVar122,auVar122,1);
    auVar129 = vshufps_avx(auVar129,auVar122,0x30);
    local_7c0 = vshufps_avx(auVar122,auVar129,0x29);
    local_540 = vsubps_avx(_local_a00,auVar89);
    _local_680 = vsubps_avx(_local_900,auVar91);
    fVar168 = local_540._0_4_;
    fVar243 = local_540._4_4_;
    auVar35._4_4_ = fVar372 * fVar243;
    auVar35._0_4_ = fVar363 * fVar168;
    fVar268 = local_540._8_4_;
    auVar35._8_4_ = fVar375 * fVar268;
    fVar345 = local_540._12_4_;
    auVar35._12_4_ = fVar377 * fVar345;
    fVar361 = local_540._16_4_;
    auVar35._16_4_ = fVar379 * fVar361;
    fVar385 = local_540._20_4_;
    auVar35._20_4_ = fVar381 * fVar385;
    fVar18 = local_540._24_4_;
    auVar35._24_4_ = fVar383 * fVar18;
    auVar35._28_4_ = auVar122._28_4_;
    fVar171 = local_680._0_4_;
    fVar244 = local_680._4_4_;
    auVar295._4_4_ = fVar321 * fVar244;
    auVar295._0_4_ = fVar307 * fVar171;
    fVar277 = local_680._8_4_;
    auVar295._8_4_ = fVar324 * fVar277;
    fVar346 = local_680._12_4_;
    auVar295._12_4_ = fVar327 * fVar346;
    fVar362 = local_680._16_4_;
    auVar295._16_4_ = fVar330 * fVar362;
    fVar390 = local_680._20_4_;
    auVar295._20_4_ = fVar333 * fVar390;
    fVar19 = local_680._24_4_;
    auVar295._24_4_ = fVar336 * fVar19;
    auVar295._28_4_ = auVar129._28_4_;
    auVar32 = vsubps_avx(auVar295,auVar35);
    auVar93._4_4_ = fStack_a7c;
    auVar93._0_4_ = local_a80;
    auVar93._8_4_ = fStack_a78;
    auVar93._12_4_ = fStack_a74;
    auVar93._16_4_ = fStack_a70;
    auVar93._20_4_ = fStack_a6c;
    auVar93._24_4_ = fStack_a68;
    auVar93._28_4_ = fStack_a64;
    auVar129 = vperm2f128_avx(auVar93,auVar93,1);
    auVar129 = vshufps_avx(auVar129,auVar93,0x30);
    local_860 = vshufps_avx(auVar93,auVar129,0x29);
    local_560 = vsubps_avx(local_860,auVar93);
    auVar36._4_4_ = fVar244 * fVar300;
    auVar36._0_4_ = fVar171 * fVar288;
    auVar36._8_4_ = fVar277 * fVar301;
    auVar36._12_4_ = fVar346 * fVar302;
    auVar36._16_4_ = fVar362 * fVar303;
    auVar36._20_4_ = fVar390 * fVar304;
    auVar36._24_4_ = fVar19 * fVar305;
    auVar36._28_4_ = auVar129._28_4_;
    fVar175 = local_560._0_4_;
    fVar245 = local_560._4_4_;
    auVar37._4_4_ = fVar372 * fVar245;
    auVar37._0_4_ = fVar363 * fVar175;
    fVar278 = local_560._8_4_;
    auVar37._8_4_ = fVar375 * fVar278;
    fVar347 = local_560._12_4_;
    auVar37._12_4_ = fVar377 * fVar347;
    fVar371 = local_560._16_4_;
    auVar37._16_4_ = fVar379 * fVar371;
    fVar391 = local_560._20_4_;
    auVar37._20_4_ = fVar381 * fVar391;
    fVar20 = local_560._24_4_;
    auVar37._24_4_ = fVar383 * fVar20;
    auVar37._28_4_ = fStack_a64;
    auVar33 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar321 * fVar245;
    auVar38._0_4_ = fVar307 * fVar175;
    auVar38._8_4_ = fVar324 * fVar278;
    auVar38._12_4_ = fVar327 * fVar347;
    auVar38._16_4_ = fVar330 * fVar371;
    auVar38._20_4_ = fVar333 * fVar391;
    auVar38._24_4_ = fVar336 * fVar20;
    auVar38._28_4_ = fStack_a64;
    auVar39._4_4_ = fVar243 * fVar300;
    auVar39._0_4_ = fVar168 * fVar288;
    auVar39._8_4_ = fVar268 * fVar301;
    auVar39._12_4_ = fVar345 * fVar302;
    auVar39._16_4_ = fVar361 * fVar303;
    auVar39._20_4_ = fVar385 * fVar304;
    auVar39._24_4_ = fVar18 * fVar305;
    auVar39._28_4_ = fStack_aa4;
    auVar34 = vsubps_avx(auVar39,auVar38);
    fVar137 = auVar34._28_4_;
    fVar340 = auVar33._28_4_ + fVar137;
    auVar220._0_4_ = fVar175 * fVar175 + fVar168 * fVar168 + fVar171 * fVar171;
    auVar220._4_4_ = fVar245 * fVar245 + fVar243 * fVar243 + fVar244 * fVar244;
    auVar220._8_4_ = fVar278 * fVar278 + fVar268 * fVar268 + fVar277 * fVar277;
    auVar220._12_4_ = fVar347 * fVar347 + fVar345 * fVar345 + fVar346 * fVar346;
    auVar220._16_4_ = fVar371 * fVar371 + fVar361 * fVar361 + fVar362 * fVar362;
    auVar220._20_4_ = fVar391 * fVar391 + fVar385 * fVar385 + fVar390 * fVar390;
    auVar220._24_4_ = fVar20 * fVar20 + fVar18 * fVar18 + fVar19 * fVar19;
    auVar220._28_4_ = fVar137 + fVar137 + fVar340;
    auVar129 = vrcpps_avx(auVar220);
    fVar350 = auVar129._0_4_;
    fVar352 = auVar129._4_4_;
    auVar40._4_4_ = fVar352 * auVar220._4_4_;
    auVar40._0_4_ = fVar350 * auVar220._0_4_;
    fVar357 = auVar129._8_4_;
    auVar40._8_4_ = fVar357 * auVar220._8_4_;
    fVar378 = auVar129._12_4_;
    auVar40._12_4_ = fVar378 * auVar220._12_4_;
    fVar380 = auVar129._16_4_;
    auVar40._16_4_ = fVar380 * auVar220._16_4_;
    fVar382 = auVar129._20_4_;
    auVar40._20_4_ = fVar382 * auVar220._20_4_;
    fVar394 = auVar129._24_4_;
    auVar40._24_4_ = fVar394 * auVar220._24_4_;
    auVar40._28_4_ = fStack_aa4;
    auVar123._8_4_ = 0x3f800000;
    auVar123._0_8_ = &DAT_3f8000003f800000;
    auVar123._12_4_ = 0x3f800000;
    auVar123._16_4_ = 0x3f800000;
    auVar123._20_4_ = 0x3f800000;
    auVar123._24_4_ = 0x3f800000;
    auVar123._28_4_ = 0x3f800000;
    auVar223 = vsubps_avx(auVar123,auVar40);
    fVar350 = auVar223._0_4_ * fVar350 + fVar350;
    fVar352 = auVar223._4_4_ * fVar352 + fVar352;
    fVar357 = auVar223._8_4_ * fVar357 + fVar357;
    fVar378 = auVar223._12_4_ * fVar378 + fVar378;
    fVar380 = auVar223._16_4_ * fVar380 + fVar380;
    fVar382 = auVar223._20_4_ * fVar382 + fVar382;
    fVar394 = auVar223._24_4_ * fVar394 + fVar394;
    auVar122 = vperm2f128_avx(local_940,local_940,1);
    auVar122 = vshufps_avx(auVar122,local_940,0x30);
    local_9c0 = vshufps_avx(local_940,auVar122,0x29);
    auVar122 = vperm2f128_avx(local_840,local_840,1);
    auVar122 = vshufps_avx(auVar122,local_840,0x30);
    local_800 = vshufps_avx(local_840,auVar122,0x29);
    fVar308 = local_800._0_4_;
    fVar322 = local_800._4_4_;
    auVar41._4_4_ = fVar322 * fVar243;
    auVar41._0_4_ = fVar308 * fVar168;
    fVar325 = local_800._8_4_;
    auVar41._8_4_ = fVar325 * fVar268;
    fVar328 = local_800._12_4_;
    auVar41._12_4_ = fVar328 * fVar345;
    fVar331 = local_800._16_4_;
    auVar41._16_4_ = fVar331 * fVar361;
    fVar334 = local_800._20_4_;
    auVar41._20_4_ = fVar334 * fVar385;
    fVar337 = local_800._24_4_;
    auVar41._24_4_ = fVar337 * fVar18;
    auVar41._28_4_ = auVar122._28_4_;
    fVar209 = local_9c0._0_4_;
    fVar247 = local_9c0._4_4_;
    auVar42._4_4_ = fVar244 * fVar247;
    auVar42._0_4_ = fVar171 * fVar209;
    fVar280 = local_9c0._8_4_;
    auVar42._8_4_ = fVar277 * fVar280;
    fVar348 = local_9c0._12_4_;
    auVar42._12_4_ = fVar346 * fVar348;
    fVar374 = local_9c0._16_4_;
    auVar42._16_4_ = fVar362 * fVar374;
    fVar392 = local_9c0._20_4_;
    auVar42._20_4_ = fVar390 * fVar392;
    fVar21 = local_9c0._24_4_;
    auVar42._24_4_ = fVar19 * fVar21;
    auVar42._28_4_ = -auVar219._28_4_;
    auVar35 = vsubps_avx(auVar42,auVar41);
    auVar122 = vperm2f128_avx(_local_920,_local_920,1);
    auVar122 = vshufps_avx(auVar122,_local_920,0x30);
    local_9e0 = vshufps_avx(_local_920,auVar122,0x29);
    fVar224 = local_9e0._0_4_;
    fVar264 = local_9e0._4_4_;
    auVar43._4_4_ = fVar244 * fVar264;
    auVar43._0_4_ = fVar171 * fVar224;
    fVar282 = local_9e0._8_4_;
    auVar43._8_4_ = fVar277 * fVar282;
    fVar349 = local_9e0._12_4_;
    auVar43._12_4_ = fVar346 * fVar349;
    fVar376 = local_9e0._16_4_;
    auVar43._16_4_ = fVar362 * fVar376;
    fVar393 = local_9e0._20_4_;
    auVar43._20_4_ = fVar390 * fVar393;
    fVar22 = local_9e0._24_4_;
    auVar43._24_4_ = fVar19 * fVar22;
    auVar43._28_4_ = auVar122._28_4_;
    auVar37 = local_800;
    auVar44._4_4_ = fVar322 * fVar245;
    auVar44._0_4_ = fVar308 * fVar175;
    auVar44._8_4_ = fVar325 * fVar278;
    auVar44._12_4_ = fVar328 * fVar347;
    auVar44._16_4_ = fVar331 * fVar371;
    auVar44._20_4_ = fVar334 * fVar391;
    auVar44._24_4_ = fVar337 * fVar20;
    auVar44._28_4_ = uStack_184;
    auVar122 = vsubps_avx(auVar44,auVar43);
    auVar36 = local_9c0;
    auVar45._4_4_ = fVar245 * fVar247;
    auVar45._0_4_ = fVar175 * fVar209;
    auVar45._8_4_ = fVar278 * fVar280;
    auVar45._12_4_ = fVar347 * fVar348;
    auVar45._16_4_ = fVar371 * fVar374;
    auVar45._20_4_ = fVar391 * fVar392;
    auVar45._24_4_ = fVar20 * fVar21;
    auVar45._28_4_ = uStack_184;
    auVar46._4_4_ = fVar243 * fVar264;
    auVar46._0_4_ = fVar168 * fVar224;
    auVar46._8_4_ = fVar268 * fVar282;
    auVar46._12_4_ = fVar345 * fVar349;
    auVar46._16_4_ = fVar361 * fVar376;
    auVar46._20_4_ = fVar385 * fVar393;
    auVar46._24_4_ = fVar18 * fVar22;
    auVar46._28_4_ = uStack_224;
    auVar295 = vsubps_avx(auVar46,auVar45);
    fVar137 = auVar295._28_4_;
    fVar384 = auVar122._28_4_ + fVar137;
    auVar47._4_4_ =
         (auVar32._4_4_ * auVar32._4_4_ +
         auVar33._4_4_ * auVar33._4_4_ + auVar34._4_4_ * auVar34._4_4_) * fVar352;
    auVar47._0_4_ =
         (auVar32._0_4_ * auVar32._0_4_ +
         auVar33._0_4_ * auVar33._0_4_ + auVar34._0_4_ * auVar34._0_4_) * fVar350;
    auVar47._8_4_ =
         (auVar32._8_4_ * auVar32._8_4_ +
         auVar33._8_4_ * auVar33._8_4_ + auVar34._8_4_ * auVar34._8_4_) * fVar357;
    auVar47._12_4_ =
         (auVar32._12_4_ * auVar32._12_4_ +
         auVar33._12_4_ * auVar33._12_4_ + auVar34._12_4_ * auVar34._12_4_) * fVar378;
    auVar47._16_4_ =
         (auVar32._16_4_ * auVar32._16_4_ +
         auVar33._16_4_ * auVar33._16_4_ + auVar34._16_4_ * auVar34._16_4_) * fVar380;
    auVar47._20_4_ =
         (auVar32._20_4_ * auVar32._20_4_ +
         auVar33._20_4_ * auVar33._20_4_ + auVar34._20_4_ * auVar34._20_4_) * fVar382;
    auVar47._24_4_ =
         (auVar32._24_4_ * auVar32._24_4_ +
         auVar33._24_4_ * auVar33._24_4_ + auVar34._24_4_ * auVar34._24_4_) * fVar394;
    auVar47._28_4_ = auVar32._28_4_ + fVar340;
    auVar48._4_4_ =
         (auVar35._4_4_ * auVar35._4_4_ +
         auVar122._4_4_ * auVar122._4_4_ + auVar295._4_4_ * auVar295._4_4_) * fVar352;
    auVar48._0_4_ =
         (auVar35._0_4_ * auVar35._0_4_ +
         auVar122._0_4_ * auVar122._0_4_ + auVar295._0_4_ * auVar295._0_4_) * fVar350;
    auVar48._8_4_ =
         (auVar35._8_4_ * auVar35._8_4_ +
         auVar122._8_4_ * auVar122._8_4_ + auVar295._8_4_ * auVar295._8_4_) * fVar357;
    auVar48._12_4_ =
         (auVar35._12_4_ * auVar35._12_4_ +
         auVar122._12_4_ * auVar122._12_4_ + auVar295._12_4_ * auVar295._12_4_) * fVar378;
    auVar48._16_4_ =
         (auVar35._16_4_ * auVar35._16_4_ +
         auVar122._16_4_ * auVar122._16_4_ + auVar295._16_4_ * auVar295._16_4_) * fVar380;
    auVar48._20_4_ =
         (auVar35._20_4_ * auVar35._20_4_ +
         auVar122._20_4_ * auVar122._20_4_ + auVar295._20_4_ * auVar295._20_4_) * fVar382;
    auVar48._24_4_ =
         (auVar35._24_4_ * auVar35._24_4_ +
         auVar122._24_4_ * auVar122._24_4_ + auVar295._24_4_ * auVar295._24_4_) * fVar394;
    auVar48._28_4_ = auVar223._28_4_ + auVar129._28_4_;
    auVar129 = vmaxps_avx(auVar47,auVar48);
    auVar122 = vperm2f128_avx(local_7a0,local_7a0,1);
    auVar122 = vshufps_avx(auVar122,local_7a0,0x30);
    _local_7e0 = vshufps_avx(local_7a0,auVar122,0x29);
    local_700._0_4_ = (float)local_7a0._0_4_ + fVar225;
    local_700._4_4_ = local_7a0._4_4_ + fVar226;
    local_700._8_4_ = local_7a0._8_4_ + fVar227;
    local_700._12_4_ = local_7a0._12_4_ + fVar265;
    local_700._16_4_ = local_7a0._16_4_ + fVar266;
    local_700._20_4_ = local_7a0._20_4_ + fVar246;
    local_700._24_4_ = local_7a0._24_4_ + fVar284;
    local_700._28_4_ = local_7a0._28_4_ + fVar286;
    auVar122 = vmaxps_avx(local_7a0,local_700);
    auVar32 = vmaxps_avx(local_7c0,_local_7e0);
    auVar122 = vmaxps_avx(auVar122,auVar32);
    auVar32 = vrsqrtps_avx(auVar220);
    fVar225 = auVar32._0_4_;
    fVar226 = auVar32._4_4_;
    fVar227 = auVar32._8_4_;
    fVar265 = auVar32._12_4_;
    fVar266 = auVar32._16_4_;
    fVar246 = auVar32._20_4_;
    fVar284 = auVar32._24_4_;
    auVar49._4_4_ = fVar226 * fVar226 * fVar226 * auVar220._4_4_ * 0.5;
    auVar49._0_4_ = fVar225 * fVar225 * fVar225 * auVar220._0_4_ * 0.5;
    auVar49._8_4_ = fVar227 * fVar227 * fVar227 * auVar220._8_4_ * 0.5;
    auVar49._12_4_ = fVar265 * fVar265 * fVar265 * auVar220._12_4_ * 0.5;
    auVar49._16_4_ = fVar266 * fVar266 * fVar266 * auVar220._16_4_ * 0.5;
    auVar49._20_4_ = fVar246 * fVar246 * fVar246 * auVar220._20_4_ * 0.5;
    auVar49._24_4_ = fVar284 * fVar284 * fVar284 * auVar220._24_4_ * 0.5;
    auVar49._28_4_ = auVar220._28_4_;
    auVar50._4_4_ = fVar226 * 1.5;
    auVar50._0_4_ = fVar225 * 1.5;
    auVar50._8_4_ = fVar227 * 1.5;
    auVar50._12_4_ = fVar265 * 1.5;
    auVar50._16_4_ = fVar266 * 1.5;
    auVar50._20_4_ = fVar246 * 1.5;
    auVar50._24_4_ = fVar284 * 1.5;
    auVar50._28_4_ = auVar32._28_4_;
    local_5a0 = vsubps_avx(auVar50,auVar49);
    auVar90._4_4_ = fStack_adc;
    auVar90._0_4_ = local_ae0;
    auVar90._8_4_ = fStack_ad8;
    auVar90._12_4_ = fStack_ad4;
    auVar90._16_4_ = fStack_ad0;
    auVar90._20_4_ = fStack_acc;
    auVar90._24_4_ = fStack_ac8;
    auVar90._28_4_ = fStack_ac4;
    local_820 = vsubps_avx(ZEXT832(0) << 0x20,auVar90);
    auVar92._4_4_ = fStack_abc;
    auVar92._0_4_ = local_ac0;
    auVar92._8_4_ = fStack_ab8;
    auVar92._12_4_ = fStack_ab4;
    auVar92._16_4_ = fStack_ab0;
    auVar92._20_4_ = fStack_aac;
    auVar92._24_4_ = fStack_aa8;
    auVar92._28_4_ = fStack_aa4;
    local_960 = vsubps_avx(ZEXT832(0) << 0x20,auVar92);
    fVar225 = local_960._0_4_;
    fVar265 = local_960._4_4_;
    fVar284 = local_960._8_4_;
    fVar350 = local_960._12_4_;
    fVar378 = local_960._16_4_;
    fVar394 = local_960._20_4_;
    fVar23 = local_960._24_4_;
    fVar226 = local_820._0_4_;
    fVar266 = local_820._4_4_;
    fVar286 = local_820._8_4_;
    fVar352 = local_820._12_4_;
    fVar380 = local_820._16_4_;
    fVar395 = local_820._20_4_;
    fVar24 = local_820._24_4_;
    auVar94._4_4_ = fStack_a7c;
    auVar94._0_4_ = local_a80;
    auVar94._8_4_ = fStack_a78;
    auVar94._12_4_ = fStack_a74;
    auVar94._16_4_ = fStack_a70;
    auVar94._20_4_ = fStack_a6c;
    auVar94._24_4_ = fStack_a68;
    auVar94._28_4_ = fStack_a64;
    auVar32 = vsubps_avx(ZEXT832(0) << 0x20,auVar94);
    fVar309 = auVar32._0_4_;
    fVar323 = auVar32._4_4_;
    fVar326 = auVar32._8_4_;
    fVar329 = auVar32._12_4_;
    fVar332 = auVar32._16_4_;
    fVar335 = auVar32._20_4_;
    fVar338 = auVar32._24_4_;
    auVar354._0_4_ = fVar309 * local_4e0 + local_500 * fVar226 + local_520 * fVar225;
    auVar354._4_4_ = fVar323 * fStack_4dc + fStack_4fc * fVar266 + fStack_51c * fVar265;
    auVar354._8_4_ = fVar326 * fStack_4d8 + fStack_4f8 * fVar286 + fStack_518 * fVar284;
    auVar354._12_4_ = fVar329 * fStack_4d4 + fStack_4f4 * fVar352 + fStack_514 * fVar350;
    auVar354._16_4_ = fVar332 * fStack_4d0 + fStack_4f0 * fVar380 + fStack_510 * fVar378;
    auVar354._20_4_ = fVar335 * fStack_4cc + fStack_4ec * fVar395 + fStack_50c * fVar394;
    auVar354._24_4_ = fVar338 * fStack_4c8 + fStack_4e8 * fVar24 + fStack_508 * fVar23;
    auVar354._28_4_ = fVar384 + fVar384 + auVar35._28_4_ + fVar384;
    auVar356 = ZEXT3264(auVar354);
    auVar367._0_4_ = fVar309 * fVar309 + fVar226 * fVar226 + fVar225 * fVar225;
    auVar367._4_4_ = fVar323 * fVar323 + fVar266 * fVar266 + fVar265 * fVar265;
    auVar367._8_4_ = fVar326 * fVar326 + fVar286 * fVar286 + fVar284 * fVar284;
    auVar367._12_4_ = fVar329 * fVar329 + fVar352 * fVar352 + fVar350 * fVar350;
    auVar367._16_4_ = fVar332 * fVar332 + fVar380 * fVar380 + fVar378 * fVar378;
    auVar367._20_4_ = fVar335 * fVar335 + fVar395 * fVar395 + fVar394 * fVar394;
    auVar367._24_4_ = fVar338 * fVar338 + fVar24 * fVar24 + fVar23 * fVar23;
    auVar367._28_4_ = fVar137 + fVar137 + fVar384;
    fVar227 = local_5a0._0_4_;
    fVar246 = local_5a0._4_4_;
    fVar340 = local_5a0._8_4_;
    fVar357 = local_5a0._12_4_;
    fVar382 = local_5a0._16_4_;
    fVar384 = local_5a0._20_4_;
    fVar267 = local_5a0._24_4_;
    local_6e0._0_4_ =
         local_4e0 * fVar175 * fVar227 +
         fVar168 * fVar227 * local_500 + fVar171 * fVar227 * local_520;
    local_6e0._4_4_ =
         fStack_4dc * fVar245 * fVar246 +
         fVar243 * fVar246 * fStack_4fc + fVar244 * fVar246 * fStack_51c;
    fStack_6d8 = fStack_4d8 * fVar278 * fVar340 +
                 fVar268 * fVar340 * fStack_4f8 + fVar277 * fVar340 * fStack_518;
    fStack_6d4 = fStack_4d4 * fVar347 * fVar357 +
                 fVar345 * fVar357 * fStack_4f4 + fVar346 * fVar357 * fStack_514;
    fStack_6d0 = fStack_4d0 * fVar371 * fVar382 +
                 fVar361 * fVar382 * fStack_4f0 + fVar362 * fVar382 * fStack_510;
    fStack_6cc = fStack_4cc * fVar391 * fVar384 +
                 fVar385 * fVar384 * fStack_4ec + fVar390 * fVar384 * fStack_50c;
    fStack_6c8 = fStack_4c8 * fVar20 * fVar267 +
                 fVar18 * fVar267 * fStack_4e8 + fVar19 * fVar267 * fStack_508;
    fVar137 = fStack_4c4 + fStack_4e4 + fStack_504;
    local_a20._0_4_ =
         fVar309 * fVar175 * fVar227 + fVar168 * fVar227 * fVar226 + fVar171 * fVar227 * fVar225;
    local_a20._4_4_ =
         fVar323 * fVar245 * fVar246 + fVar243 * fVar246 * fVar266 + fVar244 * fVar246 * fVar265;
    local_a20._8_4_ =
         fVar326 * fVar278 * fVar340 + fVar268 * fVar340 * fVar286 + fVar277 * fVar340 * fVar284;
    local_a20._12_4_ =
         fVar329 * fVar347 * fVar357 + fVar345 * fVar357 * fVar352 + fVar346 * fVar357 * fVar350;
    local_a20._16_4_ =
         fVar332 * fVar371 * fVar382 + fVar361 * fVar382 * fVar380 + fVar362 * fVar382 * fVar378;
    local_a20._20_4_ =
         fVar335 * fVar391 * fVar384 + fVar385 * fVar384 * fVar395 + fVar390 * fVar384 * fVar394;
    local_a20._24_4_ =
         fVar338 * fVar20 * fVar267 + fVar18 * fVar267 * fVar24 + fVar19 * fVar267 * fVar23;
    local_a20._28_4_ = fStack_4e4 + fVar137;
    auVar51._4_4_ = (float)local_6e0._4_4_ * local_a20._4_4_;
    auVar51._0_4_ = (float)local_6e0._0_4_ * (float)local_a20._0_4_;
    auVar51._8_4_ = fStack_6d8 * local_a20._8_4_;
    auVar51._12_4_ = fStack_6d4 * local_a20._12_4_;
    auVar51._16_4_ = fStack_6d0 * local_a20._16_4_;
    auVar51._20_4_ = fStack_6cc * local_a20._20_4_;
    auVar51._24_4_ = fStack_6c8 * local_a20._24_4_;
    auVar51._28_4_ = fVar137;
    auVar33 = vsubps_avx(auVar354,auVar51);
    auVar52._4_4_ = local_a20._4_4_ * local_a20._4_4_;
    auVar52._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    auVar52._8_4_ = local_a20._8_4_ * local_a20._8_4_;
    auVar52._12_4_ = local_a20._12_4_ * local_a20._12_4_;
    auVar52._16_4_ = local_a20._16_4_ * local_a20._16_4_;
    auVar52._20_4_ = local_a20._20_4_ * local_a20._20_4_;
    auVar52._24_4_ = local_a20._24_4_ * local_a20._24_4_;
    auVar52._28_4_ = fStack_4e4;
    local_620 = vsubps_avx(auVar367,auVar52);
    _local_660 = vsqrtps_avx(auVar129);
    fVar137 = (local_660._0_4_ + auVar122._0_4_) * 1.0000002;
    fVar169 = (local_660._4_4_ + auVar122._4_4_) * 1.0000002;
    fVar172 = (local_660._8_4_ + auVar122._8_4_) * 1.0000002;
    fVar176 = (local_660._12_4_ + auVar122._12_4_) * 1.0000002;
    fVar177 = (local_660._16_4_ + auVar122._16_4_) * 1.0000002;
    fVar178 = (local_660._20_4_ + auVar122._20_4_) * 1.0000002;
    fVar179 = (local_660._24_4_ + auVar122._24_4_) * 1.0000002;
    auVar53._4_4_ = fVar169 * fVar169;
    auVar53._0_4_ = fVar137 * fVar137;
    auVar53._8_4_ = fVar172 * fVar172;
    auVar53._12_4_ = fVar176 * fVar176;
    auVar53._16_4_ = fVar177 * fVar177;
    auVar53._20_4_ = fVar178 * fVar178;
    auVar53._24_4_ = fVar179 * fVar179;
    auVar53._28_4_ = local_660._28_4_ + auVar122._28_4_;
    fVar364 = auVar33._0_4_ + auVar33._0_4_;
    fVar373 = auVar33._4_4_ + auVar33._4_4_;
    local_580 = CONCAT44(fVar373,fVar364);
    fStack_578 = auVar33._8_4_ + auVar33._8_4_;
    fStack_574 = auVar33._12_4_ + auVar33._12_4_;
    fStack_570 = auVar33._16_4_ + auVar33._16_4_;
    fStack_56c = auVar33._20_4_ + auVar33._20_4_;
    fStack_568 = auVar33._24_4_ + auVar33._24_4_;
    fStack_564 = auVar33._28_4_ + auVar33._28_4_;
    auVar122 = vsubps_avx(local_620,auVar53);
    local_5c0._4_4_ = (float)local_6e0._4_4_ * (float)local_6e0._4_4_;
    local_5c0._0_4_ = (float)local_6e0._0_4_ * (float)local_6e0._0_4_;
    local_5c0._8_4_ = fStack_6d8 * fStack_6d8;
    local_5c0._12_4_ = fStack_6d4 * fStack_6d4;
    local_5c0._16_4_ = fStack_6d0 * fStack_6d0;
    local_5c0._20_4_ = fStack_6cc * fStack_6cc;
    local_5c0._24_4_ = fStack_6c8 * fStack_6c8;
    local_5c0._28_4_ = local_560._28_4_;
    auVar360 = ZEXT3264(local_5c0);
    local_6c0 = vsubps_avx(local_220,local_5c0);
    local_720._4_4_ = fVar373 * fVar373;
    local_720._0_4_ = fVar364 * fVar364;
    fStack_718 = fStack_578 * fStack_578;
    fStack_714 = fStack_574 * fStack_574;
    fStack_710 = fStack_570 * fStack_570;
    fStack_70c = fStack_56c * fStack_56c;
    fStack_708 = fStack_568 * fStack_568;
    fStack_704 = 1.0000002;
    fVar169 = local_6c0._0_4_;
    local_640._0_4_ = fVar169 * 4.0;
    fVar172 = local_6c0._4_4_;
    local_640._4_4_ = fVar172 * 4.0;
    fVar176 = local_6c0._8_4_;
    fStack_638 = fVar176 * 4.0;
    fVar177 = local_6c0._12_4_;
    fStack_634 = fVar177 * 4.0;
    fVar178 = local_6c0._16_4_;
    fStack_630 = fVar178 * 4.0;
    fVar179 = local_6c0._20_4_;
    fStack_62c = fVar179 * 4.0;
    fVar351 = local_6c0._24_4_;
    fStack_628 = fVar351 * 4.0;
    uStack_624 = 0x40800000;
    auVar54._4_4_ = auVar122._4_4_ * (float)local_640._4_4_;
    auVar54._0_4_ = auVar122._0_4_ * (float)local_640._0_4_;
    auVar54._8_4_ = auVar122._8_4_ * fStack_638;
    auVar54._12_4_ = auVar122._12_4_ * fStack_634;
    auVar54._16_4_ = auVar122._16_4_ * fStack_630;
    auVar54._20_4_ = auVar122._20_4_ * fStack_62c;
    auVar54._24_4_ = auVar122._24_4_ * fStack_628;
    auVar54._28_4_ = 0x40800000;
    auVar33 = vsubps_avx(_local_720,auVar54);
    auVar129 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,5);
    fVar137 = local_6c0._28_4_;
    if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar129 >> 0x7f,0) == '\0') &&
          (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar129 >> 0xbf,0) == '\0') &&
        (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar129[0x1f])
    {
      auVar195._8_4_ = 0x7f800000;
      auVar195._0_8_ = 0x7f8000007f800000;
      auVar195._12_4_ = 0x7f800000;
      auVar195._16_4_ = 0x7f800000;
      auVar195._20_4_ = 0x7f800000;
      auVar195._24_4_ = 0x7f800000;
      auVar195._28_4_ = 0x7f800000;
      auVar368._8_4_ = 0xff800000;
      auVar368._0_8_ = 0xff800000ff800000;
      auVar368._12_4_ = 0xff800000;
      auVar368._16_4_ = 0xff800000;
      auVar368._20_4_ = 0xff800000;
      auVar368._24_4_ = 0xff800000;
      auVar368._28_4_ = 0xff800000;
    }
    else {
      auVar35 = vsqrtps_avx(auVar33);
      auVar273._0_4_ = fVar169 + fVar169;
      auVar273._4_4_ = fVar172 + fVar172;
      auVar273._8_4_ = fVar176 + fVar176;
      auVar273._12_4_ = fVar177 + fVar177;
      auVar273._16_4_ = fVar178 + fVar178;
      auVar273._20_4_ = fVar179 + fVar179;
      auVar273._24_4_ = fVar351 + fVar351;
      auVar273._28_4_ = fVar137 + fVar137;
      auVar223 = vrcpps_avx(auVar273);
      auVar34 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,5);
      fVar180 = auVar223._0_4_;
      fVar203 = auVar223._4_4_;
      auVar55._4_4_ = auVar273._4_4_ * fVar203;
      auVar55._0_4_ = auVar273._0_4_ * fVar180;
      fVar204 = auVar223._8_4_;
      auVar55._8_4_ = auVar273._8_4_ * fVar204;
      fVar205 = auVar223._12_4_;
      auVar55._12_4_ = auVar273._12_4_ * fVar205;
      fVar206 = auVar223._16_4_;
      auVar55._16_4_ = auVar273._16_4_ * fVar206;
      fVar207 = auVar223._20_4_;
      auVar55._20_4_ = auVar273._20_4_ * fVar207;
      fVar208 = auVar223._24_4_;
      auVar55._24_4_ = auVar273._24_4_ * fVar208;
      auVar55._28_4_ = auVar33._28_4_;
      auVar274._8_4_ = 0x3f800000;
      auVar274._0_8_ = &DAT_3f8000003f800000;
      auVar274._12_4_ = 0x3f800000;
      auVar274._16_4_ = 0x3f800000;
      auVar274._20_4_ = 0x3f800000;
      auVar274._24_4_ = 0x3f800000;
      auVar274._28_4_ = 0x3f800000;
      auVar33 = vsubps_avx(auVar274,auVar55);
      fVar180 = fVar180 + fVar180 * auVar33._0_4_;
      fVar203 = fVar203 + fVar203 * auVar33._4_4_;
      fVar204 = fVar204 + fVar204 * auVar33._8_4_;
      fVar205 = fVar205 + fVar205 * auVar33._12_4_;
      fVar206 = fVar206 + fVar206 * auVar33._16_4_;
      fVar207 = fVar207 + fVar207 * auVar33._20_4_;
      fVar208 = fVar208 + fVar208 * auVar33._24_4_;
      auVar275._0_8_ = CONCAT44(fVar373,fVar364) ^ 0x8000000080000000;
      auVar275._8_4_ = -fStack_578;
      auVar275._12_4_ = -fStack_574;
      auVar275._16_4_ = -fStack_570;
      auVar275._20_4_ = -fStack_56c;
      auVar275._24_4_ = -fStack_568;
      auVar275._28_4_ = -fStack_564;
      auVar295 = vsubps_avx(auVar275,auVar35);
      fVar364 = auVar295._0_4_ * fVar180;
      fVar373 = auVar295._4_4_ * fVar203;
      auVar56._4_4_ = fVar373;
      auVar56._0_4_ = fVar364;
      fVar279 = auVar295._8_4_ * fVar204;
      auVar56._8_4_ = fVar279;
      fVar281 = auVar295._12_4_ * fVar205;
      auVar56._12_4_ = fVar281;
      fVar283 = auVar295._16_4_ * fVar206;
      auVar56._16_4_ = fVar283;
      fVar285 = auVar295._20_4_ * fVar207;
      auVar56._20_4_ = fVar285;
      fVar287 = auVar295._24_4_ * fVar208;
      auVar56._24_4_ = fVar287;
      auVar56._28_4_ = auVar295._28_4_;
      auVar35 = vsubps_avx(auVar35,_local_580);
      fVar180 = auVar35._0_4_ * fVar180;
      fVar203 = auVar35._4_4_ * fVar203;
      auVar57._4_4_ = fVar203;
      auVar57._0_4_ = fVar180;
      fVar204 = auVar35._8_4_ * fVar204;
      auVar57._8_4_ = fVar204;
      fVar205 = auVar35._12_4_ * fVar205;
      auVar57._12_4_ = fVar205;
      fVar206 = auVar35._16_4_ * fVar206;
      auVar57._16_4_ = fVar206;
      fVar207 = auVar35._20_4_ * fVar207;
      auVar57._20_4_ = fVar207;
      fVar208 = auVar35._24_4_ * fVar208;
      auVar57._24_4_ = fVar208;
      auVar57._28_4_ = auVar35._28_4_;
      fStack_484 = local_a20._28_4_ + auVar223._28_4_ + auVar33._28_4_;
      local_4a0[0] = fVar227 * ((float)local_a20._0_4_ + (float)local_6e0._0_4_ * fVar364);
      local_4a0[1] = fVar246 * (local_a20._4_4_ + (float)local_6e0._4_4_ * fVar373);
      local_4a0[2] = fVar340 * (local_a20._8_4_ + fStack_6d8 * fVar279);
      local_4a0[3] = fVar357 * (local_a20._12_4_ + fStack_6d4 * fVar281);
      fStack_490 = fVar382 * (local_a20._16_4_ + fStack_6d0 * fVar283);
      fStack_48c = fVar384 * (local_a20._20_4_ + fStack_6cc * fVar285);
      fStack_488 = fVar267 * (local_a20._24_4_ + fStack_6c8 * fVar287);
      local_4c0[0] = fVar227 * ((float)local_a20._0_4_ + (float)local_6e0._0_4_ * fVar180);
      local_4c0[1] = fVar246 * (local_a20._4_4_ + (float)local_6e0._4_4_ * fVar203);
      local_4c0[2] = fVar340 * (local_a20._8_4_ + fStack_6d8 * fVar204);
      local_4c0[3] = fVar357 * (local_a20._12_4_ + fStack_6d4 * fVar205);
      fStack_4b0 = fVar382 * (local_a20._16_4_ + fStack_6d0 * fVar206);
      fStack_4ac = fVar384 * (local_a20._20_4_ + fStack_6cc * fVar207);
      fStack_4a8 = fVar267 * (local_a20._24_4_ + fStack_6c8 * fVar208);
      fStack_4a4 = local_a20._28_4_ + fStack_484;
      auVar196._8_4_ = 0x7f800000;
      auVar196._0_8_ = 0x7f8000007f800000;
      auVar196._12_4_ = 0x7f800000;
      auVar196._16_4_ = 0x7f800000;
      auVar196._20_4_ = 0x7f800000;
      auVar196._24_4_ = 0x7f800000;
      auVar196._28_4_ = 0x7f800000;
      auVar195 = vblendvps_avx(auVar196,auVar56,auVar34);
      auVar294._8_4_ = 0x7fffffff;
      auVar294._0_8_ = 0x7fffffff7fffffff;
      auVar294._12_4_ = 0x7fffffff;
      auVar294._16_4_ = 0x7fffffff;
      auVar294._20_4_ = 0x7fffffff;
      auVar294._24_4_ = 0x7fffffff;
      auVar294._28_4_ = 0x7fffffff;
      auVar33 = vandps_avx(local_5c0,auVar294);
      auVar33 = vmaxps_avx(local_3e0,auVar33);
      auVar58._4_4_ = auVar33._4_4_ * 1.9073486e-06;
      auVar58._0_4_ = auVar33._0_4_ * 1.9073486e-06;
      auVar58._8_4_ = auVar33._8_4_ * 1.9073486e-06;
      auVar58._12_4_ = auVar33._12_4_ * 1.9073486e-06;
      auVar58._16_4_ = auVar33._16_4_ * 1.9073486e-06;
      auVar58._20_4_ = auVar33._20_4_ * 1.9073486e-06;
      auVar58._24_4_ = auVar33._24_4_ * 1.9073486e-06;
      auVar58._28_4_ = auVar33._28_4_;
      auVar33 = vandps_avx(local_6c0,auVar294);
      auVar33 = vcmpps_avx(auVar33,auVar58,1);
      auVar356 = ZEXT3264(auVar33);
      auVar276._8_4_ = 0xff800000;
      auVar276._0_8_ = 0xff800000ff800000;
      auVar276._12_4_ = 0xff800000;
      auVar276._16_4_ = 0xff800000;
      auVar276._20_4_ = 0xff800000;
      auVar276._24_4_ = 0xff800000;
      auVar276._28_4_ = 0xff800000;
      auVar368 = vblendvps_avx(auVar276,auVar57,auVar34);
      auVar223 = auVar34 & auVar33;
      if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar223 >> 0x7f,0) != '\0') ||
            (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar223 >> 0xbf,0) != '\0') ||
          (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar223[0x1f] < '\0') {
        auVar129 = vandps_avx(auVar33,auVar34);
        auVar145 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
        auVar223 = ZEXT832(0) << 0x20;
        auVar33 = vcmpps_avx(auVar122,auVar223,2);
        auVar399._8_4_ = 0xff800000;
        auVar399._0_8_ = 0xff800000ff800000;
        auVar399._12_4_ = 0xff800000;
        auVar399._16_4_ = 0xff800000;
        auVar399._20_4_ = 0xff800000;
        auVar399._24_4_ = 0xff800000;
        auVar399._28_4_ = 0xff800000;
        auVar318._8_4_ = 0x7f800000;
        auVar318._0_8_ = 0x7f8000007f800000;
        auVar318._12_4_ = 0x7f800000;
        auVar318._16_4_ = 0x7f800000;
        auVar318._20_4_ = 0x7f800000;
        auVar318._24_4_ = 0x7f800000;
        auVar318._28_4_ = 0x7f800000;
        auVar122 = vblendvps_avx(auVar318,auVar399,auVar33);
        auVar113 = vpmovsxwd_avx(auVar145);
        auVar356 = ZEXT1664(auVar113);
        auVar145 = vpunpckhwd_avx(auVar145,auVar145);
        auVar262._16_16_ = auVar145;
        auVar262._0_16_ = auVar113;
        auVar195 = vblendvps_avx(auVar195,auVar122,auVar262);
        auVar122 = vblendvps_avx(auVar399,auVar318,auVar33);
        auVar368 = vblendvps_avx(auVar368,auVar122,auVar262);
        auVar122 = vcmpps_avx(auVar223,auVar223,0xf);
        auVar165._0_4_ = auVar129._0_4_ ^ auVar122._0_4_;
        auVar165._4_4_ = auVar129._4_4_ ^ auVar122._4_4_;
        auVar165._8_4_ = auVar129._8_4_ ^ auVar122._8_4_;
        auVar165._12_4_ = auVar129._12_4_ ^ auVar122._12_4_;
        auVar165._16_4_ = auVar129._16_4_ ^ auVar122._16_4_;
        auVar165._20_4_ = auVar129._20_4_ ^ auVar122._20_4_;
        auVar165._24_4_ = auVar129._24_4_ ^ auVar122._24_4_;
        auVar165._28_4_ = auVar129._28_4_ ^ auVar122._28_4_;
        auVar129 = vorps_avx(auVar33,auVar165);
        auVar129 = vandps_avx(auVar34,auVar129);
      }
    }
    auVar370 = ZEXT3264(auVar368);
    auVar389 = ZEXT3264(local_a20);
    auVar320 = ZEXT3264(local_260);
    auVar122 = local_260 & auVar129;
    auVar252._8_4_ = 0x3f800000;
    auVar252._0_8_ = &DAT_3f8000003f800000;
    auVar252._12_4_ = 0x3f800000;
    auVar252._16_4_ = 0x3f800000;
    auVar252._20_4_ = 0x3f800000;
    auVar252._24_4_ = 0x3f800000;
    auVar252._28_4_ = 0x3f800000;
    auVar263 = ZEXT3264(auVar252);
    fVar364 = (float)local_740._0_4_;
    fVar373 = (float)local_740._4_4_;
    fVar180 = fStack_738;
    fVar203 = fStack_734;
    fVar204 = fStack_730;
    fVar205 = fStack_72c;
    fVar206 = fStack_728;
    fVar207 = fStack_724;
    if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0x7f,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar122 >> 0xbf,0) == '\0') &&
        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar122[0x1f])
    {
      auVar299 = ZEXT864(0) << 0x40;
    }
    else {
      fStack_6c4 = fStack_4c4 + fStack_4e4 + fStack_504;
      auVar145 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_760._0_4_));
      auVar145 = vshufps_avx(auVar145,auVar145,0);
      auVar253._16_16_ = auVar145;
      auVar253._0_16_ = auVar145;
      local_6a0 = vmaxps_avx(auVar253,auVar195);
      auVar145 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_760._0_4_));
      auVar145 = vshufps_avx(auVar145,auVar145,0);
      auVar254._16_16_ = auVar145;
      auVar254._0_16_ = auVar145;
      auVar34 = vminps_avx(auVar254,auVar368);
      auVar124._0_4_ = local_4e0 * fVar288 + local_500 * fVar307 + local_520 * fVar363;
      auVar124._4_4_ = fStack_4dc * fVar300 + fStack_4fc * fVar321 + fStack_51c * fVar372;
      auVar124._8_4_ = fStack_4d8 * fVar301 + fStack_4f8 * fVar324 + fStack_518 * fVar375;
      auVar124._12_4_ = fStack_4d4 * fVar302 + fStack_4f4 * fVar327 + fStack_514 * fVar377;
      auVar124._16_4_ = fStack_4d0 * fVar303 + fStack_4f0 * fVar330 + fStack_510 * fVar379;
      auVar124._20_4_ = fStack_4cc * fVar304 + fStack_4ec * fVar333 + fStack_50c * fVar381;
      auVar124._24_4_ = fStack_4c8 * fVar305 + fStack_4e8 * fVar336 + fStack_508 * fVar383;
      auVar124._28_4_ = fVar306 + fVar339 + auVar32._28_4_;
      auVar122 = vrcpps_avx(auVar124);
      fVar306 = auVar122._0_4_;
      fVar208 = auVar122._4_4_;
      auVar59._4_4_ = auVar124._4_4_ * fVar208;
      auVar59._0_4_ = auVar124._0_4_ * fVar306;
      fVar279 = auVar122._8_4_;
      auVar59._8_4_ = auVar124._8_4_ * fVar279;
      fVar281 = auVar122._12_4_;
      auVar59._12_4_ = auVar124._12_4_ * fVar281;
      fVar283 = auVar122._16_4_;
      auVar59._16_4_ = auVar124._16_4_ * fVar283;
      fVar285 = auVar122._20_4_;
      auVar59._20_4_ = auVar124._20_4_ * fVar285;
      fVar287 = auVar122._24_4_;
      auVar59._24_4_ = auVar124._24_4_ * fVar287;
      auVar59._28_4_ = fVar339;
      auVar33 = vsubps_avx(auVar252,auVar59);
      auVar344._8_4_ = 0x7fffffff;
      auVar344._0_8_ = 0x7fffffff7fffffff;
      auVar344._12_4_ = 0x7fffffff;
      auVar344._16_4_ = 0x7fffffff;
      auVar344._20_4_ = 0x7fffffff;
      auVar344._24_4_ = 0x7fffffff;
      auVar344._28_4_ = 0x7fffffff;
      auVar122 = vandps_avx(auVar344,auVar124);
      auVar397._8_4_ = 0x219392ef;
      auVar397._0_8_ = 0x219392ef219392ef;
      auVar397._12_4_ = 0x219392ef;
      auVar397._16_4_ = 0x219392ef;
      auVar397._20_4_ = 0x219392ef;
      auVar397._24_4_ = 0x219392ef;
      auVar397._28_4_ = 0x219392ef;
      auVar122 = vcmpps_avx(auVar122,auVar397,1);
      auVar356 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar60._4_4_ =
           (fVar208 + fVar208 * auVar33._4_4_) *
           -(fVar300 * fVar323 + fVar321 * fVar266 + fVar372 * fVar265);
      auVar60._0_4_ =
           (fVar306 + fVar306 * auVar33._0_4_) *
           -(fVar288 * fVar309 + fVar307 * fVar226 + fVar363 * fVar225);
      auVar60._8_4_ =
           (fVar279 + fVar279 * auVar33._8_4_) *
           -(fVar301 * fVar326 + fVar324 * fVar286 + fVar375 * fVar284);
      auVar60._12_4_ =
           (fVar281 + fVar281 * auVar33._12_4_) *
           -(fVar302 * fVar329 + fVar327 * fVar352 + fVar377 * fVar350);
      auVar60._16_4_ =
           (fVar283 + fVar283 * auVar33._16_4_) *
           -(fVar303 * fVar332 + fVar330 * fVar380 + fVar379 * fVar378);
      auVar60._20_4_ =
           (fVar285 + fVar285 * auVar33._20_4_) *
           -(fVar304 * fVar335 + fVar333 * fVar395 + fVar381 * fVar394);
      auVar60._24_4_ =
           (fVar287 + fVar287 * auVar33._24_4_) *
           -(fVar305 * fVar338 + fVar336 * fVar24 + fVar383 * fVar23);
      auVar60._28_4_ = -(auVar32._28_4_ + local_6a0._28_4_ + 0.0);
      auVar82 = ZEXT812(0);
      auVar32 = vcmpps_avx(auVar124,ZEXT1232(auVar82) << 0x20,1);
      auVar33 = vorps_avx(auVar122,auVar32);
      auVar32 = vcmpps_avx(auVar124,ZEXT1232(auVar82) << 0x20,6);
      auVar32 = vorps_avx(auVar122,auVar32);
      auVar398._8_4_ = 0xff800000;
      auVar398._0_8_ = 0xff800000ff800000;
      auVar398._12_4_ = 0xff800000;
      auVar398._16_4_ = 0xff800000;
      auVar398._20_4_ = 0xff800000;
      auVar398._24_4_ = 0xff800000;
      auVar398._28_4_ = 0xff800000;
      auVar122 = vblendvps_avx(auVar60,auVar398,auVar33);
      auVar369._8_4_ = 0x7f800000;
      auVar369._0_8_ = 0x7f8000007f800000;
      auVar369._12_4_ = 0x7f800000;
      auVar369._16_4_ = 0x7f800000;
      auVar369._20_4_ = 0x7f800000;
      auVar369._24_4_ = 0x7f800000;
      auVar369._28_4_ = 0x7f800000;
      auVar370 = ZEXT3264(auVar369);
      auVar32 = vblendvps_avx(auVar60,auVar369,auVar32);
      auVar33 = vmaxps_avx(local_6a0,auVar122);
      _local_460 = vminps_avx(auVar34,auVar32);
      auVar295 = ZEXT1232(auVar82) << 0x20;
      auVar122 = vsubps_avx(auVar295,_local_a00);
      auVar32 = vsubps_avx(auVar295,_local_900);
      auVar61._4_4_ = auVar32._4_4_ * -fVar322;
      auVar61._0_4_ = auVar32._0_4_ * -fVar308;
      auVar61._8_4_ = auVar32._8_4_ * -fVar325;
      auVar61._12_4_ = auVar32._12_4_ * -fVar328;
      auVar61._16_4_ = auVar32._16_4_ * -fVar331;
      auVar61._20_4_ = auVar32._20_4_ * -fVar334;
      auVar61._24_4_ = auVar32._24_4_ * -fVar337;
      auVar61._28_4_ = auVar32._28_4_;
      auVar62._4_4_ = fVar247 * auVar122._4_4_;
      auVar62._0_4_ = fVar209 * auVar122._0_4_;
      auVar62._8_4_ = fVar280 * auVar122._8_4_;
      auVar62._12_4_ = fVar348 * auVar122._12_4_;
      auVar62._16_4_ = fVar374 * auVar122._16_4_;
      auVar62._20_4_ = fVar392 * auVar122._20_4_;
      auVar62._24_4_ = fVar21 * auVar122._24_4_;
      auVar62._28_4_ = auVar122._28_4_;
      auVar122 = vsubps_avx(auVar61,auVar62);
      auVar32 = vsubps_avx(auVar295,local_860);
      auVar63._4_4_ = fVar264 * auVar32._4_4_;
      auVar63._0_4_ = fVar224 * auVar32._0_4_;
      auVar63._8_4_ = fVar282 * auVar32._8_4_;
      auVar63._12_4_ = fVar349 * auVar32._12_4_;
      auVar63._16_4_ = fVar376 * auVar32._16_4_;
      auVar63._20_4_ = fVar393 * auVar32._20_4_;
      uVar8 = auVar32._28_4_;
      auVar63._24_4_ = fVar22 * auVar32._24_4_;
      auVar63._28_4_ = uVar8;
      auVar34 = vsubps_avx(auVar122,auVar63);
      auVar64._4_4_ = fStack_51c * -fVar322;
      auVar64._0_4_ = local_520 * -fVar308;
      auVar64._8_4_ = fStack_518 * -fVar325;
      auVar64._12_4_ = fStack_514 * -fVar328;
      auVar64._16_4_ = fStack_510 * -fVar331;
      auVar64._20_4_ = fStack_50c * -fVar334;
      auVar64._24_4_ = fStack_508 * -fVar337;
      auVar64._28_4_ = local_800._28_4_ ^ 0x80000000;
      auVar65._4_4_ = fStack_4fc * fVar247;
      auVar65._0_4_ = local_500 * fVar209;
      auVar65._8_4_ = fStack_4f8 * fVar280;
      auVar65._12_4_ = fStack_4f4 * fVar348;
      auVar65._16_4_ = fStack_4f0 * fVar374;
      auVar65._20_4_ = fStack_4ec * fVar392;
      auVar65._24_4_ = fStack_4e8 * fVar21;
      auVar65._28_4_ = uVar8;
      auVar260._8_4_ = 0x3f800000;
      auVar260._0_8_ = &DAT_3f8000003f800000;
      auVar260._12_4_ = 0x3f800000;
      auVar260._16_4_ = 0x3f800000;
      auVar260._20_4_ = 0x3f800000;
      auVar260._24_4_ = 0x3f800000;
      auVar260._28_4_ = 0x3f800000;
      auVar389 = ZEXT3264(auVar260);
      auVar122 = vsubps_avx(auVar64,auVar65);
      auVar66._4_4_ = fStack_4dc * fVar264;
      auVar66._0_4_ = local_4e0 * fVar224;
      auVar66._8_4_ = fStack_4d8 * fVar282;
      auVar66._12_4_ = fStack_4d4 * fVar349;
      auVar66._16_4_ = fStack_4d0 * fVar376;
      auVar66._20_4_ = fStack_4cc * fVar393;
      auVar66._24_4_ = fStack_4c8 * fVar22;
      auVar66._28_4_ = uVar8;
      auVar223 = vsubps_avx(auVar122,auVar66);
      auVar122 = vrcpps_avx(auVar223);
      fVar209 = auVar122._0_4_;
      fVar224 = auVar122._4_4_;
      auVar67._4_4_ = auVar223._4_4_ * fVar224;
      auVar67._0_4_ = auVar223._0_4_ * fVar209;
      fVar225 = auVar122._8_4_;
      auVar67._8_4_ = auVar223._8_4_ * fVar225;
      fVar226 = auVar122._12_4_;
      auVar67._12_4_ = auVar223._12_4_ * fVar226;
      fVar247 = auVar122._16_4_;
      auVar67._16_4_ = auVar223._16_4_ * fVar247;
      fVar264 = auVar122._20_4_;
      auVar67._20_4_ = auVar223._20_4_ * fVar264;
      fVar265 = auVar122._24_4_;
      auVar67._24_4_ = auVar223._24_4_ * fVar265;
      auVar67._28_4_ = local_9c0._28_4_;
      auVar35 = vsubps_avx(auVar260,auVar67);
      auVar125._8_4_ = 0x7fffffff;
      auVar125._0_8_ = 0x7fffffff7fffffff;
      auVar125._12_4_ = 0x7fffffff;
      auVar125._16_4_ = 0x7fffffff;
      auVar125._20_4_ = 0x7fffffff;
      auVar125._24_4_ = 0x7fffffff;
      auVar125._28_4_ = 0x7fffffff;
      auVar122 = vandps_avx(auVar223,auVar125);
      auVar126._8_4_ = 0x219392ef;
      auVar126._0_8_ = 0x219392ef219392ef;
      auVar126._12_4_ = 0x219392ef;
      auVar126._16_4_ = 0x219392ef;
      auVar126._20_4_ = 0x219392ef;
      auVar126._24_4_ = 0x219392ef;
      auVar126._28_4_ = 0x219392ef;
      auVar32 = vcmpps_avx(auVar122,auVar126,1);
      auVar68._4_4_ = (fVar224 + fVar224 * auVar35._4_4_) * -auVar34._4_4_;
      auVar68._0_4_ = (fVar209 + fVar209 * auVar35._0_4_) * -auVar34._0_4_;
      auVar68._8_4_ = (fVar225 + fVar225 * auVar35._8_4_) * -auVar34._8_4_;
      auVar68._12_4_ = (fVar226 + fVar226 * auVar35._12_4_) * -auVar34._12_4_;
      auVar68._16_4_ = (fVar247 + fVar247 * auVar35._16_4_) * -auVar34._16_4_;
      auVar68._20_4_ = (fVar264 + fVar264 * auVar35._20_4_) * -auVar34._20_4_;
      auVar68._24_4_ = (fVar265 + fVar265 * auVar35._24_4_) * -auVar34._24_4_;
      auVar68._28_4_ = auVar34._28_4_ ^ 0x80000000;
      auVar122 = vcmpps_avx(auVar223,auVar295,1);
      auVar122 = vorps_avx(auVar32,auVar122);
      auVar122 = vblendvps_avx(auVar68,auVar398,auVar122);
      local_6a0 = vmaxps_avx(auVar33,auVar122);
      auVar122 = vcmpps_avx(auVar223,ZEXT1232(auVar82) << 0x20,6);
      auVar122 = vorps_avx(auVar32,auVar122);
      auVar122 = vblendvps_avx(auVar68,auVar369,auVar122);
      auVar129 = vandps_avx(local_260,auVar129);
      local_440 = vminps_avx(_local_460,auVar122);
      auVar122 = vcmpps_avx(local_6a0,local_440,2);
      auVar32 = auVar129 & auVar122;
      if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar32 >> 0x7f,0) == '\0') &&
            (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar32 >> 0xbf,0) == '\0') &&
          (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar32[0x1f])
      {
        auVar299 = ZEXT864(0) << 0x40;
      }
      else {
        auVar32 = vminps_avx(local_7a0,local_700);
        auVar33 = vminps_avx(local_7c0,_local_7e0);
        auVar32 = vminps_avx(auVar32,auVar33);
        auVar32 = vsubps_avx(auVar32,_local_660);
        auVar129 = vandps_avx(auVar122,auVar129);
        auVar98._4_4_ = local_4a0[1];
        auVar98._0_4_ = local_4a0[0];
        auVar98._8_4_ = local_4a0[2];
        auVar98._12_4_ = local_4a0[3];
        auVar98._16_4_ = fStack_490;
        auVar98._20_4_ = fStack_48c;
        auVar98._24_4_ = fStack_488;
        auVar98._28_4_ = fStack_484;
        auVar122 = vminps_avx(auVar98,auVar260);
        auVar122 = vmaxps_avx(auVar122,ZEXT832(0) << 0x20);
        local_4a0[0] = fVar107 + fVar136 * (auVar122._0_4_ + 0.0) * 0.125;
        local_4a0[1] = fVar133 + fVar167 * (auVar122._4_4_ + 1.0) * 0.125;
        local_4a0[2] = fVar134 + fVar170 * (auVar122._8_4_ + 2.0) * 0.125;
        local_4a0[3] = fVar135 + fVar174 * (auVar122._12_4_ + 3.0) * 0.125;
        fStack_490 = fVar107 + fVar136 * (auVar122._16_4_ + 4.0) * 0.125;
        fStack_48c = fVar133 + fVar167 * (auVar122._20_4_ + 5.0) * 0.125;
        fStack_488 = fVar134 + fVar170 * (auVar122._24_4_ + 6.0) * 0.125;
        fStack_484 = fVar135 + auVar122._28_4_ + 7.0;
        auVar97._4_4_ = local_4c0[1];
        auVar97._0_4_ = local_4c0[0];
        auVar97._8_4_ = local_4c0[2];
        auVar97._12_4_ = local_4c0[3];
        auVar97._16_4_ = fStack_4b0;
        auVar97._20_4_ = fStack_4ac;
        auVar97._24_4_ = fStack_4a8;
        auVar97._28_4_ = fStack_4a4;
        auVar122 = vminps_avx(auVar97,auVar260);
        auVar122 = vmaxps_avx(auVar122,ZEXT832(0) << 0x20);
        local_4c0[0] = fVar107 + fVar136 * (auVar122._0_4_ + 0.0) * 0.125;
        local_4c0[1] = fVar133 + fVar167 * (auVar122._4_4_ + 1.0) * 0.125;
        local_4c0[2] = fVar134 + fVar170 * (auVar122._8_4_ + 2.0) * 0.125;
        local_4c0[3] = fVar135 + fVar174 * (auVar122._12_4_ + 3.0) * 0.125;
        fStack_4b0 = fVar107 + fVar136 * (auVar122._16_4_ + 4.0) * 0.125;
        fStack_4ac = fVar133 + fVar167 * (auVar122._20_4_ + 5.0) * 0.125;
        fStack_4a8 = fVar134 + fVar170 * (auVar122._24_4_ + 6.0) * 0.125;
        fStack_4a4 = fVar135 + auVar122._28_4_ + 7.0;
        auVar69._4_4_ = auVar32._4_4_ * 0.99999976;
        auVar69._0_4_ = auVar32._0_4_ * 0.99999976;
        auVar69._8_4_ = auVar32._8_4_ * 0.99999976;
        auVar69._12_4_ = auVar32._12_4_ * 0.99999976;
        auVar69._16_4_ = auVar32._16_4_ * 0.99999976;
        auVar69._20_4_ = auVar32._20_4_ * 0.99999976;
        auVar69._24_4_ = auVar32._24_4_ * 0.99999976;
        auVar69._28_4_ = 0x3f7ffffc;
        auVar122 = vmaxps_avx(ZEXT1232(auVar82) << 0x20,auVar69);
        auVar70._4_4_ = auVar122._4_4_ * auVar122._4_4_;
        auVar70._0_4_ = auVar122._0_4_ * auVar122._0_4_;
        auVar70._8_4_ = auVar122._8_4_ * auVar122._8_4_;
        auVar70._12_4_ = auVar122._12_4_ * auVar122._12_4_;
        auVar70._16_4_ = auVar122._16_4_ * auVar122._16_4_;
        auVar70._20_4_ = auVar122._20_4_ * auVar122._20_4_;
        auVar70._24_4_ = auVar122._24_4_ * auVar122._24_4_;
        auVar70._28_4_ = auVar122._28_4_;
        auVar32 = vsubps_avx(local_620,auVar70);
        auVar71._4_4_ = auVar32._4_4_ * (float)local_640._4_4_;
        auVar71._0_4_ = auVar32._0_4_ * (float)local_640._0_4_;
        auVar71._8_4_ = auVar32._8_4_ * fStack_638;
        auVar71._12_4_ = auVar32._12_4_ * fStack_634;
        auVar71._16_4_ = auVar32._16_4_ * fStack_630;
        auVar71._20_4_ = auVar32._20_4_ * fStack_62c;
        auVar71._24_4_ = auVar32._24_4_ * fStack_628;
        auVar71._28_4_ = auVar122._28_4_;
        auVar33 = vsubps_avx(_local_720,auVar71);
        auVar122 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,5);
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) {
          _local_640 = ZEXT832(0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar218 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar238 = ZEXT828(0) << 0x20;
          auVar343 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar197._8_4_ = 0x7f800000;
          auVar197._0_8_ = 0x7f8000007f800000;
          auVar197._12_4_ = 0x7f800000;
          auVar197._16_4_ = 0x7f800000;
          auVar197._20_4_ = 0x7f800000;
          auVar197._24_4_ = 0x7f800000;
          auVar197._28_4_ = 0x7f800000;
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
        }
        else {
          local_860 = auVar32;
          local_840 = auVar122;
          _local_a00 = auVar129;
          auVar223 = vsqrtps_avx(auVar33);
          auVar239._0_4_ = fVar169 + fVar169;
          auVar239._4_4_ = fVar172 + fVar172;
          auVar239._8_4_ = fVar176 + fVar176;
          auVar239._12_4_ = fVar177 + fVar177;
          auVar239._16_4_ = fVar178 + fVar178;
          auVar239._20_4_ = fVar179 + fVar179;
          auVar239._24_4_ = fVar351 + fVar351;
          auVar239._28_4_ = fVar137 + fVar137;
          auVar34 = vrcpps_avx(auVar239);
          fVar137 = auVar34._0_4_;
          fVar209 = auVar34._4_4_;
          auVar72._4_4_ = auVar239._4_4_ * fVar209;
          auVar72._0_4_ = auVar239._0_4_ * fVar137;
          fVar224 = auVar34._8_4_;
          auVar72._8_4_ = auVar239._8_4_ * fVar224;
          fVar225 = auVar34._12_4_;
          auVar72._12_4_ = auVar239._12_4_ * fVar225;
          fVar226 = auVar34._16_4_;
          auVar72._16_4_ = auVar239._16_4_ * fVar226;
          fVar247 = auVar34._20_4_;
          auVar72._20_4_ = auVar239._20_4_ * fVar247;
          fVar264 = auVar34._24_4_;
          auVar72._24_4_ = auVar239._24_4_ * fVar264;
          auVar72._28_4_ = auVar239._28_4_;
          auVar35 = vsubps_avx(auVar260,auVar72);
          fVar137 = fVar137 + fVar137 * auVar35._0_4_;
          fVar209 = fVar209 + fVar209 * auVar35._4_4_;
          fVar224 = fVar224 + fVar224 * auVar35._8_4_;
          fVar225 = fVar225 + fVar225 * auVar35._12_4_;
          fVar226 = fVar226 + fVar226 * auVar35._16_4_;
          fVar247 = fVar247 + fVar247 * auVar35._20_4_;
          fVar264 = fVar264 + fVar264 * auVar35._24_4_;
          fVar265 = auVar34._28_4_ + auVar35._28_4_;
          auVar256._0_8_ = local_580 ^ 0x8000000080000000;
          auVar256._8_4_ = -fStack_578;
          auVar256._12_4_ = -fStack_574;
          auVar256._16_4_ = -fStack_570;
          auVar256._20_4_ = -fStack_56c;
          auVar256._24_4_ = -fStack_568;
          auVar256._28_4_ = -fStack_564;
          auVar34 = vsubps_avx(auVar256,auVar223);
          fVar350 = auVar34._0_4_ * fVar137;
          fVar352 = auVar34._4_4_ * fVar209;
          auVar73._4_4_ = fVar352;
          auVar73._0_4_ = fVar350;
          fVar374 = auVar34._8_4_ * fVar224;
          auVar73._8_4_ = fVar374;
          fVar376 = auVar34._12_4_ * fVar225;
          auVar73._12_4_ = fVar376;
          fVar378 = auVar34._16_4_ * fVar226;
          auVar73._16_4_ = fVar378;
          fVar380 = auVar34._20_4_ * fVar247;
          auVar73._20_4_ = fVar380;
          fVar392 = auVar34._24_4_ * fVar264;
          auVar73._24_4_ = fVar392;
          auVar73._28_4_ = 0x3f800000;
          auVar223 = vsubps_avx(auVar223,_local_580);
          fVar137 = auVar223._0_4_ * fVar137;
          fVar209 = auVar223._4_4_ * fVar209;
          auVar74._4_4_ = fVar209;
          auVar74._0_4_ = fVar137;
          fVar224 = auVar223._8_4_ * fVar224;
          auVar74._8_4_ = fVar224;
          fVar225 = auVar223._12_4_ * fVar225;
          auVar74._12_4_ = fVar225;
          fVar226 = auVar223._16_4_ * fVar226;
          auVar74._16_4_ = fVar226;
          fVar247 = auVar223._20_4_ * fVar247;
          auVar74._20_4_ = fVar247;
          fVar264 = auVar223._24_4_ * fVar264;
          auVar74._24_4_ = fVar264;
          auVar74._28_4_ = 0x7f800000;
          auVar370 = ZEXT3264(auVar74);
          fVar266 = fVar227 * (fVar350 * (float)local_6e0._0_4_ + (float)local_a20._0_4_);
          fVar280 = fVar246 * (fVar352 * (float)local_6e0._4_4_ + local_a20._4_4_);
          fVar282 = fVar340 * (fVar374 * fStack_6d8 + local_a20._8_4_);
          fVar284 = fVar357 * (fVar376 * fStack_6d4 + local_a20._12_4_);
          fVar286 = fVar382 * (fVar378 * fStack_6d0 + local_a20._16_4_);
          fVar348 = fVar384 * (fVar380 * fStack_6cc + local_a20._20_4_);
          fVar349 = fVar267 * (fVar392 * fStack_6c8 + local_a20._24_4_);
          auVar221._0_4_ = local_a80 + fVar175 * fVar266;
          auVar221._4_4_ = fStack_a7c + fVar245 * fVar280;
          auVar221._8_4_ = fStack_a78 + fVar278 * fVar282;
          auVar221._12_4_ = fStack_a74 + fVar347 * fVar284;
          auVar221._16_4_ = fStack_a70 + fVar371 * fVar286;
          auVar221._20_4_ = fStack_a6c + fVar391 * fVar348;
          auVar221._24_4_ = fStack_a68 + fVar20 * fVar349;
          auVar221._28_4_ = fStack_a64 + auVar223._28_4_ + local_a20._28_4_;
          auVar75._4_4_ = fStack_4dc * fVar352;
          auVar75._0_4_ = local_4e0 * fVar350;
          auVar75._8_4_ = fStack_4d8 * fVar374;
          auVar75._12_4_ = fStack_4d4 * fVar376;
          auVar75._16_4_ = fStack_4d0 * fVar378;
          auVar75._20_4_ = fStack_4cc * fVar380;
          auVar75._24_4_ = fStack_4c8 * fVar392;
          auVar75._28_4_ = fVar265;
          _local_900 = vsubps_avx(auVar75,auVar221);
          auVar240._0_4_ = local_ae0 + fVar168 * fVar266;
          auVar240._4_4_ = fStack_adc + fVar243 * fVar280;
          auVar240._8_4_ = fStack_ad8 + fVar268 * fVar282;
          auVar240._12_4_ = fStack_ad4 + fVar345 * fVar284;
          auVar240._16_4_ = fStack_ad0 + fVar361 * fVar286;
          auVar240._20_4_ = fStack_acc + fVar385 * fVar348;
          auVar240._24_4_ = fStack_ac8 + fVar18 * fVar349;
          auVar240._28_4_ = fStack_ac4 + fVar265;
          auVar296._0_4_ = local_500 * fVar350;
          auVar296._4_4_ = fStack_4fc * fVar352;
          auVar296._8_4_ = fStack_4f8 * fVar374;
          auVar296._12_4_ = fStack_4f4 * fVar376;
          auVar296._16_4_ = fStack_4f0 * fVar378;
          auVar296._20_4_ = fStack_4ec * fVar380;
          auVar296._24_4_ = fStack_4e8 * fVar392;
          auVar296._28_4_ = 0;
          _local_920 = vsubps_avx(auVar296,auVar240);
          auVar257._0_4_ = local_ac0 + fVar171 * fVar266;
          auVar257._4_4_ = fStack_abc + fVar244 * fVar280;
          auVar257._8_4_ = fStack_ab8 + fVar277 * fVar282;
          auVar257._12_4_ = fStack_ab4 + fVar346 * fVar284;
          auVar257._16_4_ = fStack_ab0 + fVar362 * fVar286;
          auVar257._20_4_ = fStack_aac + fVar390 * fVar348;
          auVar257._24_4_ = fStack_aa8 + fVar19 * fVar349;
          auVar257._28_4_ = fStack_aa4 + auVar34._28_4_;
          auVar76._4_4_ = fStack_51c * fVar352;
          auVar76._0_4_ = local_520 * fVar350;
          auVar76._8_4_ = fStack_518 * fVar374;
          auVar76._12_4_ = fStack_514 * fVar376;
          auVar76._16_4_ = fStack_510 * fVar378;
          auVar76._20_4_ = fStack_50c * fVar380;
          auVar76._24_4_ = fStack_508 * fVar392;
          auVar76._28_4_ = 0;
          local_940 = vsubps_avx(auVar76,auVar257);
          fVar227 = fVar227 * (fVar137 * (float)local_6e0._0_4_ + (float)local_a20._0_4_);
          fVar246 = fVar246 * (fVar209 * (float)local_6e0._4_4_ + local_a20._4_4_);
          fVar340 = fVar340 * (fVar224 * fStack_6d8 + local_a20._8_4_);
          fVar357 = fVar357 * (fVar225 * fStack_6d4 + local_a20._12_4_);
          fVar382 = fVar382 * (fVar226 * fStack_6d0 + local_a20._16_4_);
          fVar384 = fVar384 * (fVar247 * fStack_6cc + local_a20._20_4_);
          fVar267 = fVar267 * (fVar264 * fStack_6c8 + local_a20._24_4_);
          auVar297._0_4_ = local_a80 + fVar175 * fVar227;
          auVar297._4_4_ = fStack_a7c + fVar245 * fVar246;
          auVar297._8_4_ = fStack_a78 + fVar278 * fVar340;
          auVar297._12_4_ = fStack_a74 + fVar347 * fVar357;
          auVar297._16_4_ = fStack_a70 + fVar371 * fVar382;
          auVar297._20_4_ = fStack_a6c + fVar391 * fVar384;
          auVar297._24_4_ = fStack_a68 + fVar20 * fVar267;
          auVar297._28_4_ = fStack_a64 + 0.0;
          auVar77._4_4_ = fStack_4dc * fVar209;
          auVar77._0_4_ = local_4e0 * fVar137;
          auVar77._8_4_ = fStack_4d8 * fVar224;
          auVar77._12_4_ = fStack_4d4 * fVar225;
          auVar77._16_4_ = fStack_4d0 * fVar226;
          auVar77._20_4_ = fStack_4cc * fVar247;
          auVar77._24_4_ = fStack_4c8 * fVar264;
          auVar77._28_4_ = fStack_4c4;
          _local_640 = vsubps_avx(auVar77,auVar297);
          auVar298._0_4_ = local_ae0 + fVar168 * fVar227;
          auVar298._4_4_ = fStack_adc + fVar243 * fVar246;
          auVar298._8_4_ = fStack_ad8 + fVar268 * fVar340;
          auVar298._12_4_ = fStack_ad4 + fVar345 * fVar357;
          auVar298._16_4_ = fStack_ad0 + fVar361 * fVar382;
          auVar298._20_4_ = fStack_acc + fVar385 * fVar384;
          auVar298._24_4_ = fStack_ac8 + fVar18 * fVar267;
          auVar298._28_4_ = fStack_ac4 + local_640._28_4_;
          auVar78._4_4_ = fStack_4fc * fVar209;
          auVar78._0_4_ = local_500 * fVar137;
          auVar78._8_4_ = fStack_4f8 * fVar224;
          auVar78._12_4_ = fStack_4f4 * fVar225;
          auVar78._16_4_ = fStack_4f0 * fVar226;
          auVar78._20_4_ = fStack_4ec * fVar247;
          auVar78._24_4_ = fStack_4e8 * fVar264;
          auVar78._28_4_ = fStack_4c4;
          _local_660 = vsubps_avx(auVar78,auVar298);
          auVar258._0_4_ = local_ac0 + fVar171 * fVar227;
          auVar258._4_4_ = fStack_abc + fVar244 * fVar246;
          auVar258._8_4_ = fStack_ab8 + fVar277 * fVar340;
          auVar258._12_4_ = fStack_ab4 + fVar346 * fVar357;
          auVar258._16_4_ = fStack_ab0 + fVar362 * fVar382;
          auVar258._20_4_ = fStack_aac + fVar390 * fVar384;
          auVar258._24_4_ = fStack_aa8 + fVar19 * fVar267;
          auVar258._28_4_ = fStack_aa4 + local_940._28_4_ + local_a20._28_4_;
          auVar79._4_4_ = fStack_51c * fVar209;
          auVar79._0_4_ = local_520 * fVar137;
          auVar79._8_4_ = fStack_518 * fVar224;
          auVar79._12_4_ = fStack_514 * fVar225;
          auVar79._16_4_ = fStack_510 * fVar226;
          auVar79._20_4_ = fStack_50c * fVar247;
          auVar79._24_4_ = fStack_508 * fVar264;
          auVar79._28_4_ = local_660._28_4_;
          _local_680 = vsubps_avx(auVar79,auVar258);
          auVar34 = vcmpps_avx(auVar33,_DAT_02020f00,5);
          auVar198._8_4_ = 0x7f800000;
          auVar198._0_8_ = 0x7f8000007f800000;
          auVar198._12_4_ = 0x7f800000;
          auVar198._16_4_ = 0x7f800000;
          auVar198._20_4_ = 0x7f800000;
          auVar198._24_4_ = 0x7f800000;
          auVar198._28_4_ = 0x7f800000;
          auVar197 = vblendvps_avx(auVar198,auVar73,auVar34);
          auVar316._8_4_ = 0x7fffffff;
          auVar316._0_8_ = 0x7fffffff7fffffff;
          auVar316._12_4_ = 0x7fffffff;
          auVar316._16_4_ = 0x7fffffff;
          auVar316._20_4_ = 0x7fffffff;
          auVar316._24_4_ = 0x7fffffff;
          auVar316._28_4_ = 0x7fffffff;
          auVar33 = vandps_avx(auVar316,local_5c0);
          auVar33 = vmaxps_avx(local_3e0,auVar33);
          auVar80._4_4_ = auVar33._4_4_ * 1.9073486e-06;
          auVar80._0_4_ = auVar33._0_4_ * 1.9073486e-06;
          auVar80._8_4_ = auVar33._8_4_ * 1.9073486e-06;
          auVar80._12_4_ = auVar33._12_4_ * 1.9073486e-06;
          auVar80._16_4_ = auVar33._16_4_ * 1.9073486e-06;
          auVar80._20_4_ = auVar33._20_4_ * 1.9073486e-06;
          auVar80._24_4_ = auVar33._24_4_ * 1.9073486e-06;
          auVar80._28_4_ = auVar33._28_4_;
          auVar33 = vandps_avx(auVar316,local_6c0);
          auVar33 = vcmpps_avx(auVar33,auVar80,1);
          auVar259._8_4_ = 0xff800000;
          auVar259._0_8_ = 0xff800000ff800000;
          auVar259._12_4_ = 0xff800000;
          auVar259._16_4_ = 0xff800000;
          auVar259._20_4_ = 0xff800000;
          auVar259._24_4_ = 0xff800000;
          auVar259._28_4_ = 0xff800000;
          auVar255 = vblendvps_avx(auVar259,auVar74,auVar34);
          auVar223 = auVar34 & auVar33;
          if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar223 >> 0x7f,0) != '\0') ||
                (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar223 >> 0xbf,0) != '\0') ||
              (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar223[0x1f] < '\0') {
            auVar122 = vandps_avx(auVar33,auVar34);
            auVar145 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
            auVar223 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar33 = vcmpps_avx(auVar32,auVar223,2);
            auVar400._8_4_ = 0xff800000;
            auVar400._0_8_ = 0xff800000ff800000;
            auVar400._12_4_ = 0xff800000;
            auVar400._16_4_ = 0xff800000;
            auVar400._20_4_ = 0xff800000;
            auVar400._24_4_ = 0xff800000;
            auVar400._28_4_ = 0xff800000;
            auVar401._8_4_ = 0x7f800000;
            auVar401._0_8_ = 0x7f8000007f800000;
            auVar401._12_4_ = 0x7f800000;
            auVar401._16_4_ = 0x7f800000;
            auVar401._20_4_ = 0x7f800000;
            auVar401._24_4_ = 0x7f800000;
            auVar401._28_4_ = 0x7f800000;
            auVar32 = vblendvps_avx(auVar401,auVar400,auVar33);
            auVar113 = vpmovsxwd_avx(auVar145);
            auVar370 = ZEXT1664(auVar113);
            auVar145 = vpunpckhwd_avx(auVar145,auVar145);
            auVar319._16_16_ = auVar145;
            auVar319._0_16_ = auVar113;
            auVar197 = vblendvps_avx(auVar197,auVar32,auVar319);
            auVar32 = vblendvps_avx(auVar400,auVar401,auVar33);
            auVar255 = vblendvps_avx(auVar255,auVar32,auVar319);
            auVar32 = vcmpps_avx(auVar223,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar166._0_4_ = auVar32._0_4_ ^ auVar122._0_4_;
            auVar166._4_4_ = auVar32._4_4_ ^ auVar122._4_4_;
            auVar166._8_4_ = auVar32._8_4_ ^ auVar122._8_4_;
            auVar166._12_4_ = auVar32._12_4_ ^ auVar122._12_4_;
            auVar166._16_4_ = auVar32._16_4_ ^ auVar122._16_4_;
            auVar166._20_4_ = auVar32._20_4_ ^ auVar122._20_4_;
            auVar166._24_4_ = auVar32._24_4_ ^ auVar122._24_4_;
            auVar166._28_4_ = auVar32._28_4_ ^ auVar122._28_4_;
            auVar122 = vorps_avx(auVar33,auVar166);
            auVar122 = vandps_avx(auVar34,auVar122);
          }
          auVar218 = local_900._0_28_;
          auVar238 = local_920._0_28_;
          auVar343 = local_940._0_28_;
        }
        fVar137 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar317._4_4_ = fVar137;
        auVar317._0_4_ = fVar137;
        auVar317._8_4_ = fVar137;
        auVar317._12_4_ = fVar137;
        auVar317._16_4_ = fVar137;
        auVar317._20_4_ = fVar137;
        auVar317._24_4_ = fVar137;
        auVar317._28_4_ = fVar137;
        auVar320 = ZEXT3264(auVar317);
        fVar168 = (ray->super_RayK<1>).dir.field_0.m128[1];
        auVar388._4_4_ = fVar168;
        auVar388._0_4_ = fVar168;
        auVar388._8_4_ = fVar168;
        auVar388._12_4_ = fVar168;
        auVar388._16_4_ = fVar168;
        auVar388._20_4_ = fVar168;
        auVar388._24_4_ = fVar168;
        auVar388._28_4_ = fVar168;
        auVar389 = ZEXT3264(auVar388);
        fVar171 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar355._4_4_ = fVar171;
        auVar355._0_4_ = fVar171;
        auVar355._8_4_ = fVar171;
        auVar355._12_4_ = fVar171;
        auVar355._16_4_ = fVar171;
        auVar355._20_4_ = fVar171;
        auVar355._24_4_ = fVar171;
        auVar355._28_4_ = fVar171;
        auVar356 = ZEXT3264(auVar355);
        local_420 = local_6a0;
        local_400 = vminps_avx(local_440,auVar197);
        _local_460 = vmaxps_avx(local_6a0,auVar255);
        auVar32 = vcmpps_avx(local_6a0,local_400,2);
        local_540 = vandps_avx(auVar32,auVar129);
        local_5e0 = local_540;
        auVar32 = vcmpps_avx(_local_460,local_440,2);
        local_600 = vandps_avx(auVar32,auVar129);
        auVar129 = vorps_avx(local_600,local_540);
        auVar299 = ZEXT864(0) << 0x20;
        if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar129 >> 0x7f,0) != '\0') ||
              (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar129 >> 0xbf,0) != '\0') ||
            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar129[0x1f] < '\0') {
          _local_580 = _local_460;
          local_6c0 = local_600;
          auVar129 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5a0._0_4_ = auVar122._0_4_ ^ auVar129._0_4_;
          local_5a0._4_4_ = auVar122._4_4_ ^ auVar129._4_4_;
          local_5a0._8_4_ = auVar122._8_4_ ^ auVar129._8_4_;
          local_5a0._12_4_ = auVar122._12_4_ ^ auVar129._12_4_;
          local_5a0._16_4_ = auVar122._16_4_ ^ auVar129._16_4_;
          local_5a0._20_4_ = auVar122._20_4_ ^ auVar129._20_4_;
          local_5a0._24_4_ = auVar122._24_4_ ^ auVar129._24_4_;
          local_5a0._28_4_ = (uint)auVar122._28_4_ ^ (uint)auVar129._28_4_;
          auVar360 = ZEXT3264(auVar317);
          auVar370 = ZEXT3264(auVar388);
          auVar128._0_4_ =
               fVar137 * auVar218._0_4_ + fVar168 * auVar238._0_4_ + auVar343._0_4_ * fVar171;
          auVar128._4_4_ =
               fVar137 * auVar218._4_4_ + fVar168 * auVar238._4_4_ + auVar343._4_4_ * fVar171;
          auVar128._8_4_ =
               fVar137 * auVar218._8_4_ + fVar168 * auVar238._8_4_ + auVar343._8_4_ * fVar171;
          auVar128._12_4_ =
               fVar137 * auVar218._12_4_ + fVar168 * auVar238._12_4_ + auVar343._12_4_ * fVar171;
          auVar128._16_4_ =
               fVar137 * auVar218._16_4_ + fVar168 * auVar238._16_4_ + auVar343._16_4_ * fVar171;
          auVar128._20_4_ =
               fVar137 * auVar218._20_4_ + fVar168 * auVar238._20_4_ + auVar343._20_4_ * fVar171;
          auVar128._24_4_ =
               fVar137 * auVar218._24_4_ + fVar168 * auVar238._24_4_ + auVar343._24_4_ * fVar171;
          auVar128._28_4_ = auVar129._28_4_ + auVar122._28_4_ + local_540._28_4_;
          auVar154._8_4_ = 0x7fffffff;
          auVar154._0_8_ = 0x7fffffff7fffffff;
          auVar154._12_4_ = 0x7fffffff;
          auVar154._16_4_ = 0x7fffffff;
          auVar154._20_4_ = 0x7fffffff;
          auVar154._24_4_ = 0x7fffffff;
          auVar154._28_4_ = 0x7fffffff;
          auVar129 = vandps_avx(auVar128,auVar154);
          auVar155._8_4_ = 0x3e99999a;
          auVar155._0_8_ = 0x3e99999a3e99999a;
          auVar155._12_4_ = 0x3e99999a;
          auVar155._16_4_ = 0x3e99999a;
          auVar155._20_4_ = 0x3e99999a;
          auVar155._24_4_ = 0x3e99999a;
          auVar155._28_4_ = 0x3e99999a;
          auVar129 = vcmpps_avx(auVar129,auVar155,1);
          auVar129 = vorps_avx(auVar129,local_5a0);
          auVar156._8_4_ = 3;
          auVar156._0_8_ = 0x300000003;
          auVar156._12_4_ = 3;
          auVar156._16_4_ = 3;
          auVar156._20_4_ = 3;
          auVar156._24_4_ = 3;
          auVar156._28_4_ = 3;
          auVar199._8_4_ = 2;
          auVar199._0_8_ = 0x200000002;
          auVar199._12_4_ = 2;
          auVar199._16_4_ = 2;
          auVar199._20_4_ = 2;
          auVar199._24_4_ = 2;
          auVar199._28_4_ = 2;
          auVar129 = vblendvps_avx(auVar199,auVar156,auVar129);
          _local_6e0 = ZEXT432((uint)uVar105);
          auVar113 = vpshufd_avx(ZEXT416((uint)uVar105),0);
          auVar145 = vpcmpgtd_avx(auVar129._16_16_,auVar113);
          local_5c0._0_16_ = auVar113;
          auVar113 = vpcmpgtd_avx(auVar129._0_16_,auVar113);
          auVar157._16_16_ = auVar145;
          auVar157._0_16_ = auVar113;
          auVar129 = vblendps_avx(ZEXT1632(auVar113),auVar157,0xf0);
          local_5e0 = vandnps_avx(auVar129,local_540);
          auVar263 = ZEXT3264(local_5e0);
          local_560 = auVar129;
          auVar122 = local_540 & ~auVar129;
          auVar242 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_620._0_8_ = uVar105;
          local_9c0 = auVar36;
          local_800 = auVar37;
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            local_720._4_4_ = (float)local_740._4_4_ + local_6a0._4_4_;
            local_720._0_4_ = (float)local_740._0_4_ + local_6a0._0_4_;
            fStack_718 = fStack_738 + local_6a0._8_4_;
            fStack_714 = fStack_734 + local_6a0._12_4_;
            fStack_710 = fStack_730 + local_6a0._16_4_;
            fStack_70c = fStack_72c + local_6a0._20_4_;
            fStack_708 = fStack_728 + local_6a0._24_4_;
            fStack_704 = fStack_724 + local_6a0._28_4_;
            local_960 = auVar317;
            local_a20 = auVar388;
            local_880 = auVar355;
            do {
              auVar230 = auVar242._0_16_;
              auVar158._8_4_ = 0x7f800000;
              auVar158._0_8_ = 0x7f8000007f800000;
              auVar158._12_4_ = 0x7f800000;
              auVar158._16_4_ = 0x7f800000;
              auVar158._20_4_ = 0x7f800000;
              auVar158._24_4_ = 0x7f800000;
              auVar158._28_4_ = 0x7f800000;
              auVar129 = auVar263._0_32_;
              auVar122 = vblendvps_avx(auVar158,local_6a0,auVar129);
              auVar32 = vshufps_avx(auVar122,auVar122,0xb1);
              auVar32 = vminps_avx(auVar122,auVar32);
              auVar33 = vshufpd_avx(auVar32,auVar32,5);
              auVar32 = vminps_avx(auVar32,auVar33);
              auVar33 = vperm2f128_avx(auVar32,auVar32,1);
              auVar32 = vminps_avx(auVar32,auVar33);
              auVar122 = vcmpps_avx(auVar122,auVar32,0);
              auVar32 = auVar129 & auVar122;
              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar32 >> 0x7f,0) != '\0') ||
                    (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0xbf,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar32[0x1f] < '\0') {
                auVar129 = vandps_avx(auVar122,auVar129);
              }
              uVar104 = vmovmskps_avx(auVar129);
              uVar99 = 0;
              if (uVar104 != 0) {
                for (; (uVar104 >> uVar99 & 1) == 0; uVar99 = uVar99 + 1) {
                }
              }
              uVar105 = (ulong)uVar99;
              *(undefined4 *)(local_5e0 + uVar105 * 4) = 0;
              aVar12 = (ray->super_RayK<1>).dir.field_0;
              _local_920 = (undefined1  [16])aVar12;
              auVar145 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
              local_ac0 = local_4a0[uVar105];
              auVar389 = ZEXT464((uint)local_ac0);
              local_ae0 = *(float *)(local_420 + uVar105 * 4);
              auVar263 = ZEXT464((uint)local_ae0);
              if (auVar145._0_4_ < 0.0) {
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                fStack_adc = 0.0;
                fStack_ad8 = 0.0;
                fStack_ad4 = 0.0;
                fVar137 = sqrtf(auVar145._0_4_);
                auVar263 = ZEXT1664(CONCAT412(fStack_ad4,
                                              CONCAT48(fStack_ad8,CONCAT44(fStack_adc,local_ae0))));
                auVar389 = ZEXT1664(CONCAT412(fStack_ab4,
                                              CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
                auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar230._8_4_ = 0x7fffffff;
                auVar230._0_8_ = 0x7fffffff7fffffff;
                auVar230._12_4_ = 0x7fffffff;
              }
              else {
                auVar145 = vsqrtss_avx(auVar145,auVar145);
                fVar137 = auVar145._0_4_;
              }
              auVar113 = vminps_avx(_local_970,_local_990);
              auVar145 = vmaxps_avx(_local_970,_local_990);
              auVar185 = vminps_avx(_local_980,_local_9a0);
              auVar142 = vminps_avx(auVar113,auVar185);
              auVar113 = vmaxps_avx(_local_980,_local_9a0);
              auVar185 = vmaxps_avx(auVar145,auVar113);
              auVar145 = vandps_avx(auVar142,auVar230);
              auVar113 = vandps_avx(auVar185,auVar230);
              auVar145 = vmaxps_avx(auVar145,auVar113);
              auVar113 = vmovshdup_avx(auVar145);
              auVar113 = vmaxss_avx(auVar113,auVar145);
              auVar145 = vshufpd_avx(auVar145,auVar145,1);
              auVar145 = vmaxss_avx(auVar145,auVar113);
              local_940._0_4_ = auVar145._0_4_ * 1.9073486e-06;
              local_820._0_4_ = fVar137 * 1.9073486e-06;
              local_700._0_16_ = vshufps_avx(auVar185,auVar185,0xff);
              lVar103 = 4;
              do {
                auVar396 = auVar263._0_16_;
                auVar145 = vshufps_avx(auVar396,auVar396,0);
                auVar112._0_4_ = auVar145._0_4_ * (float)local_920._0_4_ + 0.0;
                auVar112._4_4_ = auVar145._4_4_ * (float)local_920._4_4_ + 0.0;
                auVar112._8_4_ = auVar145._8_4_ * fStack_918 + 0.0;
                auVar112._12_4_ = auVar145._12_4_ * fStack_914 + 0.0;
                local_ac0 = auVar389._0_4_;
                fVar175 = 1.0 - local_ac0;
                fVar168 = local_ac0 * local_ac0;
                fVar171 = local_ac0 * 3.0;
                fVar137 = fVar171 + -5.0;
                local_840._0_4_ = fVar175 * fVar175;
                auVar145 = ZEXT416((uint)(local_ac0 * local_ac0 * -fVar175 * 0.5));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar113 = ZEXT416((uint)((fVar175 * fVar175 * (fVar175 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar185 = ZEXT416((uint)((fVar168 * fVar137 + 2.0) * 0.5));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar142 = ZEXT416((uint)(fVar175 * fVar175 * -local_ac0 * 0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar186._0_4_ =
                     auVar142._0_4_ * (float)local_970._0_4_ +
                     auVar185._0_4_ * (float)local_990._0_4_ +
                     auVar113._0_4_ * (float)local_980._0_4_ +
                     auVar145._0_4_ * (float)local_9a0._0_4_;
                auVar186._4_4_ =
                     auVar142._4_4_ * (float)local_970._4_4_ +
                     auVar185._4_4_ * (float)local_990._4_4_ +
                     auVar113._4_4_ * (float)local_980._4_4_ +
                     auVar145._4_4_ * (float)local_9a0._4_4_;
                auVar186._8_4_ =
                     auVar142._8_4_ * fStack_968 +
                     auVar185._8_4_ * fStack_988 +
                     auVar113._8_4_ * fStack_978 + auVar145._8_4_ * fStack_998;
                auVar186._12_4_ =
                     auVar142._12_4_ * fStack_964 +
                     auVar185._12_4_ * fStack_984 +
                     auVar113._12_4_ * fStack_974 + auVar145._12_4_ * fStack_994;
                local_860._0_16_ = auVar186;
                auVar145 = vsubps_avx(auVar112,auVar186);
                _local_900 = auVar145;
                auVar145 = vdpps_avx(auVar145,auVar145,0x7f);
                local_9c0._0_16_ = ZEXT416((uint)(local_ac0 * -9.0 + 4.0));
                local_9e0._0_16_ = ZEXT416((uint)(fVar171 + -1.0));
                local_a80 = auVar145._0_4_;
                fStack_abc = auVar389._4_4_;
                fStack_ab8 = auVar389._8_4_;
                fStack_ab4 = auVar389._12_4_;
                local_ae0 = auVar263._0_4_;
                fStack_adc = auVar263._4_4_;
                fStack_ad8 = auVar263._8_4_;
                fStack_ad4 = auVar263._12_4_;
                fStack_a7c = auVar145._4_4_;
                fStack_a78 = auVar145._8_4_;
                fStack_a74 = auVar145._12_4_;
                local_a00._0_4_ = fVar137;
                if (local_a80 < 0.0) {
                  local_800._0_4_ = fVar168;
                  local_8e0._0_16_ = ZEXT416((uint)fVar175);
                  local_7a0._0_4_ = fVar171;
                  local_7c0._0_4_ = local_ac0 * 9.0;
                  local_7e0._0_4_ = fVar175 * -2.0;
                  fVar137 = sqrtf(local_a80);
                  auVar396._4_4_ = fStack_adc;
                  auVar396._0_4_ = local_ae0;
                  auVar396._8_4_ = fStack_ad8;
                  auVar396._12_4_ = fStack_ad4;
                  auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar209 = (float)local_7e0._0_4_;
                  fVar171 = (float)local_7a0._0_4_;
                  fVar168 = (float)local_7c0._0_4_;
                  fVar175 = (float)local_8e0._0_4_;
                }
                else {
                  auVar145 = vsqrtss_avx(auVar145,auVar145);
                  fVar137 = auVar145._0_4_;
                  fVar209 = fVar175 * -2.0;
                  local_800._0_4_ = fVar168;
                  fVar168 = local_ac0 * 9.0;
                }
                auVar145 = ZEXT416((uint)(((float)local_800._0_4_ + fVar209 * local_ac0) * 0.5));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar113 = ZEXT416((uint)(((fVar175 + fVar175) * (fVar171 + 2.0) +
                                          fVar175 * fVar175 * -3.0) * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar185 = ZEXT416((uint)(((local_ac0 + local_ac0) * (float)local_a00._0_4_ +
                                          local_ac0 * fVar171) * 0.5));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar142 = ZEXT416((uint)((local_ac0 * (fVar175 + fVar175) - (float)local_840._0_4_)
                                         * 0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar359._0_4_ =
                     (float)local_970._0_4_ * auVar142._0_4_ +
                     (float)local_990._0_4_ * auVar185._0_4_ +
                     (float)local_9a0._0_4_ * auVar145._0_4_ +
                     (float)local_980._0_4_ * auVar113._0_4_;
                auVar359._4_4_ =
                     (float)local_970._4_4_ * auVar142._4_4_ +
                     (float)local_990._4_4_ * auVar185._4_4_ +
                     (float)local_9a0._4_4_ * auVar145._4_4_ +
                     (float)local_980._4_4_ * auVar113._4_4_;
                auVar359._8_4_ =
                     fStack_968 * auVar142._8_4_ +
                     fStack_988 * auVar185._8_4_ +
                     fStack_998 * auVar145._8_4_ + fStack_978 * auVar113._8_4_;
                auVar359._12_4_ =
                     fStack_964 * auVar142._12_4_ +
                     fStack_984 * auVar185._12_4_ +
                     fStack_994 * auVar145._12_4_ + fStack_974 * auVar113._12_4_;
                auVar142 = vpermilps_avx(local_9e0._0_16_,0);
                auVar25 = vpermilps_avx(local_9c0._0_16_,0);
                auVar145 = vshufps_avx(ZEXT416((uint)(fVar168 + -5.0)),
                                       ZEXT416((uint)(fVar168 + -5.0)),0);
                auVar113 = ZEXT416((uint)(local_ac0 * -3.0 + 2.0));
                auVar185 = vshufps_avx(auVar113,auVar113,0);
                auVar113 = vdpps_avx(auVar359,auVar359,0x7f);
                auVar143._0_4_ =
                     (float)local_970._0_4_ * auVar185._0_4_ +
                     (float)local_990._0_4_ * auVar145._0_4_ +
                     (float)local_980._0_4_ * auVar25._0_4_ +
                     (float)local_9a0._0_4_ * auVar142._0_4_;
                auVar143._4_4_ =
                     (float)local_970._4_4_ * auVar185._4_4_ +
                     (float)local_990._4_4_ * auVar145._4_4_ +
                     (float)local_980._4_4_ * auVar25._4_4_ +
                     (float)local_9a0._4_4_ * auVar142._4_4_;
                auVar143._8_4_ =
                     fStack_968 * auVar185._8_4_ +
                     fStack_988 * auVar145._8_4_ +
                     fStack_978 * auVar25._8_4_ + fStack_998 * auVar142._8_4_;
                auVar143._12_4_ =
                     fStack_964 * auVar185._12_4_ +
                     fStack_984 * auVar145._12_4_ +
                     fStack_974 * auVar25._12_4_ + fStack_994 * auVar142._12_4_;
                auVar145 = vblendps_avx(auVar113,_DAT_01feba10,0xe);
                auVar185 = vrsqrtss_avx(auVar145,auVar145);
                fVar171 = auVar185._0_4_;
                fVar168 = auVar113._0_4_;
                auVar185 = vdpps_avx(auVar359,auVar143,0x7f);
                auVar142 = vshufps_avx(auVar113,auVar113,0);
                auVar144._0_4_ = auVar143._0_4_ * auVar142._0_4_;
                auVar144._4_4_ = auVar143._4_4_ * auVar142._4_4_;
                auVar144._8_4_ = auVar143._8_4_ * auVar142._8_4_;
                auVar144._12_4_ = auVar143._12_4_ * auVar142._12_4_;
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar231._0_4_ = auVar359._0_4_ * auVar185._0_4_;
                auVar231._4_4_ = auVar359._4_4_ * auVar185._4_4_;
                auVar231._8_4_ = auVar359._8_4_ * auVar185._8_4_;
                auVar231._12_4_ = auVar359._12_4_ * auVar185._12_4_;
                auVar142 = vsubps_avx(auVar144,auVar231);
                auVar185 = vrcpss_avx(auVar145,auVar145);
                auVar145 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(auVar396._0_4_ * (float)local_820._0_4_)));
                local_a00._0_4_ = auVar145._0_4_;
                auVar145 = ZEXT416((uint)(auVar185._0_4_ * (2.0 - fVar168 * auVar185._0_4_)));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                uVar105 = CONCAT44(auVar359._4_4_,auVar359._0_4_);
                auVar314._0_8_ = uVar105 ^ 0x8000000080000000;
                auVar314._8_4_ = -auVar359._8_4_;
                auVar314._12_4_ = -auVar359._12_4_;
                auVar185 = ZEXT416((uint)(fVar171 * 1.5 +
                                         fVar168 * -0.5 * fVar171 * fVar171 * fVar171));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar214._0_4_ = auVar185._0_4_ * auVar142._0_4_ * auVar145._0_4_;
                auVar214._4_4_ = auVar185._4_4_ * auVar142._4_4_ * auVar145._4_4_;
                auVar214._8_4_ = auVar185._8_4_ * auVar142._8_4_ * auVar145._8_4_;
                auVar214._12_4_ = auVar185._12_4_ * auVar142._12_4_ * auVar145._12_4_;
                local_800._0_4_ = auVar359._0_4_ * auVar185._0_4_;
                local_800._4_4_ = auVar359._4_4_ * auVar185._4_4_;
                local_800._8_4_ = auVar359._8_4_ * auVar185._8_4_;
                local_800._12_4_ = auVar359._12_4_ * auVar185._12_4_;
                local_840._0_16_ = auVar359;
                if (fVar168 < 0.0) {
                  local_9c0._0_4_ = fVar137;
                  local_9e0._0_16_ = auVar314;
                  local_8e0._0_16_ = auVar214;
                  fVar168 = sqrtf(fVar168);
                  auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar214 = local_8e0._0_16_;
                  auVar314 = local_9e0._0_16_;
                }
                else {
                  auVar145 = vsqrtss_avx(auVar113,auVar113);
                  fVar168 = auVar145._0_4_;
                  local_9c0._0_4_ = fVar137;
                }
                auVar342._4_4_ = fStack_a7c;
                auVar342._0_4_ = local_a80;
                auVar342._8_4_ = fStack_a78;
                auVar342._12_4_ = fStack_a74;
                auVar145 = vdpps_avx(_local_900,local_800._0_16_,0x7f);
                local_9e0._0_4_ =
                     ((float)local_940._0_4_ / fVar168) * ((float)local_9c0._0_4_ + 1.0) +
                     (float)local_9c0._0_4_ * (float)local_940._0_4_ + (float)local_a00._0_4_;
                auVar113 = vdpps_avx(auVar314,local_800._0_16_,0x7f);
                auVar185 = vdpps_avx(_local_900,auVar214,0x7f);
                auVar142 = vdpps_avx(_local_920,local_800._0_16_,0x7f);
                auVar25 = vdpps_avx(_local_900,auVar314,0x7f);
                fVar137 = auVar113._0_4_ + auVar185._0_4_;
                fVar168 = auVar145._0_4_;
                auVar114._0_4_ = fVar168 * fVar168;
                auVar114._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                auVar114._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                auVar114._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                auVar185 = vsubps_avx(auVar342,auVar114);
                local_800._0_16_ = ZEXT416((uint)fVar137);
                auVar113 = vdpps_avx(_local_900,_local_920,0x7f);
                fVar171 = auVar25._0_4_ - fVar168 * fVar137;
                local_9c0._0_16_ = auVar145;
                fVar168 = auVar113._0_4_ - fVar168 * auVar142._0_4_;
                auVar145 = vrsqrtss_avx(auVar185,auVar185);
                fVar175 = auVar185._0_4_;
                fVar137 = auVar145._0_4_;
                fVar137 = fVar137 * 1.5 + fVar175 * -0.5 * fVar137 * fVar137 * fVar137;
                if (fVar175 < 0.0) {
                  local_8e0._0_16_ = auVar142;
                  local_7a0._0_4_ = fVar171;
                  local_7c0._0_4_ = fVar168;
                  local_7e0._0_4_ = fVar137;
                  fVar175 = sqrtf(fVar175);
                  auVar342._4_4_ = fStack_a7c;
                  auVar342._0_4_ = local_a80;
                  auVar342._8_4_ = fStack_a78;
                  auVar342._12_4_ = fStack_a74;
                  auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar137 = (float)local_7e0._0_4_;
                  fVar171 = (float)local_7a0._0_4_;
                  fVar168 = (float)local_7c0._0_4_;
                  auVar142 = local_8e0._0_16_;
                }
                else {
                  auVar145 = vsqrtss_avx(auVar185,auVar185);
                  fVar175 = auVar145._0_4_;
                }
                auVar360 = ZEXT3264(local_960);
                auVar370 = ZEXT3264(local_a20);
                auVar356 = ZEXT3264(local_880);
                auVar113 = vpermilps_avx(local_860._0_16_,0xff);
                auVar25 = vshufps_avx(local_840._0_16_,local_840._0_16_,0xff);
                fVar171 = fVar171 * fVar137 - auVar25._0_4_;
                auVar232._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
                auVar232._8_4_ = auVar142._8_4_ ^ 0x80000000;
                auVar232._12_4_ = auVar142._12_4_ ^ 0x80000000;
                auVar249._0_4_ = -fVar171;
                auVar249._4_4_ = 0x80000000;
                auVar249._8_4_ = 0x80000000;
                auVar249._12_4_ = 0x80000000;
                auVar320 = ZEXT1664(local_800._0_16_);
                auVar145 = vinsertps_avx(ZEXT416((uint)(fVar168 * fVar137)),auVar232,0x10);
                auVar185 = vmovsldup_avx(ZEXT416((uint)(local_800._0_4_ * fVar168 * fVar137 -
                                                       auVar142._0_4_ * fVar171)));
                auVar145 = vdivps_avx(auVar145,auVar185);
                auVar142 = ZEXT416((uint)(fVar175 - auVar113._0_4_));
                auVar113 = vinsertps_avx(local_9c0._0_16_,auVar142,0x10);
                auVar215._0_4_ = auVar113._0_4_ * auVar145._0_4_;
                auVar215._4_4_ = auVar113._4_4_ * auVar145._4_4_;
                auVar215._8_4_ = auVar113._8_4_ * auVar145._8_4_;
                auVar215._12_4_ = auVar113._12_4_ * auVar145._12_4_;
                auVar145 = vinsertps_avx(auVar249,local_800._0_16_,0x1c);
                auVar145 = vdivps_avx(auVar145,auVar185);
                auVar187._0_4_ = auVar113._0_4_ * auVar145._0_4_;
                auVar187._4_4_ = auVar113._4_4_ * auVar145._4_4_;
                auVar187._8_4_ = auVar113._8_4_ * auVar145._8_4_;
                auVar187._12_4_ = auVar113._12_4_ * auVar145._12_4_;
                auVar145 = vhaddps_avx(auVar215,auVar215);
                auVar113 = vhaddps_avx(auVar187,auVar187);
                local_ac0 = local_ac0 - auVar145._0_4_;
                auVar389 = ZEXT464((uint)local_ac0);
                local_ae0 = local_ae0 - auVar113._0_4_;
                auVar263 = ZEXT464((uint)local_ae0);
                auVar233._8_4_ = 0x7fffffff;
                auVar233._0_8_ = 0x7fffffff7fffffff;
                auVar233._12_4_ = 0x7fffffff;
                auVar242 = ZEXT1664(auVar233);
                auVar145 = vandps_avx(local_9c0._0_16_,auVar233);
                if ((float)local_9e0._0_4_ <= auVar145._0_4_) {
LAB_010686bc:
                  bVar81 = false;
                }
                else {
                  auVar145 = vandps_avx(auVar142,auVar233);
                  if ((float)local_700._0_4_ * 1.9073486e-06 +
                      (float)local_9e0._0_4_ + (float)local_a00._0_4_ <= auVar145._0_4_)
                  goto LAB_010686bc;
                  local_ae0 = local_ae0 + (float)local_760._0_4_;
                  auVar263 = ZEXT464((uint)local_ae0);
                  bVar81 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ae0) &&
                       (fVar137 = (ray->super_RayK<1>).tfar, local_ae0 <= fVar137)) &&
                      (0.0 <= local_ac0)) && (local_ac0 <= 1.0)) {
                    auVar145 = vrsqrtss_avx(auVar342,auVar342);
                    fVar168 = auVar145._0_4_;
                    pGVar14 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar14->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar145 = ZEXT416((uint)(fVar168 * 1.5 +
                                               auVar342._0_4_ * -0.5 * fVar168 * fVar168 * fVar168))
                      ;
                      auVar145 = vshufps_avx(auVar145,auVar145,0);
                      auVar146._0_4_ = auVar145._0_4_ * (float)local_900._0_4_;
                      auVar146._4_4_ = auVar145._4_4_ * (float)local_900._4_4_;
                      auVar146._8_4_ = auVar145._8_4_ * fStack_8f8;
                      auVar146._12_4_ = auVar145._12_4_ * fStack_8f4;
                      auVar115._0_4_ = local_840._0_4_ + auVar25._0_4_ * auVar146._0_4_;
                      auVar115._4_4_ = local_840._4_4_ + auVar25._4_4_ * auVar146._4_4_;
                      auVar115._8_4_ = local_840._8_4_ + auVar25._8_4_ * auVar146._8_4_;
                      auVar115._12_4_ = local_840._12_4_ + auVar25._12_4_ * auVar146._12_4_;
                      auVar145 = vshufps_avx(auVar146,auVar146,0xc9);
                      auVar113 = vshufps_avx(local_840._0_16_,local_840._0_16_,0xc9);
                      auVar147._0_4_ = auVar113._0_4_ * auVar146._0_4_;
                      auVar147._4_4_ = auVar113._4_4_ * auVar146._4_4_;
                      auVar147._8_4_ = auVar113._8_4_ * auVar146._8_4_;
                      auVar147._12_4_ = auVar113._12_4_ * auVar146._12_4_;
                      auVar188._0_4_ = local_840._0_4_ * auVar145._0_4_;
                      auVar188._4_4_ = local_840._4_4_ * auVar145._4_4_;
                      auVar188._8_4_ = local_840._8_4_ * auVar145._8_4_;
                      auVar188._12_4_ = local_840._12_4_ * auVar145._12_4_;
                      auVar185 = vsubps_avx(auVar188,auVar147);
                      auVar145 = vshufps_avx(auVar185,auVar185,0xc9);
                      auVar113 = vshufps_avx(auVar115,auVar115,0xc9);
                      auVar189._0_4_ = auVar113._0_4_ * auVar145._0_4_;
                      auVar189._4_4_ = auVar113._4_4_ * auVar145._4_4_;
                      auVar189._8_4_ = auVar113._8_4_ * auVar145._8_4_;
                      auVar189._12_4_ = auVar113._12_4_ * auVar145._12_4_;
                      auVar145 = vshufps_avx(auVar185,auVar185,0xd2);
                      auVar116._0_4_ = auVar115._0_4_ * auVar145._0_4_;
                      auVar116._4_4_ = auVar115._4_4_ * auVar145._4_4_;
                      auVar116._8_4_ = auVar115._8_4_ * auVar145._8_4_;
                      auVar116._12_4_ = auVar115._12_4_ * auVar145._12_4_;
                      auVar145 = vsubps_avx(auVar189,auVar116);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = local_ae0;
                        auVar113 = vshufps_avx(auVar145,auVar145,0xe9);
                        uVar9 = vmovlps_avx(auVar113);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                        (ray->Ng).field_0.field_0.z = auVar145._0_4_;
                        ray->u = local_ac0;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a88;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar113 = vshufps_avx(auVar145,auVar145,0xe9);
                        local_8b0 = vmovlps_avx(auVar113);
                        local_8a8 = auVar145._0_4_;
                        local_8a4 = local_ac0;
                        local_8a0 = 0;
                        local_89c = (uint)local_a88;
                        local_898 = (uint)local_ae8;
                        local_894 = context->user->instID[0];
                        local_890 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = local_ae0;
                        local_aec = -1;
                        local_a50.valid = &local_aec;
                        local_a50.geometryUserPtr = pGVar14->userPtr;
                        local_a50.context = context->user;
                        local_a50.ray = (RTCRayN *)ray;
                        local_a50.hit = (RTCHitN *)&local_8b0;
                        local_a50.N = 1;
                        fStack_abc = 0.0;
                        fStack_ab8 = 0.0;
                        fStack_ab4 = 0.0;
                        fStack_adc = 0.0;
                        fStack_ad8 = 0.0;
                        fStack_ad4 = 0.0;
                        local_a80 = fVar137;
                        if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0106880f:
                          p_Var17 = context->args->filter;
                          if (p_Var17 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                              auVar320 = ZEXT1664(auVar320._0_16_);
                              (*p_Var17)(&local_a50);
                              auVar263 = ZEXT1664(CONCAT412(fStack_ad4,
                                                            CONCAT48(fStack_ad8,
                                                                     CONCAT44(fStack_adc,local_ae0))
                                                           ));
                              auVar389 = ZEXT1664(CONCAT412(fStack_ab4,
                                                            CONCAT48(fStack_ab8,
                                                                     CONCAT44(fStack_abc,local_ac0))
                                                           ));
                              auVar356 = ZEXT3264(local_880);
                              auVar370 = ZEXT3264(local_a20);
                              auVar360 = ZEXT3264(local_960);
                              auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar242 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            if (*local_a50.valid == 0) goto LAB_010688df;
                          }
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a50.hit;
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a50.hit + 4);
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a50.hit + 8);
                          *(float *)((long)local_a50.ray + 0x3c) = *(float *)(local_a50.hit + 0xc);
                          *(float *)((long)local_a50.ray + 0x40) = *(float *)(local_a50.hit + 0x10);
                          *(float *)((long)local_a50.ray + 0x44) = *(float *)(local_a50.hit + 0x14);
                          *(float *)((long)local_a50.ray + 0x48) = *(float *)(local_a50.hit + 0x18);
                          *(float *)((long)local_a50.ray + 0x4c) = *(float *)(local_a50.hit + 0x1c);
                          *(float *)((long)local_a50.ray + 0x50) = *(float *)(local_a50.hit + 0x20);
                        }
                        else {
                          auVar320 = ZEXT1664(local_800._0_16_);
                          (*pGVar14->intersectionFilterN)(&local_a50);
                          auVar263 = ZEXT1664(CONCAT412(fStack_ad4,
                                                        CONCAT48(fStack_ad8,
                                                                 CONCAT44(fStack_adc,local_ae0))));
                          auVar389 = ZEXT1664(CONCAT412(fStack_ab4,
                                                        CONCAT48(fStack_ab8,
                                                                 CONCAT44(fStack_abc,local_ac0))));
                          auVar356 = ZEXT3264(local_880);
                          auVar370 = ZEXT3264(local_a20);
                          auVar360 = ZEXT3264(local_960);
                          auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar242 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if (*local_a50.valid != 0) goto LAB_0106880f;
LAB_010688df:
                          (ray->super_RayK<1>).tfar = local_a80;
                        }
                      }
                    }
                  }
                }
                auVar122 = local_5e0;
                bVar106 = lVar103 != 0;
                lVar103 = lVar103 + -1;
              } while ((!bVar81) && (bVar106));
              fVar137 = (ray->super_RayK<1>).tfar;
              auVar130._4_4_ = fVar137;
              auVar130._0_4_ = fVar137;
              auVar130._8_4_ = fVar137;
              auVar130._12_4_ = fVar137;
              auVar130._16_4_ = fVar137;
              auVar130._20_4_ = fVar137;
              auVar130._24_4_ = fVar137;
              auVar130._28_4_ = fVar137;
              auVar129 = vcmpps_avx(_local_720,auVar130,2);
              local_5e0 = vandps_avx(auVar129,local_5e0);
              auVar263 = ZEXT3264(local_5e0);
              auVar122 = auVar122 & auVar129;
              uVar105 = local_620._0_8_;
            } while ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar122 >> 0x7f,0) != '\0') ||
                       (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar122 >> 0xbf,0) != '\0') ||
                     (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar122[0x1f] < '\0');
          }
          auVar131._0_4_ =
               auVar360._0_4_ * (float)local_640._0_4_ +
               auVar370._0_4_ * (float)local_660._0_4_ + auVar356._0_4_ * (float)local_680._0_4_;
          auVar131._4_4_ =
               auVar360._4_4_ * (float)local_640._4_4_ +
               auVar370._4_4_ * (float)local_660._4_4_ + auVar356._4_4_ * (float)local_680._4_4_;
          auVar131._8_4_ =
               auVar360._8_4_ * fStack_638 +
               auVar370._8_4_ * fStack_658 + auVar356._8_4_ * fStack_678;
          auVar131._12_4_ =
               auVar360._12_4_ * fStack_634 +
               auVar370._12_4_ * fStack_654 + auVar356._12_4_ * fStack_674;
          auVar131._16_4_ =
               auVar360._16_4_ * fStack_630 +
               auVar370._16_4_ * fStack_650 + auVar356._16_4_ * fStack_670;
          auVar131._20_4_ =
               auVar360._20_4_ * fStack_62c +
               auVar370._20_4_ * fStack_64c + auVar356._20_4_ * fStack_66c;
          auVar131._24_4_ =
               auVar360._24_4_ * fStack_628 +
               auVar370._24_4_ * fStack_648 + auVar356._24_4_ * fStack_668;
          auVar131._28_4_ = auVar129._28_4_ + auVar129._28_4_ + auVar263._28_4_;
          auVar159._8_4_ = 0x7fffffff;
          auVar159._0_8_ = 0x7fffffff7fffffff;
          auVar159._12_4_ = 0x7fffffff;
          auVar159._16_4_ = 0x7fffffff;
          auVar159._20_4_ = 0x7fffffff;
          auVar159._24_4_ = 0x7fffffff;
          auVar159._28_4_ = 0x7fffffff;
          auVar129 = vandps_avx(auVar131,auVar159);
          auVar160._8_4_ = 0x3e99999a;
          auVar160._0_8_ = 0x3e99999a3e99999a;
          auVar160._12_4_ = 0x3e99999a;
          auVar160._16_4_ = 0x3e99999a;
          auVar160._20_4_ = 0x3e99999a;
          auVar160._24_4_ = 0x3e99999a;
          auVar160._28_4_ = 0x3e99999a;
          auVar129 = vcmpps_avx(auVar129,auVar160,1);
          auVar122 = vorps_avx(auVar129,local_5a0);
          auVar161._0_4_ = (float)local_740._0_4_ + (float)local_580._0_4_;
          auVar161._4_4_ = (float)local_740._4_4_ + (float)local_580._4_4_;
          auVar161._8_4_ = fStack_738 + fStack_578;
          auVar161._12_4_ = fStack_734 + fStack_574;
          auVar161._16_4_ = fStack_730 + fStack_570;
          auVar161._20_4_ = fStack_72c + fStack_56c;
          auVar161._24_4_ = fStack_728 + fStack_568;
          auVar161._28_4_ = fStack_724 + fStack_564;
          fVar137 = (ray->super_RayK<1>).tfar;
          auVar200._4_4_ = fVar137;
          auVar200._0_4_ = fVar137;
          auVar200._8_4_ = fVar137;
          auVar200._12_4_ = fVar137;
          auVar200._16_4_ = fVar137;
          auVar200._20_4_ = fVar137;
          auVar200._24_4_ = fVar137;
          auVar200._28_4_ = fVar137;
          auVar129 = vcmpps_avx(auVar161,auVar200,2);
          local_700 = vandps_avx(auVar129,local_6c0);
          auVar162._8_4_ = 3;
          auVar162._0_8_ = 0x300000003;
          auVar162._12_4_ = 3;
          auVar162._16_4_ = 3;
          auVar162._20_4_ = 3;
          auVar162._24_4_ = 3;
          auVar162._28_4_ = 3;
          auVar201._8_4_ = 2;
          auVar201._0_8_ = 0x200000002;
          auVar201._12_4_ = 2;
          auVar201._16_4_ = 2;
          auVar201._20_4_ = 2;
          auVar201._24_4_ = 2;
          auVar201._28_4_ = 2;
          auVar129 = vblendvps_avx(auVar201,auVar162,auVar122);
          auVar145 = vpcmpgtd_avx(auVar129._16_16_,local_5c0._0_16_);
          auVar113 = vpshufd_avx(_local_6e0,0);
          auVar113 = vpcmpgtd_avx(auVar129._0_16_,auVar113);
          auVar163._16_16_ = auVar145;
          auVar163._0_16_ = auVar113;
          _local_720 = vblendps_avx(ZEXT1632(auVar113),auVar163,0xf0);
          local_600 = vandnps_avx(_local_720,local_700);
          auVar129 = local_700 & ~_local_720;
          fVar364 = (float)local_740._0_4_;
          fVar373 = (float)local_740._4_4_;
          fVar180 = fStack_738;
          fVar203 = fStack_734;
          fVar204 = fStack_730;
          fVar205 = fStack_72c;
          fVar206 = fStack_728;
          fVar207 = fStack_724;
          if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar129 >> 0x7f,0) != '\0') ||
                (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar129 >> 0xbf,0) != '\0') ||
              (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar129[0x1f] < '\0') {
            local_7c0 = _local_460;
            local_7e0._4_4_ = (float)local_740._4_4_ + (float)local_460._4_4_;
            local_7e0._0_4_ = (float)local_740._0_4_ + (float)local_460._0_4_;
            fStack_7d8 = fStack_738 + fStack_458;
            fStack_7d4 = fStack_734 + fStack_454;
            fStack_7d0 = fStack_730 + fStack_450;
            fStack_7cc = fStack_72c + fStack_44c;
            fStack_7c8 = fStack_728 + fStack_448;
            fStack_7c4 = fStack_724 + fStack_444;
            do {
              auVar234 = auVar242._0_16_;
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar129 = vblendvps_avx(auVar164,local_7c0,local_600);
              auVar122 = vshufps_avx(auVar129,auVar129,0xb1);
              auVar122 = vminps_avx(auVar129,auVar122);
              auVar32 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar32);
              auVar32 = vperm2f128_avx(auVar122,auVar122,1);
              auVar122 = vminps_avx(auVar122,auVar32);
              auVar122 = vcmpps_avx(auVar129,auVar122,0);
              auVar32 = local_600 & auVar122;
              auVar129 = local_600;
              if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar32 >> 0x7f,0) != '\0') ||
                    (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0xbf,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar32[0x1f] < '\0') {
                auVar129 = vandps_avx(auVar122,local_600);
              }
              uVar104 = vmovmskps_avx(auVar129);
              uVar99 = 0;
              if (uVar104 != 0) {
                for (; (uVar104 >> uVar99 & 1) == 0; uVar99 = uVar99 + 1) {
                }
              }
              uVar105 = (ulong)uVar99;
              *(undefined4 *)(local_600 + uVar105 * 4) = 0;
              aVar12 = (ray->super_RayK<1>).dir.field_0;
              _local_900 = (undefined1  [16])aVar12;
              auVar145 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
              local_ac0 = local_4c0[uVar105];
              auVar360 = ZEXT464((uint)local_ac0);
              local_ae0 = *(float *)(local_440 + uVar105 * 4);
              auVar370 = ZEXT464((uint)local_ae0);
              if (auVar145._0_4_ < 0.0) {
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                fStack_adc = 0.0;
                fStack_ad8 = 0.0;
                fStack_ad4 = 0.0;
                fVar137 = sqrtf(auVar145._0_4_);
                auVar370 = ZEXT1664(CONCAT412(fStack_ad4,
                                              CONCAT48(fStack_ad8,CONCAT44(fStack_adc,local_ae0))));
                auVar360 = ZEXT1664(CONCAT412(fStack_ab4,
                                              CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
                auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar234._8_4_ = 0x7fffffff;
                auVar234._0_8_ = 0x7fffffff7fffffff;
                auVar234._12_4_ = 0x7fffffff;
              }
              else {
                auVar145 = vsqrtss_avx(auVar145,auVar145);
                fVar137 = auVar145._0_4_;
              }
              auVar113 = vminps_avx(_local_970,_local_990);
              auVar145 = vmaxps_avx(_local_970,_local_990);
              auVar185 = vminps_avx(_local_980,_local_9a0);
              auVar142 = vminps_avx(auVar113,auVar185);
              auVar113 = vmaxps_avx(_local_980,_local_9a0);
              auVar185 = vmaxps_avx(auVar145,auVar113);
              auVar145 = vandps_avx(auVar142,auVar234);
              auVar113 = vandps_avx(auVar185,auVar234);
              auVar145 = vmaxps_avx(auVar145,auVar113);
              auVar113 = vmovshdup_avx(auVar145);
              auVar113 = vmaxss_avx(auVar113,auVar145);
              auVar145 = vshufpd_avx(auVar145,auVar145,1);
              auVar145 = vmaxss_avx(auVar145,auVar113);
              local_920._0_4_ = auVar145._0_4_ * 1.9073486e-06;
              local_800._0_4_ = fVar137 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar185,auVar185,0xff);
              lVar103 = 4;
              do {
                auVar366 = auVar370._0_16_;
                auVar145 = vshufps_avx(auVar366,auVar366,0);
                auVar117._0_4_ = auVar145._0_4_ * (float)local_900._0_4_ + 0.0;
                auVar117._4_4_ = auVar145._4_4_ * (float)local_900._4_4_ + 0.0;
                auVar117._8_4_ = auVar145._8_4_ * fStack_8f8 + 0.0;
                auVar117._12_4_ = auVar145._12_4_ * fStack_8f4 + 0.0;
                local_ac0 = auVar360._0_4_;
                fVar171 = 1.0 - local_ac0;
                fVar137 = local_ac0 * local_ac0;
                fVar168 = local_ac0 * 3.0;
                local_940._0_4_ = fVar168 + -5.0;
                local_9e0._0_4_ = fVar171 * fVar171;
                auVar145 = ZEXT416((uint)(local_ac0 * local_ac0 * -fVar171 * 0.5));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar113 = ZEXT416((uint)((fVar171 * fVar171 * (fVar171 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar185 = ZEXT416((uint)((fVar137 * (fVar168 + -5.0) + 2.0) * 0.5));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar142 = ZEXT416((uint)(fVar171 * fVar171 * -local_ac0 * 0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar190._0_4_ =
                     auVar142._0_4_ * (float)local_970._0_4_ +
                     auVar185._0_4_ * (float)local_990._0_4_ +
                     auVar113._0_4_ * (float)local_980._0_4_ +
                     auVar145._0_4_ * (float)local_9a0._0_4_;
                auVar190._4_4_ =
                     auVar142._4_4_ * (float)local_970._4_4_ +
                     auVar185._4_4_ * (float)local_990._4_4_ +
                     auVar113._4_4_ * (float)local_980._4_4_ +
                     auVar145._4_4_ * (float)local_9a0._4_4_;
                auVar190._8_4_ =
                     auVar142._8_4_ * fStack_968 +
                     auVar185._8_4_ * fStack_988 +
                     auVar113._8_4_ * fStack_978 + auVar145._8_4_ * fStack_998;
                auVar190._12_4_ =
                     auVar142._12_4_ * fStack_964 +
                     auVar185._12_4_ * fStack_984 +
                     auVar113._12_4_ * fStack_974 + auVar145._12_4_ * fStack_994;
                local_840._0_16_ = auVar190;
                auVar145 = vsubps_avx(auVar117,auVar190);
                _local_a00 = auVar145;
                auVar145 = vdpps_avx(auVar145,auVar145,0x7f);
                local_860._0_16_ = ZEXT416((uint)(local_ac0 * -9.0 + 4.0));
                local_9c0._0_16_ = ZEXT416((uint)(fVar168 + -1.0));
                local_a80 = auVar145._0_4_;
                fStack_abc = auVar360._4_4_;
                fStack_ab8 = auVar360._8_4_;
                fStack_ab4 = auVar360._12_4_;
                local_ae0 = auVar370._0_4_;
                fStack_adc = auVar370._4_4_;
                fStack_ad8 = auVar370._8_4_;
                fStack_ad4 = auVar370._12_4_;
                fStack_a7c = auVar145._4_4_;
                fStack_a78 = auVar145._8_4_;
                fStack_a74 = auVar145._12_4_;
                if (local_a80 < 0.0) {
                  local_820._0_4_ = fVar137;
                  local_960._0_16_ = ZEXT416((uint)fVar171);
                  local_a20._0_4_ = fVar168;
                  local_880._0_4_ = local_ac0 * 9.0;
                  local_8e0._0_4_ = fVar171 * -2.0;
                  fVar175 = sqrtf(local_a80);
                  auVar366._4_4_ = fStack_adc;
                  auVar366._0_4_ = local_ae0;
                  auVar366._8_4_ = fStack_ad8;
                  auVar366._12_4_ = fStack_ad4;
                  auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar224 = (float)local_880._0_4_;
                  fVar209 = (float)local_8e0._0_4_;
                  fVar137 = (float)local_820._0_4_;
                  fVar168 = (float)local_a20._0_4_;
                  fVar171 = (float)local_960._0_4_;
                }
                else {
                  auVar145 = vsqrtss_avx(auVar145,auVar145);
                  fVar175 = auVar145._0_4_;
                  fVar224 = local_ac0 * 9.0;
                  fVar209 = fVar171 * -2.0;
                }
                auVar145 = ZEXT416((uint)((fVar137 + fVar209 * local_ac0) * 0.5));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar113 = ZEXT416((uint)(((fVar171 + fVar171) * (fVar168 + 2.0) +
                                          fVar171 * fVar171 * -3.0) * 0.5));
                auVar113 = vshufps_avx(auVar113,auVar113,0);
                auVar185 = ZEXT416((uint)(((local_ac0 + local_ac0) * (float)local_940._0_4_ +
                                          local_ac0 * fVar168) * 0.5));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar142 = ZEXT416((uint)((local_ac0 * (fVar171 + fVar171) - (float)local_9e0._0_4_)
                                         * 0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar387._0_4_ =
                     (float)local_970._0_4_ * auVar142._0_4_ +
                     (float)local_990._0_4_ * auVar185._0_4_ +
                     (float)local_9a0._0_4_ * auVar145._0_4_ +
                     (float)local_980._0_4_ * auVar113._0_4_;
                auVar387._4_4_ =
                     (float)local_970._4_4_ * auVar142._4_4_ +
                     (float)local_990._4_4_ * auVar185._4_4_ +
                     (float)local_9a0._4_4_ * auVar145._4_4_ +
                     (float)local_980._4_4_ * auVar113._4_4_;
                auVar387._8_4_ =
                     fStack_968 * auVar142._8_4_ +
                     fStack_988 * auVar185._8_4_ +
                     fStack_998 * auVar145._8_4_ + fStack_978 * auVar113._8_4_;
                auVar387._12_4_ =
                     fStack_964 * auVar142._12_4_ +
                     fStack_984 * auVar185._12_4_ +
                     fStack_994 * auVar145._12_4_ + fStack_974 * auVar113._12_4_;
                auVar142 = vpermilps_avx(local_9c0._0_16_,0);
                auVar25 = vpermilps_avx(local_860._0_16_,0);
                auVar145 = vshufps_avx(ZEXT416((uint)(fVar224 + -5.0)),
                                       ZEXT416((uint)(fVar224 + -5.0)),0);
                auVar113 = ZEXT416((uint)(local_ac0 * -3.0 + 2.0));
                auVar185 = vshufps_avx(auVar113,auVar113,0);
                auVar113 = vdpps_avx(auVar387,auVar387,0x7f);
                auVar148._0_4_ =
                     (float)local_970._0_4_ * auVar185._0_4_ +
                     (float)local_990._0_4_ * auVar145._0_4_ +
                     (float)local_980._0_4_ * auVar25._0_4_ +
                     (float)local_9a0._0_4_ * auVar142._0_4_;
                auVar148._4_4_ =
                     (float)local_970._4_4_ * auVar185._4_4_ +
                     (float)local_990._4_4_ * auVar145._4_4_ +
                     (float)local_980._4_4_ * auVar25._4_4_ +
                     (float)local_9a0._4_4_ * auVar142._4_4_;
                auVar148._8_4_ =
                     fStack_968 * auVar185._8_4_ +
                     fStack_988 * auVar145._8_4_ +
                     fStack_978 * auVar25._8_4_ + fStack_998 * auVar142._8_4_;
                auVar148._12_4_ =
                     fStack_964 * auVar185._12_4_ +
                     fStack_984 * auVar145._12_4_ +
                     fStack_974 * auVar25._12_4_ + fStack_994 * auVar142._12_4_;
                auVar145 = vblendps_avx(auVar113,_DAT_01feba10,0xe);
                auVar185 = vrsqrtss_avx(auVar145,auVar145);
                fVar168 = auVar185._0_4_;
                fVar137 = auVar113._0_4_;
                auVar185 = vdpps_avx(auVar387,auVar148,0x7f);
                auVar142 = vshufps_avx(auVar113,auVar113,0);
                auVar149._0_4_ = auVar148._0_4_ * auVar142._0_4_;
                auVar149._4_4_ = auVar148._4_4_ * auVar142._4_4_;
                auVar149._8_4_ = auVar148._8_4_ * auVar142._8_4_;
                auVar149._12_4_ = auVar148._12_4_ * auVar142._12_4_;
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar235._0_4_ = auVar387._0_4_ * auVar185._0_4_;
                auVar235._4_4_ = auVar387._4_4_ * auVar185._4_4_;
                auVar235._8_4_ = auVar387._8_4_ * auVar185._8_4_;
                auVar235._12_4_ = auVar387._12_4_ * auVar185._12_4_;
                auVar25 = vsubps_avx(auVar149,auVar235);
                auVar185 = vrcpss_avx(auVar145,auVar145);
                auVar145 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                      ZEXT416((uint)(auVar366._0_4_ * (float)local_800._0_4_)));
                auVar356 = ZEXT1664(auVar145);
                auVar185 = ZEXT416((uint)(auVar185._0_4_ * (2.0 - fVar137 * auVar185._0_4_)));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                uVar105 = CONCAT44(auVar387._4_4_,auVar387._0_4_);
                auVar250._0_8_ = uVar105 ^ 0x8000000080000000;
                auVar250._8_4_ = -auVar387._8_4_;
                auVar250._12_4_ = -auVar387._12_4_;
                auVar142 = ZEXT416((uint)(fVar168 * 1.5 +
                                         fVar137 * -0.5 * fVar168 * fVar168 * fVar168));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar216._0_4_ = auVar142._0_4_ * auVar25._0_4_ * auVar185._0_4_;
                auVar216._4_4_ = auVar142._4_4_ * auVar25._4_4_ * auVar185._4_4_;
                auVar216._8_4_ = auVar142._8_4_ * auVar25._8_4_ * auVar185._8_4_;
                auVar216._12_4_ = auVar142._12_4_ * auVar25._12_4_ * auVar185._12_4_;
                auVar272._0_4_ = auVar387._0_4_ * auVar142._0_4_;
                auVar272._4_4_ = auVar387._4_4_ * auVar142._4_4_;
                auVar272._8_4_ = auVar387._8_4_ * auVar142._8_4_;
                auVar272._12_4_ = auVar387._12_4_ * auVar142._12_4_;
                local_940._0_16_ = auVar387;
                local_860._0_4_ = auVar145._0_4_;
                if (fVar137 < 0.0) {
                  local_9c0._0_4_ = fVar175;
                  local_9e0._0_16_ = auVar250;
                  local_820._0_16_ = auVar272;
                  local_960._0_16_ = auVar216;
                  fVar137 = sqrtf(fVar137);
                  auVar356 = ZEXT464((uint)local_860._0_4_);
                  auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar216 = local_960._0_16_;
                  auVar250 = local_9e0._0_16_;
                  auVar272 = local_820._0_16_;
                  fVar175 = (float)local_9c0._0_4_;
                }
                else {
                  auVar145 = vsqrtss_avx(auVar113,auVar113);
                  fVar137 = auVar145._0_4_;
                }
                auVar315._4_4_ = fStack_a7c;
                auVar315._0_4_ = local_a80;
                auVar315._8_4_ = fStack_a78;
                auVar315._12_4_ = fStack_a74;
                auVar145 = vdpps_avx(_local_a00,auVar272,0x7f);
                fVar137 = ((float)local_920._0_4_ / fVar137) * (fVar175 + 1.0) +
                          auVar356._0_4_ + fVar175 * (float)local_920._0_4_;
                auVar113 = vdpps_avx(auVar250,auVar272,0x7f);
                auVar185 = vdpps_avx(_local_a00,auVar216,0x7f);
                auVar142 = vdpps_avx(_local_900,auVar272,0x7f);
                auVar25 = vdpps_avx(_local_a00,auVar250,0x7f);
                fVar168 = auVar113._0_4_ + auVar185._0_4_;
                fVar171 = auVar145._0_4_;
                auVar118._0_4_ = fVar171 * fVar171;
                auVar118._4_4_ = auVar145._4_4_ * auVar145._4_4_;
                auVar118._8_4_ = auVar145._8_4_ * auVar145._8_4_;
                auVar118._12_4_ = auVar145._12_4_ * auVar145._12_4_;
                auVar185 = vsubps_avx(auVar315,auVar118);
                auVar113 = vdpps_avx(_local_a00,_local_900,0x7f);
                fVar175 = auVar25._0_4_ - fVar171 * fVar168;
                fVar209 = auVar113._0_4_ - fVar171 * auVar142._0_4_;
                auVar113 = vrsqrtss_avx(auVar185,auVar185);
                fVar224 = auVar185._0_4_;
                fVar171 = auVar113._0_4_;
                fVar171 = fVar171 * 1.5 + fVar224 * -0.5 * fVar171 * fVar171 * fVar171;
                if (fVar224 < 0.0) {
                  local_9c0._0_16_ = auVar145;
                  local_9e0._0_4_ = fVar137;
                  local_820._0_16_ = ZEXT416((uint)fVar168);
                  local_960._0_16_ = auVar142;
                  local_a20._0_4_ = fVar175;
                  local_880._0_4_ = fVar209;
                  local_8e0._0_4_ = fVar171;
                  fVar224 = sqrtf(fVar224);
                  auVar356 = ZEXT464((uint)local_860._0_4_);
                  auVar315._4_4_ = fStack_a7c;
                  auVar315._0_4_ = local_a80;
                  auVar315._8_4_ = fStack_a78;
                  auVar315._12_4_ = fStack_a74;
                  auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar171 = (float)local_8e0._0_4_;
                  fVar175 = (float)local_a20._0_4_;
                  fVar209 = (float)local_880._0_4_;
                  auVar142 = local_960._0_16_;
                  auVar145 = local_9c0._0_16_;
                  fVar137 = (float)local_9e0._0_4_;
                  auVar113 = local_820._0_16_;
                }
                else {
                  auVar113 = vsqrtss_avx(auVar185,auVar185);
                  fVar224 = auVar113._0_4_;
                  auVar113 = ZEXT416((uint)fVar168);
                }
                auVar389 = ZEXT1664(auVar145);
                auVar320 = ZEXT1664(auVar315);
                auVar150 = vpermilps_avx(local_840._0_16_,0xff);
                auVar26 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xff);
                fVar168 = fVar175 * fVar171 - auVar26._0_4_;
                auVar236._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = auVar142._8_4_ ^ 0x80000000;
                auVar236._12_4_ = auVar142._12_4_ ^ 0x80000000;
                auVar251._0_4_ = -fVar168;
                auVar251._4_4_ = 0x80000000;
                auVar251._8_4_ = 0x80000000;
                auVar251._12_4_ = 0x80000000;
                auVar185 = vinsertps_avx(ZEXT416((uint)(fVar209 * fVar171)),auVar236,0x10);
                auVar25 = vmovsldup_avx(ZEXT416((uint)(auVar113._0_4_ * fVar209 * fVar171 -
                                                      auVar142._0_4_ * fVar168)));
                auVar185 = vdivps_avx(auVar185,auVar25);
                auVar150 = ZEXT416((uint)(fVar224 - auVar150._0_4_));
                auVar142 = vinsertps_avx(auVar145,auVar150,0x10);
                auVar217._0_4_ = auVar142._0_4_ * auVar185._0_4_;
                auVar217._4_4_ = auVar142._4_4_ * auVar185._4_4_;
                auVar217._8_4_ = auVar142._8_4_ * auVar185._8_4_;
                auVar217._12_4_ = auVar142._12_4_ * auVar185._12_4_;
                auVar113 = vinsertps_avx(auVar251,auVar113,0x1c);
                auVar113 = vdivps_avx(auVar113,auVar25);
                auVar191._0_4_ = auVar142._0_4_ * auVar113._0_4_;
                auVar191._4_4_ = auVar142._4_4_ * auVar113._4_4_;
                auVar191._8_4_ = auVar142._8_4_ * auVar113._8_4_;
                auVar191._12_4_ = auVar142._12_4_ * auVar113._12_4_;
                auVar113 = vhaddps_avx(auVar217,auVar217);
                auVar185 = vhaddps_avx(auVar191,auVar191);
                local_ac0 = local_ac0 - auVar113._0_4_;
                auVar360 = ZEXT464((uint)local_ac0);
                local_ae0 = local_ae0 - auVar185._0_4_;
                auVar370 = ZEXT464((uint)local_ae0);
                auVar237._8_4_ = 0x7fffffff;
                auVar237._0_8_ = 0x7fffffff7fffffff;
                auVar237._12_4_ = 0x7fffffff;
                auVar242 = ZEXT1664(auVar237);
                auVar113 = vandps_avx(auVar145,auVar237);
                if (fVar137 <= auVar113._0_4_) {
LAB_010692ca:
                  bVar81 = false;
                }
                else {
                  auVar113 = vandps_avx(auVar150,auVar237);
                  if ((float)local_7a0._0_4_ * 1.9073486e-06 + auVar356._0_4_ + fVar137 <=
                      auVar113._0_4_) goto LAB_010692ca;
                  local_ae0 = local_ae0 + (float)local_760._0_4_;
                  auVar370 = ZEXT464((uint)local_ae0);
                  bVar81 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ae0) &&
                       (fVar137 = (ray->super_RayK<1>).tfar, local_ae0 <= fVar137)) &&
                      (0.0 <= local_ac0)) && (local_ac0 <= 1.0)) {
                    auVar113 = vrsqrtss_avx(auVar315,auVar315);
                    fVar168 = auVar113._0_4_;
                    pGVar14 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar14->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar113 = ZEXT416((uint)(fVar168 * 1.5 +
                                               auVar315._0_4_ * -0.5 * fVar168 * fVar168 * fVar168))
                      ;
                      auVar113 = vshufps_avx(auVar113,auVar113,0);
                      auVar151._0_4_ = auVar113._0_4_ * (float)local_a00._0_4_;
                      auVar151._4_4_ = auVar113._4_4_ * (float)local_a00._4_4_;
                      auVar151._8_4_ = auVar113._8_4_ * fStack_9f8;
                      auVar151._12_4_ = auVar113._12_4_ * fStack_9f4;
                      auVar119._0_4_ = local_940._0_4_ + auVar26._0_4_ * auVar151._0_4_;
                      auVar119._4_4_ = local_940._4_4_ + auVar26._4_4_ * auVar151._4_4_;
                      auVar119._8_4_ = local_940._8_4_ + auVar26._8_4_ * auVar151._8_4_;
                      auVar119._12_4_ = local_940._12_4_ + auVar26._12_4_ * auVar151._12_4_;
                      auVar113 = vshufps_avx(auVar151,auVar151,0xc9);
                      auVar185 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xc9);
                      auVar152._0_4_ = auVar185._0_4_ * auVar151._0_4_;
                      auVar152._4_4_ = auVar185._4_4_ * auVar151._4_4_;
                      auVar152._8_4_ = auVar185._8_4_ * auVar151._8_4_;
                      auVar152._12_4_ = auVar185._12_4_ * auVar151._12_4_;
                      auVar192._0_4_ = local_940._0_4_ * auVar113._0_4_;
                      auVar192._4_4_ = local_940._4_4_ * auVar113._4_4_;
                      auVar192._8_4_ = local_940._8_4_ * auVar113._8_4_;
                      auVar192._12_4_ = local_940._12_4_ * auVar113._12_4_;
                      auVar142 = vsubps_avx(auVar192,auVar152);
                      auVar113 = vshufps_avx(auVar142,auVar142,0xc9);
                      auVar185 = vshufps_avx(auVar119,auVar119,0xc9);
                      auVar193._0_4_ = auVar185._0_4_ * auVar113._0_4_;
                      auVar193._4_4_ = auVar185._4_4_ * auVar113._4_4_;
                      auVar193._8_4_ = auVar185._8_4_ * auVar113._8_4_;
                      auVar193._12_4_ = auVar185._12_4_ * auVar113._12_4_;
                      auVar113 = vshufps_avx(auVar142,auVar142,0xd2);
                      auVar120._0_4_ = auVar119._0_4_ * auVar113._0_4_;
                      auVar120._4_4_ = auVar119._4_4_ * auVar113._4_4_;
                      auVar120._8_4_ = auVar119._8_4_ * auVar113._8_4_;
                      auVar120._12_4_ = auVar119._12_4_ * auVar113._12_4_;
                      auVar113 = vsubps_avx(auVar193,auVar120);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = local_ae0;
                        auVar145 = vshufps_avx(auVar113,auVar113,0xe9);
                        uVar9 = vmovlps_avx(auVar145);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                        (ray->Ng).field_0.field_0.z = auVar113._0_4_;
                        ray->u = local_ac0;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a88;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar185 = vshufps_avx(auVar113,auVar113,0xe9);
                        local_8b0 = vmovlps_avx(auVar185);
                        local_8a8 = auVar113._0_4_;
                        local_8a4 = local_ac0;
                        local_8a0 = 0;
                        local_89c = (uint)local_a88;
                        local_898 = (uint)local_ae8;
                        local_894 = context->user->instID[0];
                        local_890 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = local_ae0;
                        local_aec = -1;
                        local_a50.valid = &local_aec;
                        local_a50.geometryUserPtr = pGVar14->userPtr;
                        local_a50.context = context->user;
                        local_a50.ray = (RTCRayN *)ray;
                        local_a50.hit = (RTCHitN *)&local_8b0;
                        local_a50.N = 1;
                        fStack_abc = 0.0;
                        fStack_ab8 = 0.0;
                        fStack_ab4 = 0.0;
                        fStack_adc = 0.0;
                        fStack_ad8 = 0.0;
                        fStack_ad4 = 0.0;
                        local_a80 = fVar137;
                        if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01069402:
                          p_Var17 = context->args->filter;
                          if (p_Var17 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                              auVar320 = ZEXT1664(auVar320._0_16_);
                              auVar356 = ZEXT1664(auVar356._0_16_);
                              auVar389 = ZEXT1664(auVar389._0_16_);
                              (*p_Var17)(&local_a50);
                              auVar370 = ZEXT1664(CONCAT412(fStack_ad4,
                                                            CONCAT48(fStack_ad8,
                                                                     CONCAT44(fStack_adc,local_ae0))
                                                           ));
                              auVar360 = ZEXT1664(CONCAT412(fStack_ab4,
                                                            CONCAT48(fStack_ab8,
                                                                     CONCAT44(fStack_abc,local_ac0))
                                                           ));
                              auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar242 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            if (*local_a50.valid == 0) goto LAB_010694b7;
                          }
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a50.hit;
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a50.hit + 4);
                          (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a50.hit + 8);
                          *(float *)((long)local_a50.ray + 0x3c) = *(float *)(local_a50.hit + 0xc);
                          *(float *)((long)local_a50.ray + 0x40) = *(float *)(local_a50.hit + 0x10);
                          *(float *)((long)local_a50.ray + 0x44) = *(float *)(local_a50.hit + 0x14);
                          *(float *)((long)local_a50.ray + 0x48) = *(float *)(local_a50.hit + 0x18);
                          *(float *)((long)local_a50.ray + 0x4c) = *(float *)(local_a50.hit + 0x1c);
                          *(float *)((long)local_a50.ray + 0x50) = *(float *)(local_a50.hit + 0x20);
                        }
                        else {
                          auVar320 = ZEXT1664(auVar315);
                          auVar356 = ZEXT1664(auVar356._0_16_);
                          auVar389 = ZEXT1664(auVar145);
                          (*pGVar14->intersectionFilterN)(&local_a50);
                          auVar370 = ZEXT1664(CONCAT412(fStack_ad4,
                                                        CONCAT48(fStack_ad8,
                                                                 CONCAT44(fStack_adc,local_ae0))));
                          auVar360 = ZEXT1664(CONCAT412(fStack_ab4,
                                                        CONCAT48(fStack_ab8,
                                                                 CONCAT44(fStack_abc,local_ac0))));
                          auVar299 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar242 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if (*local_a50.valid != 0) goto LAB_01069402;
LAB_010694b7:
                          (ray->super_RayK<1>).tfar = local_a80;
                        }
                      }
                    }
                  }
                }
                auVar129 = local_600;
                bVar106 = lVar103 != 0;
                lVar103 = lVar103 + -1;
              } while ((!bVar81) && (bVar106));
              fVar137 = (ray->super_RayK<1>).tfar;
              auVar132._4_4_ = fVar137;
              auVar132._0_4_ = fVar137;
              auVar132._8_4_ = fVar137;
              auVar132._12_4_ = fVar137;
              auVar132._16_4_ = fVar137;
              auVar132._20_4_ = fVar137;
              auVar132._24_4_ = fVar137;
              auVar132._28_4_ = fVar137;
              auVar122 = vcmpps_avx(_local_7e0,auVar132,2);
              local_600 = vandps_avx(auVar122,local_600);
              auVar129 = auVar129 & auVar122;
              uVar105 = local_620._0_8_;
              fVar364 = (float)local_740._0_4_;
              fVar373 = (float)local_740._4_4_;
              fVar180 = fStack_738;
              fVar203 = fStack_734;
              fVar204 = fStack_730;
              fVar205 = fStack_72c;
              fVar206 = fStack_728;
              fVar207 = fStack_724;
            } while ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar129 >> 0x7f,0) != '\0') ||
                       (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar129 >> 0xbf,0) != '\0') ||
                     (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar129[0x1f] < '\0');
          }
          auVar129 = vandps_avx(local_560,local_540);
          auVar122 = vandps_avx(_local_720,local_700);
          auVar202._0_4_ = fVar364 + local_420._0_4_;
          auVar202._4_4_ = fVar373 + local_420._4_4_;
          auVar202._8_4_ = fVar180 + local_420._8_4_;
          auVar202._12_4_ = fVar203 + local_420._12_4_;
          auVar202._16_4_ = fVar204 + local_420._16_4_;
          auVar202._20_4_ = fVar205 + local_420._20_4_;
          auVar202._24_4_ = fVar206 + local_420._24_4_;
          auVar202._28_4_ = fVar207 + local_420._28_4_;
          fVar137 = (ray->super_RayK<1>).tfar;
          auVar241._4_4_ = fVar137;
          auVar241._0_4_ = fVar137;
          auVar241._8_4_ = fVar137;
          auVar241._12_4_ = fVar137;
          auVar241._16_4_ = fVar137;
          auVar241._20_4_ = fVar137;
          auVar241._24_4_ = fVar137;
          auVar241._28_4_ = fVar137;
          auVar32 = vcmpps_avx(auVar202,auVar241,2);
          auVar129 = vandps_avx(auVar32,auVar129);
          auVar261._0_4_ = fVar364 + local_460._0_4_;
          auVar261._4_4_ = fVar373 + local_460._4_4_;
          auVar261._8_4_ = fVar180 + local_460._8_4_;
          auVar261._12_4_ = fVar203 + local_460._12_4_;
          auVar261._16_4_ = fVar204 + local_460._16_4_;
          auVar261._20_4_ = fVar205 + local_460._20_4_;
          auVar261._24_4_ = fVar206 + local_460._24_4_;
          auVar261._28_4_ = fVar207 + local_460._28_4_;
          auVar32 = vcmpps_avx(auVar261,auVar241,2);
          auVar122 = vandps_avx(auVar32,auVar122);
          auVar122 = vorps_avx(auVar129,auVar122);
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar100 * 0x60) = auVar122;
            auVar129 = vblendvps_avx(_local_460,local_420,auVar129);
            *(undefined1 (*) [32])(auStack_160 + uVar100 * 0x60) = auVar129;
            auVar96._8_8_ = uStack_768;
            auVar96._0_8_ = local_770;
            uVar9 = vmovlps_avx(auVar96);
            *(undefined8 *)(afStack_140 + uVar100 * 0x18) = uVar9;
            auStack_138[uVar100 * 0x18] = (int)uVar105 + 1;
            uVar100 = (ulong)((int)uVar100 + 1);
          }
          auVar263 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_01067bcb;
        }
        auVar260._8_4_ = 0x3f800000;
        auVar260._0_8_ = &DAT_3f8000003f800000;
        auVar260._12_4_ = 0x3f800000;
        auVar260._16_4_ = 0x3f800000;
        auVar260._20_4_ = 0x3f800000;
        auVar260._24_4_ = 0x3f800000;
        auVar260._28_4_ = 0x3f800000;
      }
      auVar360 = ZEXT3264(_local_460);
      auVar263 = ZEXT3264(auVar260);
    }
LAB_01067bcb:
    fVar137 = (ray->super_RayK<1>).tfar;
    auVar127._4_4_ = fVar137;
    auVar127._0_4_ = fVar137;
    auVar127._8_4_ = fVar137;
    auVar127._12_4_ = fVar137;
    auVar127._16_4_ = fVar137;
    auVar127._20_4_ = fVar137;
    auVar127._24_4_ = fVar137;
    auVar127._28_4_ = fVar137;
    do {
      if ((int)uVar100 == 0) {
        fVar137 = (ray->super_RayK<1>).tfar;
        auVar121._4_4_ = fVar137;
        auVar121._0_4_ = fVar137;
        auVar121._8_4_ = fVar137;
        auVar121._12_4_ = fVar137;
        auVar145 = vcmpps_avx(local_470,auVar121,2);
        uVar99 = vmovmskps_avx(auVar145);
        uVar99 = (uint)local_748 - 1 & (uint)local_748 & uVar99;
        if (uVar99 == 0) {
          return;
        }
        goto LAB_01066a1a;
      }
      uVar101 = (ulong)((int)uVar100 - 1);
      lVar103 = uVar101 * 0x60;
      auVar129 = *(undefined1 (*) [32])(auStack_160 + lVar103);
      auVar153._0_4_ = fVar364 + auVar129._0_4_;
      auVar153._4_4_ = fVar373 + auVar129._4_4_;
      auVar153._8_4_ = fVar180 + auVar129._8_4_;
      auVar153._12_4_ = fVar203 + auVar129._12_4_;
      auVar153._16_4_ = fVar204 + auVar129._16_4_;
      auVar153._20_4_ = fVar205 + auVar129._20_4_;
      auVar153._24_4_ = fVar206 + auVar129._24_4_;
      auVar153._28_4_ = fVar207 + auVar129._28_4_;
      auVar32 = vcmpps_avx(auVar153,auVar127,2);
      auVar122 = vandps_avx(auVar32,*(undefined1 (*) [32])(auStack_180 + lVar103));
      local_420 = auVar122;
      auVar32 = *(undefined1 (*) [32])(auStack_180 + lVar103) & auVar32;
      bVar87 = (auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar88 = (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar86 = (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar85 = SUB321(auVar32 >> 0x7f,0) == '\0';
      bVar84 = (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar83 = SUB321(auVar32 >> 0xbf,0) == '\0';
      bVar106 = (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar81 = -1 < auVar32[0x1f];
      if (((((((!bVar87 || !bVar88) || !bVar86) || !bVar85) || !bVar84) || !bVar83) || !bVar106) ||
          !bVar81) {
        auVar222._8_4_ = 0x7f800000;
        auVar222._0_8_ = 0x7f8000007f800000;
        auVar222._12_4_ = 0x7f800000;
        auVar222._16_4_ = 0x7f800000;
        auVar222._20_4_ = 0x7f800000;
        auVar222._24_4_ = 0x7f800000;
        auVar222._28_4_ = 0x7f800000;
        auVar129 = vblendvps_avx(auVar222,auVar129,auVar122);
        auVar32 = vshufps_avx(auVar129,auVar129,0xb1);
        auVar32 = vminps_avx(auVar129,auVar32);
        auVar33 = vshufpd_avx(auVar32,auVar32,5);
        auVar32 = vminps_avx(auVar32,auVar33);
        auVar33 = vperm2f128_avx(auVar32,auVar32,1);
        auVar32 = vminps_avx(auVar32,auVar33);
        auVar129 = vcmpps_avx(auVar129,auVar32,0);
        auVar32 = auVar122 & auVar129;
        if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar32 >> 0x7f,0) != '\0') ||
              (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0xbf,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar32[0x1f] < '\0') {
          auVar122 = vandps_avx(auVar129,auVar122);
        }
        fVar137 = afStack_140[uVar101 * 0x18 + 1];
        uVar105 = (ulong)auStack_138[uVar101 * 0x18];
        uVar104 = vmovmskps_avx(auVar122);
        uVar99 = 0;
        if (uVar104 != 0) {
          for (; (uVar104 >> uVar99 & 1) == 0; uVar99 = uVar99 + 1) {
          }
        }
        fVar168 = afStack_140[uVar101 * 0x18];
        *(undefined4 *)(local_420 + (ulong)uVar99 * 4) = 0;
        if ((((((((local_420 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_420 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_420 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_420 >> 0x7f,0) != '\0') ||
              (local_420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_420 >> 0xbf,0) != '\0') ||
            (local_420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_420[0x1f] < '\0') {
          uVar101 = uVar100;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar103) = local_420;
        auVar145 = vshufps_avx(ZEXT416((uint)(fVar137 - fVar168)),ZEXT416((uint)(fVar137 - fVar168))
                               ,0);
        local_460._4_4_ = fVar168 + auVar145._4_4_ * 0.14285715;
        local_460._0_4_ = fVar168 + auVar145._0_4_ * 0.0;
        fStack_458 = fVar168 + auVar145._8_4_ * 0.2857143;
        fStack_454 = fVar168 + auVar145._12_4_ * 0.42857146;
        fStack_450 = fVar168 + auVar145._0_4_ * 0.5714286;
        fStack_44c = fVar168 + auVar145._4_4_ * 0.71428573;
        fStack_448 = fVar168 + auVar145._8_4_ * 0.8571429;
        fStack_444 = fVar168 + auVar145._12_4_;
        local_770 = *(undefined8 *)(local_460 + (ulong)uVar99 * 4);
        uStack_768 = 0;
      }
      uVar100 = uVar101;
    } while (((((((bVar87 && bVar88) && bVar86) && bVar85) && bVar84) && bVar83) && bVar106) &&
             bVar81);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }